

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<8,8>::
     intersect_t<embree::avx512::SweepCurve1IntersectorK<embree::BezierCurveT,8>,embree::avx512::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  undefined1 auVar1 [16];
  Primitive PVar2;
  uint uVar3;
  undefined4 uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  RTCRayQueryContext *pRVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  float fVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  int iVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [12];
  int iVar58;
  int iVar59;
  int iVar60;
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  byte bVar75;
  byte bVar76;
  byte bVar77;
  byte bVar78;
  ulong uVar79;
  uint uVar80;
  byte bVar81;
  byte bVar82;
  ulong uVar83;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  uint uVar84;
  long lVar85;
  bool bVar86;
  ulong uVar87;
  uint uVar147;
  uint uVar148;
  uint uVar149;
  uint uVar150;
  uint uVar151;
  uint uVar152;
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar141 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar146 [32];
  uint uVar153;
  float pp;
  float fVar154;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar173 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar174 [64];
  undefined1 auVar175 [64];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  float fVar176;
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [64];
  undefined1 auVar217 [64];
  float fVar218;
  float fVar219;
  undefined4 uVar220;
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [64];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [64];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar237 [16];
  float fVar242;
  float fVar244;
  undefined1 auVar238 [16];
  float fVar240;
  float fVar241;
  float fVar243;
  float fVar245;
  float fVar246;
  undefined1 auVar239 [32];
  float fVar247;
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [16];
  float fVar251;
  undefined1 auVar252 [16];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  undefined1 local_9e0 [16];
  RTCFilterFunctionNArguments local_930;
  undefined1 local_900 [16];
  undefined1 (*local_8e8) [32];
  Primitive *local_8e0;
  ulong local_8d8;
  ulong local_8d0;
  ulong local_8c8;
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [16];
  undefined1 local_850 [16];
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined1 local_810 [16];
  undefined1 local_800 [16];
  float local_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [16];
  undefined1 local_7d0 [16];
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  RTCHitN local_5a0 [32];
  undefined1 local_580 [32];
  undefined4 local_560;
  undefined4 uStack_55c;
  undefined4 uStack_558;
  undefined4 uStack_554;
  undefined4 uStack_550;
  undefined4 uStack_54c;
  undefined4 uStack_548;
  undefined4 uStack_544;
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [32];
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined1 local_4e0 [32];
  uint local_4c0;
  uint uStack_4bc;
  uint uStack_4b8;
  uint uStack_4b4;
  uint uStack_4b0;
  uint uStack_4ac;
  uint uStack_4a8;
  uint uStack_4a4;
  uint local_4a0;
  uint uStack_49c;
  uint uStack_498;
  uint uStack_494;
  uint uStack_490;
  uint uStack_48c;
  uint uStack_488;
  uint uStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined4 local_2e0;
  undefined4 uStack_2dc;
  undefined4 uStack_2d8;
  undefined4 uStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined4 local_1e0;
  undefined4 uStack_1dc;
  undefined4 uStack_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [7];
  float fStack_144;
  undefined8 uStack_140;
  float afStack_138 [66];
  undefined1 auVar142 [32];
  undefined1 auVar145 [32];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  
  PVar2 = prim[1];
  uVar79 = (ulong)(byte)PVar2;
  fVar219 = *(float *)(prim + uVar79 * 0x19 + 0x12);
  auVar90 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar95 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar96 = vsubps_avx(auVar90,*(undefined1 (*) [16])(prim + uVar79 * 0x19 + 6));
  fVar218 = fVar219 * auVar96._0_4_;
  fVar154 = fVar219 * auVar95._0_4_;
  auVar90._8_8_ = 0;
  auVar90._0_8_ = *(ulong *)(prim + uVar79 * 4 + 6);
  auVar104 = vpmovsxbd_avx2(auVar90);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar79 * 5 + 6);
  auVar102 = vpmovsxbd_avx2(auVar15);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar91._8_8_ = 0;
  auVar91._0_8_ = *(ulong *)(prim + uVar79 * 6 + 6);
  auVar105 = vpmovsxbd_avx2(auVar91);
  auVar105 = vcvtdq2ps_avx(auVar105);
  auVar92._8_8_ = 0;
  auVar92._0_8_ = *(ulong *)(prim + uVar79 * 0xb + 6);
  auVar106 = vpmovsxbd_avx2(auVar92);
  auVar88._8_8_ = 0;
  auVar88._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6);
  auVar111 = vpmovsxbd_avx2(auVar88);
  auVar106 = vcvtdq2ps_avx(auVar106);
  auVar107 = vcvtdq2ps_avx(auVar111);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + (uint)(byte)PVar2 * 0xc + uVar79 + 6);
  auVar103 = vpmovsxbd_avx2(auVar93);
  auVar103 = vcvtdq2ps_avx(auVar103);
  uVar87 = (ulong)(uint)((int)(uVar79 * 9) * 2);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = *(ulong *)(prim + uVar87 + 6);
  auVar108 = vpmovsxbd_avx2(auVar1);
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = *(ulong *)(prim + uVar87 + uVar79 + 6);
  auVar109 = vpmovsxbd_avx2(auVar89);
  auVar109 = vcvtdq2ps_avx(auVar109);
  uVar83 = (ulong)(uint)((int)(uVar79 * 5) << 2);
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar83 + 6);
  auVar101 = vpmovsxbd_avx2(auVar94);
  auVar110 = vcvtdq2ps_avx(auVar101);
  auVar121._4_4_ = fVar154;
  auVar121._0_4_ = fVar154;
  auVar121._8_4_ = fVar154;
  auVar121._12_4_ = fVar154;
  auVar121._16_4_ = fVar154;
  auVar121._20_4_ = fVar154;
  auVar121._24_4_ = fVar154;
  auVar121._28_4_ = fVar154;
  auVar123._8_4_ = 1;
  auVar123._0_8_ = 0x100000001;
  auVar123._12_4_ = 1;
  auVar123._16_4_ = 1;
  auVar123._20_4_ = 1;
  auVar123._24_4_ = 1;
  auVar123._28_4_ = 1;
  auVar99 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar113 = ZEXT1632(CONCAT412(fVar219 * auVar95._12_4_,
                                CONCAT48(fVar219 * auVar95._8_4_,
                                         CONCAT44(fVar219 * auVar95._4_4_,fVar154))));
  auVar112 = vpermps_avx2(auVar123,auVar113);
  auVar100 = vpermps_avx512vl(auVar99,auVar113);
  fVar154 = auVar100._0_4_;
  fVar240 = auVar100._4_4_;
  auVar113._4_4_ = fVar240 * auVar105._4_4_;
  auVar113._0_4_ = fVar154 * auVar105._0_4_;
  fVar241 = auVar100._8_4_;
  auVar113._8_4_ = fVar241 * auVar105._8_4_;
  fVar243 = auVar100._12_4_;
  auVar113._12_4_ = fVar243 * auVar105._12_4_;
  fVar251 = auVar100._16_4_;
  auVar113._16_4_ = fVar251 * auVar105._16_4_;
  fVar245 = auVar100._20_4_;
  auVar113._20_4_ = fVar245 * auVar105._20_4_;
  fVar246 = auVar100._24_4_;
  auVar113._24_4_ = fVar246 * auVar105._24_4_;
  auVar113._28_4_ = auVar111._28_4_;
  auVar111._4_4_ = auVar103._4_4_ * fVar240;
  auVar111._0_4_ = auVar103._0_4_ * fVar154;
  auVar111._8_4_ = auVar103._8_4_ * fVar241;
  auVar111._12_4_ = auVar103._12_4_ * fVar243;
  auVar111._16_4_ = auVar103._16_4_ * fVar251;
  auVar111._20_4_ = auVar103._20_4_ * fVar245;
  auVar111._24_4_ = auVar103._24_4_ * fVar246;
  auVar111._28_4_ = auVar101._28_4_;
  auVar101._4_4_ = auVar110._4_4_ * fVar240;
  auVar101._0_4_ = auVar110._0_4_ * fVar154;
  auVar101._8_4_ = auVar110._8_4_ * fVar241;
  auVar101._12_4_ = auVar110._12_4_ * fVar243;
  auVar101._16_4_ = auVar110._16_4_ * fVar251;
  auVar101._20_4_ = auVar110._20_4_ * fVar245;
  auVar101._24_4_ = auVar110._24_4_ * fVar246;
  auVar101._28_4_ = auVar100._28_4_;
  auVar90 = vfmadd231ps_fma(auVar113,auVar112,auVar102);
  auVar15 = vfmadd231ps_fma(auVar111,auVar112,auVar107);
  auVar91 = vfmadd231ps_fma(auVar101,auVar109,auVar112);
  auVar90 = vfmadd231ps_fma(ZEXT1632(auVar90),auVar121,auVar104);
  auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar121,auVar106);
  auVar91 = vfmadd231ps_fma(ZEXT1632(auVar91),auVar108,auVar121);
  auVar122._4_4_ = fVar218;
  auVar122._0_4_ = fVar218;
  auVar122._8_4_ = fVar218;
  auVar122._12_4_ = fVar218;
  auVar122._16_4_ = fVar218;
  auVar122._20_4_ = fVar218;
  auVar122._24_4_ = fVar218;
  auVar122._28_4_ = fVar218;
  auVar101 = ZEXT1632(CONCAT412(fVar219 * auVar96._12_4_,
                                CONCAT48(fVar219 * auVar96._8_4_,
                                         CONCAT44(fVar219 * auVar96._4_4_,fVar218))));
  auVar111 = vpermps_avx2(auVar123,auVar101);
  auVar101 = vpermps_avx512vl(auVar99,auVar101);
  fVar219 = auVar101._0_4_;
  fVar154 = auVar101._4_4_;
  auVar112._4_4_ = fVar154 * auVar105._4_4_;
  auVar112._0_4_ = fVar219 * auVar105._0_4_;
  fVar240 = auVar101._8_4_;
  auVar112._8_4_ = fVar240 * auVar105._8_4_;
  fVar241 = auVar101._12_4_;
  auVar112._12_4_ = fVar241 * auVar105._12_4_;
  fVar243 = auVar101._16_4_;
  auVar112._16_4_ = fVar243 * auVar105._16_4_;
  fVar251 = auVar101._20_4_;
  auVar112._20_4_ = fVar251 * auVar105._20_4_;
  fVar245 = auVar101._24_4_;
  auVar112._24_4_ = fVar245 * auVar105._24_4_;
  auVar112._28_4_ = 1;
  auVar99._4_4_ = auVar103._4_4_ * fVar154;
  auVar99._0_4_ = auVar103._0_4_ * fVar219;
  auVar99._8_4_ = auVar103._8_4_ * fVar240;
  auVar99._12_4_ = auVar103._12_4_ * fVar241;
  auVar99._16_4_ = auVar103._16_4_ * fVar243;
  auVar99._20_4_ = auVar103._20_4_ * fVar251;
  auVar99._24_4_ = auVar103._24_4_ * fVar245;
  auVar99._28_4_ = auVar105._28_4_;
  auVar103._4_4_ = auVar110._4_4_ * fVar154;
  auVar103._0_4_ = auVar110._0_4_ * fVar219;
  auVar103._8_4_ = auVar110._8_4_ * fVar240;
  auVar103._12_4_ = auVar110._12_4_ * fVar241;
  auVar103._16_4_ = auVar110._16_4_ * fVar243;
  auVar103._20_4_ = auVar110._20_4_ * fVar251;
  auVar103._24_4_ = auVar110._24_4_ * fVar245;
  auVar103._28_4_ = auVar101._28_4_;
  auVar92 = vfmadd231ps_fma(auVar112,auVar111,auVar102);
  auVar88 = vfmadd231ps_fma(auVar99,auVar111,auVar107);
  auVar93 = vfmadd231ps_fma(auVar103,auVar111,auVar109);
  auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar122,auVar104);
  auVar88 = vfmadd231ps_fma(ZEXT1632(auVar88),auVar122,auVar106);
  auVar118._8_4_ = 0x7fffffff;
  auVar118._0_8_ = 0x7fffffff7fffffff;
  auVar118._12_4_ = 0x7fffffff;
  auVar118._16_4_ = 0x7fffffff;
  auVar118._20_4_ = 0x7fffffff;
  auVar118._24_4_ = 0x7fffffff;
  auVar118._28_4_ = 0x7fffffff;
  auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar122,auVar108);
  auVar104 = vandps_avx(ZEXT1632(auVar90),auVar118);
  auVar120._8_4_ = 0x219392ef;
  auVar120._0_8_ = 0x219392ef219392ef;
  auVar120._12_4_ = 0x219392ef;
  auVar120._16_4_ = 0x219392ef;
  auVar120._20_4_ = 0x219392ef;
  auVar120._24_4_ = 0x219392ef;
  auVar120._28_4_ = 0x219392ef;
  uVar87 = vcmpps_avx512vl(auVar104,auVar120,1);
  bVar8 = (bool)((byte)uVar87 & 1);
  auVar100._0_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar90._0_4_;
  bVar8 = (bool)((byte)(uVar87 >> 1) & 1);
  auVar100._4_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar90._4_4_;
  bVar8 = (bool)((byte)(uVar87 >> 2) & 1);
  auVar100._8_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar90._8_4_;
  bVar8 = (bool)((byte)(uVar87 >> 3) & 1);
  auVar100._12_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar90._12_4_;
  auVar100._16_4_ = (uint)((byte)(uVar87 >> 4) & 1) * 0x219392ef;
  auVar100._20_4_ = (uint)((byte)(uVar87 >> 5) & 1) * 0x219392ef;
  auVar100._24_4_ = (uint)((byte)(uVar87 >> 6) & 1) * 0x219392ef;
  auVar100._28_4_ = (uint)(byte)(uVar87 >> 7) * 0x219392ef;
  auVar104 = vandps_avx(ZEXT1632(auVar15),auVar118);
  uVar87 = vcmpps_avx512vl(auVar104,auVar120,1);
  bVar8 = (bool)((byte)uVar87 & 1);
  auVar114._0_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar15._0_4_;
  bVar8 = (bool)((byte)(uVar87 >> 1) & 1);
  auVar114._4_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar15._4_4_;
  bVar8 = (bool)((byte)(uVar87 >> 2) & 1);
  auVar114._8_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar15._8_4_;
  bVar8 = (bool)((byte)(uVar87 >> 3) & 1);
  auVar114._12_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar15._12_4_;
  auVar114._16_4_ = (uint)((byte)(uVar87 >> 4) & 1) * 0x219392ef;
  auVar114._20_4_ = (uint)((byte)(uVar87 >> 5) & 1) * 0x219392ef;
  auVar114._24_4_ = (uint)((byte)(uVar87 >> 6) & 1) * 0x219392ef;
  auVar114._28_4_ = (uint)(byte)(uVar87 >> 7) * 0x219392ef;
  auVar104 = vandps_avx(ZEXT1632(auVar91),auVar118);
  uVar87 = vcmpps_avx512vl(auVar104,auVar120,1);
  bVar8 = (bool)((byte)uVar87 & 1);
  auVar104._0_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar91._0_4_;
  bVar8 = (bool)((byte)(uVar87 >> 1) & 1);
  auVar104._4_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar91._4_4_;
  bVar8 = (bool)((byte)(uVar87 >> 2) & 1);
  auVar104._8_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar91._8_4_;
  bVar8 = (bool)((byte)(uVar87 >> 3) & 1);
  auVar104._12_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar91._12_4_;
  auVar104._16_4_ = (uint)((byte)(uVar87 >> 4) & 1) * 0x219392ef;
  auVar104._20_4_ = (uint)((byte)(uVar87 >> 5) & 1) * 0x219392ef;
  auVar104._24_4_ = (uint)((byte)(uVar87 >> 6) & 1) * 0x219392ef;
  auVar104._28_4_ = (uint)(byte)(uVar87 >> 7) * 0x219392ef;
  auVar102 = vrcp14ps_avx512vl(auVar100);
  auVar119._8_4_ = 0x3f800000;
  auVar119._0_8_ = &DAT_3f8000003f800000;
  auVar119._12_4_ = 0x3f800000;
  auVar119._16_4_ = 0x3f800000;
  auVar119._20_4_ = 0x3f800000;
  auVar119._24_4_ = 0x3f800000;
  auVar119._28_4_ = 0x3f800000;
  auVar90 = vfnmadd213ps_fma(auVar100,auVar102,auVar119);
  auVar90 = vfmadd132ps_fma(ZEXT1632(auVar90),auVar102,auVar102);
  auVar102 = vrcp14ps_avx512vl(auVar114);
  auVar15 = vfnmadd213ps_fma(auVar114,auVar102,auVar119);
  auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar102,auVar102);
  auVar102 = vrcp14ps_avx512vl(auVar104);
  auVar91 = vfnmadd213ps_fma(auVar104,auVar102,auVar119);
  auVar91 = vfmadd132ps_fma(ZEXT1632(auVar91),auVar102,auVar102);
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 7 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar92));
  auVar108._4_4_ = auVar90._4_4_ * auVar104._4_4_;
  auVar108._0_4_ = auVar90._0_4_ * auVar104._0_4_;
  auVar108._8_4_ = auVar90._8_4_ * auVar104._8_4_;
  auVar108._12_4_ = auVar90._12_4_ * auVar104._12_4_;
  auVar108._16_4_ = auVar104._16_4_ * 0.0;
  auVar108._20_4_ = auVar104._20_4_ * 0.0;
  auVar108._24_4_ = auVar104._24_4_ * 0.0;
  auVar108._28_4_ = auVar104._28_4_;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 9 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar92));
  auVar103 = vpbroadcastd_avx512vl();
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar2 * 0x10 + 6));
  auVar117._0_4_ = auVar90._0_4_ * auVar104._0_4_;
  auVar117._4_4_ = auVar90._4_4_ * auVar104._4_4_;
  auVar117._8_4_ = auVar90._8_4_ * auVar104._8_4_;
  auVar117._12_4_ = auVar90._12_4_ * auVar104._12_4_;
  auVar117._16_4_ = auVar104._16_4_ * 0.0;
  auVar117._20_4_ = auVar104._20_4_ * 0.0;
  auVar117._24_4_ = auVar104._24_4_ * 0.0;
  auVar117._28_4_ = 0;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar2 * 0x10 + uVar79 * -2 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar88));
  auVar109._4_4_ = auVar15._4_4_ * auVar104._4_4_;
  auVar109._0_4_ = auVar15._0_4_ * auVar104._0_4_;
  auVar109._8_4_ = auVar15._8_4_ * auVar104._8_4_;
  auVar109._12_4_ = auVar15._12_4_ * auVar104._12_4_;
  auVar109._16_4_ = auVar104._16_4_ * 0.0;
  auVar109._20_4_ = auVar104._20_4_ * 0.0;
  auVar109._24_4_ = auVar104._24_4_ * 0.0;
  auVar109._28_4_ = auVar104._28_4_;
  auVar104 = vcvtdq2ps_avx(auVar102);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar88));
  auVar116._0_4_ = auVar15._0_4_ * auVar104._0_4_;
  auVar116._4_4_ = auVar15._4_4_ * auVar104._4_4_;
  auVar116._8_4_ = auVar15._8_4_ * auVar104._8_4_;
  auVar116._12_4_ = auVar15._12_4_ * auVar104._12_4_;
  auVar116._16_4_ = auVar104._16_4_ * 0.0;
  auVar116._20_4_ = auVar104._20_4_ * 0.0;
  auVar116._24_4_ = auVar104._24_4_ * 0.0;
  auVar116._28_4_ = 0;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar83 + uVar79 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar93));
  auVar110._4_4_ = auVar104._4_4_ * auVar91._4_4_;
  auVar110._0_4_ = auVar104._0_4_ * auVar91._0_4_;
  auVar110._8_4_ = auVar104._8_4_ * auVar91._8_4_;
  auVar110._12_4_ = auVar104._12_4_ * auVar91._12_4_;
  auVar110._16_4_ = auVar104._16_4_ * 0.0;
  auVar110._20_4_ = auVar104._20_4_ * 0.0;
  auVar110._24_4_ = auVar104._24_4_ * 0.0;
  auVar110._28_4_ = auVar104._28_4_;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar79 * 0x17 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar93));
  auVar115._0_4_ = auVar91._0_4_ * auVar104._0_4_;
  auVar115._4_4_ = auVar91._4_4_ * auVar104._4_4_;
  auVar115._8_4_ = auVar91._8_4_ * auVar104._8_4_;
  auVar115._12_4_ = auVar91._12_4_ * auVar104._12_4_;
  auVar115._16_4_ = auVar104._16_4_ * 0.0;
  auVar115._20_4_ = auVar104._20_4_ * 0.0;
  auVar115._24_4_ = auVar104._24_4_ * 0.0;
  auVar115._28_4_ = 0;
  auVar104 = vpminsd_avx2(auVar108,auVar117);
  auVar102 = vpminsd_avx2(auVar109,auVar116);
  auVar104 = vmaxps_avx(auVar104,auVar102);
  auVar102 = vpminsd_avx2(auVar110,auVar115);
  uVar220 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar105._4_4_ = uVar220;
  auVar105._0_4_ = uVar220;
  auVar105._8_4_ = uVar220;
  auVar105._12_4_ = uVar220;
  auVar105._16_4_ = uVar220;
  auVar105._20_4_ = uVar220;
  auVar105._24_4_ = uVar220;
  auVar105._28_4_ = uVar220;
  auVar102 = vmaxps_avx512vl(auVar102,auVar105);
  auVar104 = vmaxps_avx(auVar104,auVar102);
  auVar102._8_4_ = 0x3f7ffffa;
  auVar102._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar102._12_4_ = 0x3f7ffffa;
  auVar102._16_4_ = 0x3f7ffffa;
  auVar102._20_4_ = 0x3f7ffffa;
  auVar102._24_4_ = 0x3f7ffffa;
  auVar102._28_4_ = 0x3f7ffffa;
  local_420 = vmulps_avx512vl(auVar104,auVar102);
  auVar104 = vpmaxsd_avx2(auVar108,auVar117);
  auVar102 = vpmaxsd_avx2(auVar109,auVar116);
  auVar104 = vminps_avx(auVar104,auVar102);
  auVar102 = vpmaxsd_avx2(auVar110,auVar115);
  uVar220 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar106._4_4_ = uVar220;
  auVar106._0_4_ = uVar220;
  auVar106._8_4_ = uVar220;
  auVar106._12_4_ = uVar220;
  auVar106._16_4_ = uVar220;
  auVar106._20_4_ = uVar220;
  auVar106._24_4_ = uVar220;
  auVar106._28_4_ = uVar220;
  auVar102 = vminps_avx512vl(auVar102,auVar106);
  auVar104 = vminps_avx(auVar104,auVar102);
  auVar107._8_4_ = 0x3f800003;
  auVar107._0_8_ = 0x3f8000033f800003;
  auVar107._12_4_ = 0x3f800003;
  auVar107._16_4_ = 0x3f800003;
  auVar107._20_4_ = 0x3f800003;
  auVar107._24_4_ = 0x3f800003;
  auVar107._28_4_ = 0x3f800003;
  auVar104 = vmulps_avx512vl(auVar104,auVar107);
  uVar19 = vpcmpgtd_avx512vl(auVar103,_DAT_0205a920);
  uVar17 = vcmpps_avx512vl(local_420,auVar104,2);
  if ((byte)((byte)uVar17 & (byte)uVar19) == 0) {
    return;
  }
  local_8c8 = (ulong)(byte)((byte)uVar17 & (byte)uVar19);
  local_8e8 = (undefined1 (*) [32])&local_4c0;
  local_640 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_8e0 = prim;
LAB_01de769a:
  lVar85 = 0;
  for (uVar87 = local_8c8; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x8000000000000000) {
    lVar85 = lVar85 + 1;
  }
  uVar84 = *(uint *)(prim + 2);
  uVar3 = *(uint *)(prim + lVar85 * 4 + 6);
  pGVar5 = (context->scene->geometries).items[uVar84].ptr;
  uVar87 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)uVar3);
  p_Var6 = pGVar5[1].intersectionFilterN;
  lVar85 = *(long *)&pGVar5[1].time_range.upper;
  auVar90 = *(undefined1 (*) [16])(lVar85 + (long)p_Var6 * uVar87);
  auVar15 = *(undefined1 (*) [16])(lVar85 + (uVar87 + 1) * (long)p_Var6);
  auVar91 = *(undefined1 (*) [16])(lVar85 + (uVar87 + 2) * (long)p_Var6);
  local_8c8 = local_8c8 - 1 & local_8c8;
  auVar92 = *(undefined1 (*) [16])(lVar85 + (uVar87 + 3) * (long)p_Var6);
  if (local_8c8 != 0) {
    uVar83 = local_8c8 - 1 & local_8c8;
    for (uVar87 = local_8c8; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x8000000000000000) {
    }
    if (uVar83 != 0) {
      for (; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar88 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar93 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  auVar104 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
  auVar102 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
  auVar88 = vunpcklps_avx512vl(auVar104._0_16_,auVar102._0_16_);
  local_8c0 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xc0)));
  auVar258 = ZEXT3264(local_8c0);
  auVar94 = local_8c0._0_16_;
  local_850 = vinsertps_avx512f(auVar88,auVar94,0x28);
  auVar96._0_4_ = auVar90._0_4_ + auVar15._0_4_ + auVar91._0_4_ + auVar92._0_4_;
  auVar96._4_4_ = auVar90._4_4_ + auVar15._4_4_ + auVar91._4_4_ + auVar92._4_4_;
  auVar96._8_4_ = auVar90._8_4_ + auVar15._8_4_ + auVar91._8_4_ + auVar92._8_4_;
  auVar96._12_4_ = auVar90._12_4_ + auVar15._12_4_ + auVar91._12_4_ + auVar92._12_4_;
  auVar95._8_4_ = 0x3e800000;
  auVar95._0_8_ = 0x3e8000003e800000;
  auVar95._12_4_ = 0x3e800000;
  auVar88 = vmulps_avx512vl(auVar96,auVar95);
  auVar88 = vsubps_avx(auVar88,auVar93);
  auVar88 = vdpps_avx(auVar88,local_850,0x7f);
  fVar219 = *(float *)(ray + k * 4 + 0x60);
  local_860 = vdpps_avx(local_850,local_850,0x7f);
  auVar98._4_12_ = ZEXT812(0) << 0x20;
  auVar98._0_4_ = local_860._0_4_;
  auVar89 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar98);
  auVar1 = vfnmadd213ss_fma(auVar89,local_860,ZEXT416(0x40000000));
  local_400 = auVar88._0_4_ * auVar89._0_4_ * auVar1._0_4_;
  auVar97._4_4_ = local_400;
  auVar97._0_4_ = local_400;
  auVar97._8_4_ = local_400;
  auVar97._12_4_ = local_400;
  fStack_6f0 = local_400;
  _local_700 = auVar97;
  fStack_6ec = local_400;
  fStack_6e8 = local_400;
  fStack_6e4 = local_400;
  auVar88 = vfmadd231ps_fma(auVar93,local_850,auVar97);
  auVar88 = vblendps_avx(auVar88,ZEXT816(0) << 0x40,8);
  auVar90 = vsubps_avx(auVar90,auVar88);
  auVar91 = vsubps_avx(auVar91,auVar88);
  auVar15 = vsubps_avx(auVar15,auVar88);
  auVar92 = vsubps_avx(auVar92,auVar88);
  local_1e0 = auVar90._0_4_;
  uStack_1dc = local_1e0;
  uStack_1d8 = local_1e0;
  uStack_1d4 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1cc = local_1e0;
  uStack_1c8 = local_1e0;
  uStack_1c4 = local_1e0;
  auVar125._8_4_ = 1;
  auVar125._0_8_ = 0x100000001;
  auVar125._12_4_ = 1;
  auVar125._16_4_ = 1;
  auVar125._20_4_ = 1;
  auVar125._24_4_ = 1;
  auVar125._28_4_ = 1;
  local_740 = ZEXT1632(auVar90);
  local_200 = vpermps_avx2(auVar125,local_740);
  auVar126._8_4_ = 2;
  auVar126._0_8_ = 0x200000002;
  auVar126._12_4_ = 2;
  auVar126._16_4_ = 2;
  auVar126._20_4_ = 2;
  auVar126._24_4_ = 2;
  auVar126._28_4_ = 2;
  local_220 = vpermps_avx2(auVar126,local_740);
  auVar127._8_4_ = 3;
  auVar127._0_8_ = 0x300000003;
  auVar127._12_4_ = 3;
  auVar127._16_4_ = 3;
  auVar127._20_4_ = 3;
  auVar127._24_4_ = 3;
  auVar127._28_4_ = 3;
  local_240 = vpermps_avx2(auVar127,local_740);
  local_260 = auVar15._0_4_;
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  local_780 = ZEXT1632(auVar15);
  local_280 = vpermps_avx2(auVar125,local_780);
  local_2a0 = vpermps_avx2(auVar126,local_780);
  local_2c0 = vpermps_avx2(auVar127,local_780);
  local_2e0 = auVar91._0_4_;
  uStack_2dc = local_2e0;
  uStack_2d8 = local_2e0;
  uStack_2d4 = local_2e0;
  uStack_2d0 = local_2e0;
  uStack_2cc = local_2e0;
  uStack_2c8 = local_2e0;
  uStack_2c4 = local_2e0;
  local_760 = ZEXT1632(auVar91);
  local_300 = vpermps_avx2(auVar125,local_760);
  local_320 = vpermps_avx2(auVar126,local_760);
  local_340 = vpermps_avx2(auVar127,local_760);
  uVar220 = auVar92._0_4_;
  local_360._4_4_ = uVar220;
  local_360._0_4_ = uVar220;
  fStack_358 = (float)uVar220;
  fStack_354 = (float)uVar220;
  fStack_350 = (float)uVar220;
  fStack_34c = (float)uVar220;
  fStack_348 = (float)uVar220;
  register0x0000131c = uVar220;
  auVar233 = ZEXT3264(_local_360);
  _local_7a0 = ZEXT1632(auVar92);
  _local_380 = vpermps_avx2(auVar125,_local_7a0);
  _local_3a0 = vpermps_avx2(auVar126,_local_7a0);
  _local_3c0 = vpermps_avx2(auVar127,_local_7a0);
  auVar90 = vmulss_avx512f(auVar94,auVar94);
  auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar90),auVar102,auVar102);
  local_5c0 = vfmadd231ps_avx512vl(auVar105,auVar104,auVar104);
  local_3e0._0_4_ = local_5c0._0_4_;
  local_3e0._4_4_ = local_3e0._0_4_;
  local_3e0._8_4_ = local_3e0._0_4_;
  local_3e0._12_4_ = local_3e0._0_4_;
  local_3e0._16_4_ = local_3e0._0_4_;
  local_3e0._20_4_ = local_3e0._0_4_;
  local_3e0._24_4_ = local_3e0._0_4_;
  local_3e0._28_4_ = local_3e0._0_4_;
  auVar124._8_4_ = 0x7fffffff;
  auVar124._0_8_ = 0x7fffffff7fffffff;
  auVar124._12_4_ = 0x7fffffff;
  auVar124._16_4_ = 0x7fffffff;
  auVar124._20_4_ = 0x7fffffff;
  auVar124._24_4_ = 0x7fffffff;
  auVar124._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_3e0,auVar124);
  local_800 = ZEXT416((uint)local_400);
  local_400 = fVar219 - local_400;
  fStack_3fc = local_400;
  fStack_3f8 = local_400;
  fStack_3f4 = local_400;
  fStack_3f0 = local_400;
  fStack_3ec = local_400;
  fStack_3e8 = local_400;
  fStack_3e4 = local_400;
  local_600 = vpbroadcastd_avx512vl();
  local_8d8 = 1;
  local_8d0 = 0;
  local_620 = vpbroadcastd_avx512vl();
  auVar90 = vsqrtss_avx(local_860,local_860);
  auVar15 = vsqrtss_avx(local_860,local_860);
  auVar216 = ZEXT1664(ZEXT816(0x3f80000000000000));
  auVar226 = ZEXT3264(_DAT_02020f20);
  do {
    local_900 = auVar216._0_16_;
    auVar91 = vmovshdup_avx(local_900);
    fVar240 = auVar216._0_4_;
    fVar154 = auVar91._0_4_ - fVar240;
    fVar251 = fVar154 * 0.04761905;
    auVar236._4_4_ = fVar240;
    auVar236._0_4_ = fVar240;
    auVar236._8_4_ = fVar240;
    auVar236._12_4_ = fVar240;
    auVar236._16_4_ = fVar240;
    auVar236._20_4_ = fVar240;
    auVar236._24_4_ = fVar240;
    auVar236._28_4_ = fVar240;
    local_880._4_4_ = fVar154;
    local_880._0_4_ = fVar154;
    local_880._8_4_ = fVar154;
    local_880._12_4_ = fVar154;
    local_880._16_4_ = fVar154;
    local_880._20_4_ = fVar154;
    local_880._24_4_ = fVar154;
    local_880._28_4_ = fVar154;
    auVar91 = vfmadd231ps_fma(auVar236,local_880,auVar226._0_32_);
    auVar163._8_4_ = 0x3f800000;
    auVar163._0_8_ = &DAT_3f8000003f800000;
    auVar163._12_4_ = 0x3f800000;
    auVar163._16_4_ = 0x3f800000;
    auVar163._20_4_ = 0x3f800000;
    auVar163._24_4_ = 0x3f800000;
    auVar163._28_4_ = 0x3f800000;
    auVar105 = vsubps_avx(auVar163,ZEXT1632(auVar91));
    auVar73._4_4_ = fStack_25c;
    auVar73._0_4_ = local_260;
    auVar73._8_4_ = fStack_258;
    auVar73._12_4_ = fStack_254;
    auVar73._16_4_ = fStack_250;
    auVar73._20_4_ = fStack_24c;
    auVar73._24_4_ = fStack_248;
    auVar73._28_4_ = fStack_244;
    fVar154 = auVar91._0_4_;
    auVar189._0_4_ = local_260 * fVar154;
    fVar240 = auVar91._4_4_;
    auVar189._4_4_ = fStack_25c * fVar240;
    fVar241 = auVar91._8_4_;
    auVar189._8_4_ = fStack_258 * fVar241;
    fVar243 = auVar91._12_4_;
    auVar189._12_4_ = fStack_254 * fVar243;
    auVar189._16_4_ = fStack_250 * 0.0;
    auVar189._20_4_ = fStack_24c * 0.0;
    auVar189._24_4_ = fStack_248 * 0.0;
    auVar189._28_4_ = 0;
    auVar217._0_4_ = local_280._0_4_ * fVar154;
    auVar217._4_4_ = local_280._4_4_ * fVar240;
    auVar217._8_4_ = local_280._8_4_ * fVar241;
    auVar217._12_4_ = local_280._12_4_ * fVar243;
    auVar217._16_4_ = local_280._16_4_ * 0.0;
    auVar217._20_4_ = local_280._20_4_ * 0.0;
    auVar217._28_36_ = auVar216._28_36_;
    auVar217._24_4_ = local_280._24_4_ * 0.0;
    auVar216._0_4_ = local_2a0._0_4_ * fVar154;
    auVar216._4_4_ = local_2a0._4_4_ * fVar240;
    auVar216._8_4_ = local_2a0._8_4_ * fVar241;
    auVar216._12_4_ = local_2a0._12_4_ * fVar243;
    auVar216._16_4_ = local_2a0._16_4_ * 0.0;
    auVar216._20_4_ = local_2a0._20_4_ * 0.0;
    auVar216._28_36_ = auVar226._28_36_;
    auVar216._24_4_ = local_2a0._24_4_ * 0.0;
    auVar226._0_4_ = local_2c0._0_4_ * fVar154;
    auVar226._4_4_ = local_2c0._4_4_ * fVar240;
    auVar226._8_4_ = local_2c0._8_4_ * fVar241;
    auVar226._12_4_ = local_2c0._12_4_ * fVar243;
    auVar226._16_4_ = local_2c0._16_4_ * 0.0;
    auVar226._20_4_ = local_2c0._20_4_ * 0.0;
    auVar226._28_36_ = auVar233._28_36_;
    auVar226._24_4_ = local_2c0._24_4_ * 0.0;
    auVar74._4_4_ = uStack_1dc;
    auVar74._0_4_ = local_1e0;
    auVar74._8_4_ = uStack_1d8;
    auVar74._12_4_ = uStack_1d4;
    auVar74._16_4_ = uStack_1d0;
    auVar74._20_4_ = uStack_1cc;
    auVar74._24_4_ = uStack_1c8;
    auVar74._28_4_ = uStack_1c4;
    auVar92 = vfmadd231ps_fma(auVar189,auVar105,auVar74);
    auVar88 = vfmadd231ps_fma(auVar217._0_32_,auVar105,local_200);
    auVar93 = vfmadd231ps_fma(auVar216._0_32_,auVar105,local_220);
    auVar1 = vfmadd231ps_fma(auVar226._0_32_,auVar105,local_240);
    auVar72._4_4_ = uStack_2dc;
    auVar72._0_4_ = local_2e0;
    auVar72._8_4_ = uStack_2d8;
    auVar72._12_4_ = uStack_2d4;
    auVar72._16_4_ = uStack_2d0;
    auVar72._20_4_ = uStack_2cc;
    auVar72._24_4_ = uStack_2c8;
    auVar72._28_4_ = uStack_2c4;
    auVar106 = vmulps_avx512vl(auVar72,ZEXT1632(auVar91));
    auVar101 = ZEXT1632(auVar91);
    auVar107 = vmulps_avx512vl(local_300,auVar101);
    auVar103 = vmulps_avx512vl(local_320,auVar101);
    auVar108 = vmulps_avx512vl(local_340,auVar101);
    auVar89 = vfmadd231ps_fma(auVar106,auVar105,auVar73);
    auVar94 = vfmadd231ps_fma(auVar107,auVar105,local_280);
    auVar95 = vfmadd231ps_fma(auVar103,auVar105,local_2a0);
    auVar96 = vfmadd231ps_fma(auVar108,auVar105,local_2c0);
    auVar39._4_4_ = fVar240 * (float)local_360._4_4_;
    auVar39._0_4_ = fVar154 * (float)local_360._0_4_;
    auVar39._8_4_ = fVar241 * fStack_358;
    auVar39._12_4_ = fVar243 * fStack_354;
    auVar39._16_4_ = fStack_350 * 0.0;
    auVar39._20_4_ = fStack_34c * 0.0;
    auVar39._24_4_ = fStack_348 * 0.0;
    auVar39._28_4_ = fStack_244;
    auVar40._4_4_ = fVar240 * (float)local_380._4_4_;
    auVar40._0_4_ = fVar154 * (float)local_380._0_4_;
    auVar40._8_4_ = fVar241 * fStack_378;
    auVar40._12_4_ = fVar243 * fStack_374;
    auVar40._16_4_ = fStack_370 * 0.0;
    auVar40._20_4_ = fStack_36c * 0.0;
    auVar40._24_4_ = fStack_368 * 0.0;
    auVar40._28_4_ = local_280._28_4_;
    auVar41._4_4_ = fVar240 * (float)local_3a0._4_4_;
    auVar41._0_4_ = fVar154 * (float)local_3a0._0_4_;
    auVar41._8_4_ = fVar241 * fStack_398;
    auVar41._12_4_ = fVar243 * fStack_394;
    auVar41._16_4_ = fStack_390 * 0.0;
    auVar41._20_4_ = fStack_38c * 0.0;
    auVar41._24_4_ = fStack_388 * 0.0;
    auVar41._28_4_ = local_2a0._28_4_;
    auVar42._4_4_ = fVar240 * (float)local_3c0._4_4_;
    auVar42._0_4_ = fVar154 * (float)local_3c0._0_4_;
    auVar42._8_4_ = fVar241 * fStack_3b8;
    auVar42._12_4_ = fVar243 * fStack_3b4;
    auVar42._16_4_ = fStack_3b0 * 0.0;
    auVar42._20_4_ = fStack_3ac * 0.0;
    auVar42._24_4_ = fStack_3a8 * 0.0;
    auVar42._28_4_ = local_2c0._28_4_;
    auVar106 = vfmadd231ps_avx512vl(auVar39,auVar105,auVar72);
    auVar107 = vfmadd231ps_avx512vl(auVar40,auVar105,local_300);
    auVar103 = vfmadd231ps_avx512vl(auVar41,auVar105,local_320);
    auVar108 = vfmadd231ps_avx512vl(auVar42,auVar105,local_340);
    auVar109 = vmulps_avx512vl(auVar101,ZEXT1632(auVar89));
    auVar110 = vmulps_avx512vl(auVar101,ZEXT1632(auVar94));
    auVar111 = vmulps_avx512vl(auVar101,ZEXT1632(auVar95));
    auVar101 = vmulps_avx512vl(auVar101,ZEXT1632(auVar96));
    auVar109 = vfmadd231ps_avx512vl(auVar109,auVar105,ZEXT1632(auVar92));
    auVar110 = vfmadd231ps_avx512vl(auVar110,auVar105,ZEXT1632(auVar88));
    auVar111 = vfmadd231ps_avx512vl(auVar111,auVar105,ZEXT1632(auVar93));
    auVar101 = vfmadd231ps_avx512vl(auVar101,auVar105,ZEXT1632(auVar1));
    auVar190._0_4_ = auVar106._0_4_ * fVar154;
    auVar190._4_4_ = auVar106._4_4_ * fVar240;
    auVar190._8_4_ = auVar106._8_4_ * fVar241;
    auVar190._12_4_ = auVar106._12_4_ * fVar243;
    auVar190._16_4_ = auVar106._16_4_ * 0.0;
    auVar190._20_4_ = auVar106._20_4_ * 0.0;
    auVar190._24_4_ = auVar106._24_4_ * 0.0;
    auVar190._28_4_ = 0;
    auVar43._4_4_ = auVar107._4_4_ * fVar240;
    auVar43._0_4_ = auVar107._0_4_ * fVar154;
    auVar43._8_4_ = auVar107._8_4_ * fVar241;
    auVar43._12_4_ = auVar107._12_4_ * fVar243;
    auVar43._16_4_ = auVar107._16_4_ * 0.0;
    auVar43._20_4_ = auVar107._20_4_ * 0.0;
    auVar43._24_4_ = auVar107._24_4_ * 0.0;
    auVar43._28_4_ = auVar106._28_4_;
    auVar44._4_4_ = auVar103._4_4_ * fVar240;
    auVar44._0_4_ = auVar103._0_4_ * fVar154;
    auVar44._8_4_ = auVar103._8_4_ * fVar241;
    auVar44._12_4_ = auVar103._12_4_ * fVar243;
    auVar44._16_4_ = auVar103._16_4_ * 0.0;
    auVar44._20_4_ = auVar103._20_4_ * 0.0;
    auVar44._24_4_ = auVar103._24_4_ * 0.0;
    auVar44._28_4_ = auVar107._28_4_;
    auVar45._4_4_ = auVar108._4_4_ * fVar240;
    auVar45._0_4_ = auVar108._0_4_ * fVar154;
    auVar45._8_4_ = auVar108._8_4_ * fVar241;
    auVar45._12_4_ = auVar108._12_4_ * fVar243;
    auVar45._16_4_ = auVar108._16_4_ * 0.0;
    auVar45._20_4_ = auVar108._20_4_ * 0.0;
    auVar45._24_4_ = auVar108._24_4_ * 0.0;
    auVar45._28_4_ = auVar103._28_4_;
    auVar92 = vfmadd231ps_fma(auVar190,auVar105,ZEXT1632(auVar89));
    auVar88 = vfmadd231ps_fma(auVar43,auVar105,ZEXT1632(auVar94));
    auVar93 = vfmadd231ps_fma(auVar44,auVar105,ZEXT1632(auVar95));
    auVar1 = vfmadd231ps_fma(auVar45,auVar105,ZEXT1632(auVar96));
    auVar106 = vmulps_avx512vl(ZEXT1632(auVar91),ZEXT1632(auVar93));
    auVar108 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(fVar243 * auVar92._12_4_,
                                             CONCAT48(fVar241 * auVar92._8_4_,
                                                      CONCAT44(fVar240 * auVar92._4_4_,
                                                               fVar154 * auVar92._0_4_)))),auVar105,
                          auVar109);
    auVar233 = ZEXT3264(auVar108);
    auVar112 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar88._12_4_ * fVar243,
                                             CONCAT48(auVar88._8_4_ * fVar241,
                                                      CONCAT44(auVar88._4_4_ * fVar240,
                                                               auVar88._0_4_ * fVar154)))),auVar105,
                          auVar110);
    auVar113 = vfmadd231ps_avx512vl(auVar106,auVar105,auVar111);
    auVar107 = vfmadd231ps_avx512vl
                         (ZEXT1632(CONCAT412(auVar1._12_4_ * fVar243,
                                             CONCAT48(auVar1._8_4_ * fVar241,
                                                      CONCAT44(auVar1._4_4_ * fVar240,
                                                               auVar1._0_4_ * fVar154)))),auVar101,
                          auVar105);
    auVar105 = vsubps_avx512vl(ZEXT1632(auVar92),auVar109);
    auVar106 = vsubps_avx512vl(ZEXT1632(auVar88),auVar110);
    auVar103 = vsubps_avx512vl(ZEXT1632(auVar93),auVar111);
    auVar109 = vsubps_avx512vl(ZEXT1632(auVar1),auVar101);
    auVar253._0_4_ = fVar251 * auVar105._0_4_ * 3.0;
    auVar253._4_4_ = fVar251 * auVar105._4_4_ * 3.0;
    auVar253._8_4_ = fVar251 * auVar105._8_4_ * 3.0;
    auVar253._12_4_ = fVar251 * auVar105._12_4_ * 3.0;
    auVar253._16_4_ = fVar251 * auVar105._16_4_ * 3.0;
    auVar253._20_4_ = fVar251 * auVar105._20_4_ * 3.0;
    auVar253._24_4_ = fVar251 * auVar105._24_4_ * 3.0;
    auVar253._28_4_ = 0;
    auVar255._0_4_ = fVar251 * auVar106._0_4_ * 3.0;
    auVar255._4_4_ = fVar251 * auVar106._4_4_ * 3.0;
    auVar255._8_4_ = fVar251 * auVar106._8_4_ * 3.0;
    auVar255._12_4_ = fVar251 * auVar106._12_4_ * 3.0;
    auVar255._16_4_ = fVar251 * auVar106._16_4_ * 3.0;
    auVar255._20_4_ = fVar251 * auVar106._20_4_ * 3.0;
    auVar255._24_4_ = fVar251 * auVar106._24_4_ * 3.0;
    auVar255._28_4_ = 0;
    auVar256._0_4_ = auVar103._0_4_ * 3.0 * fVar251;
    auVar256._4_4_ = auVar103._4_4_ * 3.0 * fVar251;
    auVar256._8_4_ = auVar103._8_4_ * 3.0 * fVar251;
    auVar256._12_4_ = auVar103._12_4_ * 3.0 * fVar251;
    auVar256._16_4_ = auVar103._16_4_ * 3.0 * fVar251;
    auVar256._20_4_ = auVar103._20_4_ * 3.0 * fVar251;
    auVar256._24_4_ = auVar103._24_4_ * 3.0 * fVar251;
    auVar256._28_4_ = 0;
    fVar154 = auVar109._0_4_ * 3.0 * fVar251;
    fVar240 = auVar109._4_4_ * 3.0 * fVar251;
    auVar46._4_4_ = fVar240;
    auVar46._0_4_ = fVar154;
    fVar241 = auVar109._8_4_ * 3.0 * fVar251;
    auVar46._8_4_ = fVar241;
    fVar243 = auVar109._12_4_ * 3.0 * fVar251;
    auVar46._12_4_ = fVar243;
    fVar245 = auVar109._16_4_ * 3.0 * fVar251;
    auVar46._16_4_ = fVar245;
    fVar246 = auVar109._20_4_ * 3.0 * fVar251;
    auVar46._20_4_ = fVar246;
    fVar218 = auVar109._24_4_ * 3.0 * fVar251;
    auVar46._24_4_ = fVar218;
    auVar46._28_4_ = fVar251;
    auVar91 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
    auVar109 = vpermt2ps_avx512vl(auVar108,_DAT_0205fd20,ZEXT1632(auVar91));
    auVar110 = vpermt2ps_avx512vl(auVar112,_DAT_0205fd20,ZEXT1632(auVar91));
    auVar103 = ZEXT1632(auVar91);
    auVar111 = vpermt2ps_avx512vl(auVar113,_DAT_0205fd20,auVar103);
    auVar191._0_4_ = auVar107._0_4_ + fVar154;
    auVar191._4_4_ = auVar107._4_4_ + fVar240;
    auVar191._8_4_ = auVar107._8_4_ + fVar241;
    auVar191._12_4_ = auVar107._12_4_ + fVar243;
    auVar191._16_4_ = auVar107._16_4_ + fVar245;
    auVar191._20_4_ = auVar107._20_4_ + fVar246;
    auVar191._24_4_ = auVar107._24_4_ + fVar218;
    auVar191._28_4_ = auVar107._28_4_ + fVar251;
    auVar105 = vmaxps_avx(auVar107,auVar191);
    auVar106 = vminps_avx(auVar107,auVar191);
    auVar101 = vpermt2ps_avx512vl(auVar107,_DAT_0205fd20,auVar103);
    auVar99 = vpermt2ps_avx512vl(auVar253,_DAT_0205fd20,auVar103);
    auVar100 = vpermt2ps_avx512vl(auVar255,_DAT_0205fd20,auVar103);
    auVar126 = ZEXT1632(auVar91);
    auVar114 = vpermt2ps_avx512vl(auVar256,_DAT_0205fd20,auVar126);
    auVar107 = vpermt2ps_avx512vl(auVar46,_DAT_0205fd20,auVar126);
    auVar115 = vsubps_avx512vl(auVar101,auVar107);
    auVar107 = vsubps_avx(auVar109,auVar108);
    auVar103 = vsubps_avx(auVar110,auVar112);
    auVar116 = vsubps_avx512vl(auVar111,auVar113);
    auVar117 = vmulps_avx512vl(auVar103,auVar256);
    auVar117 = vfmsub231ps_avx512vl(auVar117,auVar255,auVar116);
    auVar118 = vmulps_avx512vl(auVar116,auVar253);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar256,auVar107);
    auVar119 = vmulps_avx512vl(auVar107,auVar255);
    auVar119 = vfmsub231ps_avx512vl(auVar119,auVar253,auVar103);
    auVar119 = vmulps_avx512vl(auVar119,auVar119);
    auVar118 = vfmadd231ps_avx512vl(auVar119,auVar118,auVar118);
    auVar117 = vfmadd231ps_avx512vl(auVar118,auVar117,auVar117);
    auVar118 = vmulps_avx512vl(auVar116,auVar116);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar103,auVar103);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar107,auVar107);
    auVar119 = vrcp14ps_avx512vl(auVar118);
    auVar120 = vfnmadd213ps_avx512vl(auVar119,auVar118,auVar163);
    auVar119 = vfmadd132ps_avx512vl(auVar120,auVar119,auVar119);
    auVar117 = vmulps_avx512vl(auVar117,auVar119);
    auVar120 = vmulps_avx512vl(auVar103,auVar114);
    auVar120 = vfmsub231ps_avx512vl(auVar120,auVar100,auVar116);
    auVar121 = vmulps_avx512vl(auVar116,auVar99);
    auVar121 = vfmsub231ps_avx512vl(auVar121,auVar114,auVar107);
    auVar122 = vmulps_avx512vl(auVar107,auVar100);
    auVar122 = vfmsub231ps_avx512vl(auVar122,auVar99,auVar103);
    auVar122 = vmulps_avx512vl(auVar122,auVar122);
    auVar121 = vfmadd231ps_avx512vl(auVar122,auVar121,auVar121);
    auVar120 = vfmadd231ps_avx512vl(auVar121,auVar120,auVar120);
    auVar119 = vmulps_avx512vl(auVar120,auVar119);
    auVar117 = vmaxps_avx512vl(auVar117,auVar119);
    auVar117 = vsqrtps_avx512vl(auVar117);
    auVar119 = vmaxps_avx512vl(auVar115,auVar101);
    auVar105 = vmaxps_avx512vl(auVar105,auVar119);
    auVar119 = vaddps_avx512vl(auVar117,auVar105);
    auVar105 = vminps_avx512vl(auVar115,auVar101);
    auVar105 = vminps_avx(auVar106,auVar105);
    auVar105 = vsubps_avx512vl(auVar105,auVar117);
    auVar130._8_4_ = 0x3f800002;
    auVar130._0_8_ = 0x3f8000023f800002;
    auVar130._12_4_ = 0x3f800002;
    auVar130._16_4_ = 0x3f800002;
    auVar130._20_4_ = 0x3f800002;
    auVar130._24_4_ = 0x3f800002;
    auVar130._28_4_ = 0x3f800002;
    auVar106 = vmulps_avx512vl(auVar119,auVar130);
    auVar131._8_4_ = 0x3f7ffffc;
    auVar131._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar131._12_4_ = 0x3f7ffffc;
    auVar131._16_4_ = 0x3f7ffffc;
    auVar131._20_4_ = 0x3f7ffffc;
    auVar131._24_4_ = 0x3f7ffffc;
    auVar131._28_4_ = 0x3f7ffffc;
    local_8a0 = vmulps_avx512vl(auVar105,auVar131);
    auVar47._4_4_ = auVar106._4_4_ * auVar106._4_4_;
    auVar47._0_4_ = auVar106._0_4_ * auVar106._0_4_;
    auVar47._8_4_ = auVar106._8_4_ * auVar106._8_4_;
    auVar47._12_4_ = auVar106._12_4_ * auVar106._12_4_;
    auVar47._16_4_ = auVar106._16_4_ * auVar106._16_4_;
    auVar47._20_4_ = auVar106._20_4_ * auVar106._20_4_;
    auVar47._24_4_ = auVar106._24_4_ * auVar106._24_4_;
    auVar47._28_4_ = local_8a0._28_4_;
    auVar105 = vrsqrt14ps_avx512vl(auVar118);
    auVar132._8_4_ = 0xbf000000;
    auVar132._0_8_ = 0xbf000000bf000000;
    auVar132._12_4_ = 0xbf000000;
    auVar132._16_4_ = 0xbf000000;
    auVar132._20_4_ = 0xbf000000;
    auVar132._24_4_ = 0xbf000000;
    auVar132._28_4_ = 0xbf000000;
    auVar106 = vmulps_avx512vl(auVar118,auVar132);
    auVar48._4_4_ = auVar105._4_4_ * auVar106._4_4_;
    auVar48._0_4_ = auVar105._0_4_ * auVar106._0_4_;
    auVar48._8_4_ = auVar105._8_4_ * auVar106._8_4_;
    auVar48._12_4_ = auVar105._12_4_ * auVar106._12_4_;
    auVar48._16_4_ = auVar105._16_4_ * auVar106._16_4_;
    auVar48._20_4_ = auVar105._20_4_ * auVar106._20_4_;
    auVar48._24_4_ = auVar105._24_4_ * auVar106._24_4_;
    auVar48._28_4_ = auVar106._28_4_;
    auVar106 = vmulps_avx512vl(auVar105,auVar105);
    auVar106 = vmulps_avx512vl(auVar106,auVar48);
    auVar133._8_4_ = 0x3fc00000;
    auVar133._0_8_ = 0x3fc000003fc00000;
    auVar133._12_4_ = 0x3fc00000;
    auVar133._16_4_ = 0x3fc00000;
    auVar133._20_4_ = 0x3fc00000;
    auVar133._24_4_ = 0x3fc00000;
    auVar133._28_4_ = 0x3fc00000;
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar105,auVar133);
    auVar49._4_4_ = auVar106._4_4_ * auVar107._4_4_;
    auVar49._0_4_ = auVar106._0_4_ * auVar107._0_4_;
    auVar49._8_4_ = auVar106._8_4_ * auVar107._8_4_;
    auVar49._12_4_ = auVar106._12_4_ * auVar107._12_4_;
    auVar49._16_4_ = auVar106._16_4_ * auVar107._16_4_;
    auVar49._20_4_ = auVar106._20_4_ * auVar107._20_4_;
    auVar49._24_4_ = auVar106._24_4_ * auVar107._24_4_;
    auVar49._28_4_ = auVar105._28_4_;
    auVar105 = vmulps_avx512vl(auVar103,auVar106);
    auVar101 = vmulps_avx512vl(auVar116,auVar106);
    auVar115 = vsubps_avx512vl(auVar126,auVar108);
    auVar117 = vsubps_avx512vl(auVar126,auVar112);
    auVar118 = vsubps_avx512vl(auVar126,auVar113);
    auVar119 = vmulps_avx512vl(auVar258._0_32_,auVar118);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar102,auVar117);
    auVar119 = vfmadd231ps_avx512vl(auVar119,auVar104,auVar115);
    auVar120 = vmulps_avx512vl(auVar118,auVar118);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar117,auVar117);
    auVar120 = vfmadd231ps_avx512vl(auVar120,auVar115,auVar115);
    auVar121 = vmulps_avx512vl(auVar258._0_32_,auVar101);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar105,auVar102);
    auVar121 = vfmadd231ps_avx512vl(auVar121,auVar49,auVar104);
    auVar101 = vmulps_avx512vl(auVar118,auVar101);
    auVar105 = vfmadd231ps_avx512vl(auVar101,auVar117,auVar105);
    auVar105 = vfmadd231ps_avx512vl(auVar105,auVar115,auVar49);
    local_6e0 = vmulps_avx512vl(auVar121,auVar121);
    auVar101 = vsubps_avx512vl(local_3e0,local_6e0);
    auVar122 = vmulps_avx512vl(auVar121,auVar105);
    auVar119 = vsubps_avx512vl(auVar119,auVar122);
    auVar119 = vaddps_avx512vl(auVar119,auVar119);
    auVar122 = vmulps_avx512vl(auVar105,auVar105);
    auVar120 = vsubps_avx512vl(auVar120,auVar122);
    auVar122 = vsubps_avx512vl(auVar120,auVar47);
    auVar123 = vmulps_avx512vl(auVar119,auVar119);
    auVar27._8_4_ = 0x40800000;
    auVar27._0_8_ = 0x4080000040800000;
    auVar27._12_4_ = 0x40800000;
    auVar27._16_4_ = 0x40800000;
    auVar27._20_4_ = 0x40800000;
    auVar27._24_4_ = 0x40800000;
    auVar27._28_4_ = 0x40800000;
    auVar124 = vmulps_avx512vl(auVar101,auVar27);
    auVar125 = vmulps_avx512vl(auVar124,auVar122);
    auVar125 = vsubps_avx512vl(auVar123,auVar125);
    auVar91 = vxorps_avx512vl(auVar120._0_16_,auVar120._0_16_);
    uVar87 = vcmpps_avx512vl(auVar125,auVar126,5);
    bVar75 = (byte)uVar87;
    if (bVar75 == 0) {
      auVar128 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar129 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar125 = vsqrtps_avx512vl(auVar125);
      auVar126 = vaddps_avx512vl(auVar101,auVar101);
      auVar127 = vrcp14ps_avx512vl(auVar126);
      auVar126 = vfnmadd213ps_avx512vl(auVar126,auVar127,auVar163);
      auVar126 = vfmadd132ps_avx512vl(auVar126,auVar127,auVar127);
      auVar28._8_4_ = 0x80000000;
      auVar28._0_8_ = 0x8000000080000000;
      auVar28._12_4_ = 0x80000000;
      auVar28._16_4_ = 0x80000000;
      auVar28._20_4_ = 0x80000000;
      auVar28._24_4_ = 0x80000000;
      auVar28._28_4_ = 0x80000000;
      auVar127 = vxorps_avx512vl(auVar119,auVar28);
      auVar127 = vsubps_avx512vl(auVar127,auVar125);
      auVar127 = vmulps_avx512vl(auVar127,auVar126);
      auVar125 = vsubps_avx512vl(auVar125,auVar119);
      auVar125 = vmulps_avx512vl(auVar125,auVar126);
      auVar126 = vfmadd213ps_avx512vl(auVar121,auVar127,auVar105);
      local_660 = vmulps_avx512vl(auVar106,auVar126);
      auVar126 = vfmadd213ps_avx512vl(auVar121,auVar125,auVar105);
      local_680 = vmulps_avx512vl(auVar106,auVar126);
      auVar164._8_4_ = 0x7f800000;
      auVar164._0_8_ = 0x7f8000007f800000;
      auVar164._12_4_ = 0x7f800000;
      auVar164._16_4_ = 0x7f800000;
      auVar164._20_4_ = 0x7f800000;
      auVar164._24_4_ = 0x7f800000;
      auVar164._28_4_ = 0x7f800000;
      auVar126 = vblendmps_avx512vl(auVar164,auVar127);
      auVar128._0_4_ =
           (uint)(bVar75 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar75 & 1) * local_680._0_4_;
      bVar8 = (bool)((byte)(uVar87 >> 1) & 1);
      auVar128._4_4_ = (uint)bVar8 * auVar126._4_4_ | (uint)!bVar8 * local_680._4_4_;
      bVar8 = (bool)((byte)(uVar87 >> 2) & 1);
      auVar128._8_4_ = (uint)bVar8 * auVar126._8_4_ | (uint)!bVar8 * local_680._8_4_;
      bVar8 = (bool)((byte)(uVar87 >> 3) & 1);
      auVar128._12_4_ = (uint)bVar8 * auVar126._12_4_ | (uint)!bVar8 * local_680._12_4_;
      bVar8 = (bool)((byte)(uVar87 >> 4) & 1);
      auVar128._16_4_ = (uint)bVar8 * auVar126._16_4_ | (uint)!bVar8 * local_680._16_4_;
      bVar8 = (bool)((byte)(uVar87 >> 5) & 1);
      auVar128._20_4_ = (uint)bVar8 * auVar126._20_4_ | (uint)!bVar8 * local_680._20_4_;
      bVar8 = (bool)((byte)(uVar87 >> 6) & 1);
      auVar128._24_4_ = (uint)bVar8 * auVar126._24_4_ | (uint)!bVar8 * local_680._24_4_;
      bVar8 = SUB81(uVar87 >> 7,0);
      auVar128._28_4_ = (uint)bVar8 * auVar126._28_4_ | (uint)!bVar8 * local_680._28_4_;
      auVar165._8_4_ = 0xff800000;
      auVar165._0_8_ = 0xff800000ff800000;
      auVar165._12_4_ = 0xff800000;
      auVar165._16_4_ = 0xff800000;
      auVar165._20_4_ = 0xff800000;
      auVar165._24_4_ = 0xff800000;
      auVar165._28_4_ = 0xff800000;
      auVar126 = vblendmps_avx512vl(auVar165,auVar125);
      auVar129._0_4_ =
           (uint)(bVar75 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar75 & 1) * auVar125._0_4_;
      bVar8 = (bool)((byte)(uVar87 >> 1) & 1);
      auVar129._4_4_ = (uint)bVar8 * auVar126._4_4_ | (uint)!bVar8 * auVar125._4_4_;
      bVar8 = (bool)((byte)(uVar87 >> 2) & 1);
      auVar129._8_4_ = (uint)bVar8 * auVar126._8_4_ | (uint)!bVar8 * auVar125._8_4_;
      bVar8 = (bool)((byte)(uVar87 >> 3) & 1);
      auVar129._12_4_ = (uint)bVar8 * auVar126._12_4_ | (uint)!bVar8 * auVar125._12_4_;
      bVar8 = (bool)((byte)(uVar87 >> 4) & 1);
      auVar129._16_4_ = (uint)bVar8 * auVar126._16_4_ | (uint)!bVar8 * auVar125._16_4_;
      bVar8 = (bool)((byte)(uVar87 >> 5) & 1);
      auVar129._20_4_ = (uint)bVar8 * auVar126._20_4_ | (uint)!bVar8 * auVar125._20_4_;
      bVar8 = (bool)((byte)(uVar87 >> 6) & 1);
      auVar129._24_4_ = (uint)bVar8 * auVar126._24_4_ | (uint)!bVar8 * auVar125._24_4_;
      bVar8 = SUB81(uVar87 >> 7,0);
      auVar129._28_4_ = (uint)bVar8 * auVar126._28_4_ | (uint)!bVar8 * auVar125._28_4_;
      auVar166._8_4_ = 0x7fffffff;
      auVar166._0_8_ = 0x7fffffff7fffffff;
      auVar166._12_4_ = 0x7fffffff;
      auVar166._16_4_ = 0x7fffffff;
      auVar166._20_4_ = 0x7fffffff;
      auVar166._24_4_ = 0x7fffffff;
      auVar166._28_4_ = 0x7fffffff;
      vandps_avx512vl(local_6e0,auVar166);
      auVar125 = vmaxps_avx512vl(local_5c0,local_6e0);
      auVar29._8_4_ = 0x36000000;
      auVar29._0_8_ = 0x3600000036000000;
      auVar29._12_4_ = 0x36000000;
      auVar29._16_4_ = 0x36000000;
      auVar29._20_4_ = 0x36000000;
      auVar29._24_4_ = 0x36000000;
      auVar29._28_4_ = 0x36000000;
      auVar126 = vmulps_avx512vl(auVar125,auVar29);
      auVar125 = vandps_avx(auVar101,auVar166);
      uVar83 = vcmpps_avx512vl(auVar125,auVar126,1);
      uVar87 = uVar87 & uVar83;
      bVar82 = (byte)uVar87;
      if (bVar82 != 0) {
        uVar83 = vcmpps_avx512vl(auVar122,ZEXT1632(auVar91),2);
        auVar197._8_4_ = 0xff800000;
        auVar197._0_8_ = 0xff800000ff800000;
        auVar197._12_4_ = 0xff800000;
        auVar197._16_4_ = 0xff800000;
        auVar197._20_4_ = 0xff800000;
        auVar197._24_4_ = 0xff800000;
        auVar197._28_4_ = 0xff800000;
        auVar122 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar126 = vblendmps_avx512vl(auVar122,auVar197);
        bVar78 = (byte)uVar83;
        uVar80 = (uint)(bVar78 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar78 & 1) * auVar125._0_4_;
        bVar8 = (bool)((byte)(uVar83 >> 1) & 1);
        uVar147 = (uint)bVar8 * auVar126._4_4_ | (uint)!bVar8 * auVar125._4_4_;
        bVar8 = (bool)((byte)(uVar83 >> 2) & 1);
        uVar148 = (uint)bVar8 * auVar126._8_4_ | (uint)!bVar8 * auVar125._8_4_;
        bVar8 = (bool)((byte)(uVar83 >> 3) & 1);
        uVar149 = (uint)bVar8 * auVar126._12_4_ | (uint)!bVar8 * auVar125._12_4_;
        bVar8 = (bool)((byte)(uVar83 >> 4) & 1);
        uVar150 = (uint)bVar8 * auVar126._16_4_ | (uint)!bVar8 * auVar125._16_4_;
        bVar8 = (bool)((byte)(uVar83 >> 5) & 1);
        uVar151 = (uint)bVar8 * auVar126._20_4_ | (uint)!bVar8 * auVar125._20_4_;
        bVar8 = (bool)((byte)(uVar83 >> 6) & 1);
        uVar152 = (uint)bVar8 * auVar126._24_4_ | (uint)!bVar8 * auVar125._24_4_;
        bVar8 = SUB81(uVar83 >> 7,0);
        uVar153 = (uint)bVar8 * auVar126._28_4_ | (uint)!bVar8 * auVar125._28_4_;
        auVar128._0_4_ = (bVar82 & 1) * uVar80 | !(bool)(bVar82 & 1) * auVar128._0_4_;
        bVar8 = (bool)((byte)(uVar87 >> 1) & 1);
        auVar128._4_4_ = bVar8 * uVar147 | !bVar8 * auVar128._4_4_;
        bVar8 = (bool)((byte)(uVar87 >> 2) & 1);
        auVar128._8_4_ = bVar8 * uVar148 | !bVar8 * auVar128._8_4_;
        bVar8 = (bool)((byte)(uVar87 >> 3) & 1);
        auVar128._12_4_ = bVar8 * uVar149 | !bVar8 * auVar128._12_4_;
        bVar8 = (bool)((byte)(uVar87 >> 4) & 1);
        auVar128._16_4_ = bVar8 * uVar150 | !bVar8 * auVar128._16_4_;
        bVar8 = (bool)((byte)(uVar87 >> 5) & 1);
        auVar128._20_4_ = bVar8 * uVar151 | !bVar8 * auVar128._20_4_;
        bVar8 = (bool)((byte)(uVar87 >> 6) & 1);
        auVar128._24_4_ = bVar8 * uVar152 | !bVar8 * auVar128._24_4_;
        bVar8 = SUB81(uVar87 >> 7,0);
        auVar128._28_4_ = bVar8 * uVar153 | !bVar8 * auVar128._28_4_;
        auVar122 = vblendmps_avx512vl(auVar197,auVar122);
        bVar8 = (bool)((byte)(uVar83 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar83 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar83 >> 3) & 1);
        bVar12 = (bool)((byte)(uVar83 >> 4) & 1);
        bVar11 = (bool)((byte)(uVar83 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
        bVar14 = SUB81(uVar83 >> 7,0);
        auVar129._0_4_ =
             (uint)(bVar82 & 1) *
             ((uint)(bVar78 & 1) * auVar122._0_4_ | !(bool)(bVar78 & 1) * uVar80) |
             !(bool)(bVar82 & 1) * auVar129._0_4_;
        bVar86 = (bool)((byte)(uVar87 >> 1) & 1);
        auVar129._4_4_ =
             (uint)bVar86 * ((uint)bVar8 * auVar122._4_4_ | !bVar8 * uVar147) |
             !bVar86 * auVar129._4_4_;
        bVar8 = (bool)((byte)(uVar87 >> 2) & 1);
        auVar129._8_4_ =
             (uint)bVar8 * ((uint)bVar9 * auVar122._8_4_ | !bVar9 * uVar148) |
             !bVar8 * auVar129._8_4_;
        bVar8 = (bool)((byte)(uVar87 >> 3) & 1);
        auVar129._12_4_ =
             (uint)bVar8 * ((uint)bVar10 * auVar122._12_4_ | !bVar10 * uVar149) |
             !bVar8 * auVar129._12_4_;
        bVar8 = (bool)((byte)(uVar87 >> 4) & 1);
        auVar129._16_4_ =
             (uint)bVar8 * ((uint)bVar12 * auVar122._16_4_ | !bVar12 * uVar150) |
             !bVar8 * auVar129._16_4_;
        bVar8 = (bool)((byte)(uVar87 >> 5) & 1);
        auVar129._20_4_ =
             (uint)bVar8 * ((uint)bVar11 * auVar122._20_4_ | !bVar11 * uVar151) |
             !bVar8 * auVar129._20_4_;
        bVar8 = (bool)((byte)(uVar87 >> 6) & 1);
        auVar129._24_4_ =
             (uint)bVar8 * ((uint)bVar13 * auVar122._24_4_ | !bVar13 * uVar152) |
             !bVar8 * auVar129._24_4_;
        bVar8 = SUB81(uVar87 >> 7,0);
        auVar129._28_4_ =
             (uint)bVar8 * ((uint)bVar14 * auVar122._28_4_ | !bVar14 * uVar153) |
             !bVar8 * auVar129._28_4_;
        bVar75 = (~bVar82 | bVar78) & bVar75;
      }
      auVar163._8_4_ = 0x3f800000;
      auVar163._0_8_ = &DAT_3f8000003f800000;
      auVar163._12_4_ = 0x3f800000;
      auVar163._16_4_ = 0x3f800000;
      auVar163._20_4_ = 0x3f800000;
      auVar163._24_4_ = 0x3f800000;
      auVar163._28_4_ = 0x3f800000;
    }
    in_ZMM31 = ZEXT3264(auVar129);
    if ((bVar75 & 0x7f) == 0) {
      auVar226 = ZEXT3264(_DAT_02020f20);
      auVar258 = ZEXT3264(local_8c0);
    }
    else {
      fVar154 = *(float *)(ray + k * 4 + 0x100) - (float)local_800._0_4_;
      auVar167._4_4_ = fVar154;
      auVar167._0_4_ = fVar154;
      auVar167._8_4_ = fVar154;
      auVar167._12_4_ = fVar154;
      auVar167._16_4_ = fVar154;
      auVar167._20_4_ = fVar154;
      auVar167._24_4_ = fVar154;
      auVar167._28_4_ = fVar154;
      auVar122 = vminps_avx512vl(auVar167,auVar129);
      auVar71._4_4_ = fStack_3fc;
      auVar71._0_4_ = local_400;
      auVar71._8_4_ = fStack_3f8;
      auVar71._12_4_ = fStack_3f4;
      auVar71._16_4_ = fStack_3f0;
      auVar71._20_4_ = fStack_3ec;
      auVar71._24_4_ = fStack_3e8;
      auVar71._28_4_ = fStack_3e4;
      auVar125 = vmaxps_avx512vl(auVar71,auVar128);
      auVar118 = vmulps_avx512vl(auVar118,auVar256);
      auVar117 = vfmadd213ps_avx512vl(auVar117,auVar255,auVar118);
      auVar115 = vfmadd213ps_avx512vl(auVar115,auVar253,auVar117);
      auVar258 = ZEXT3264(local_8c0);
      auVar117 = vmulps_avx512vl(local_8c0,auVar256);
      auVar117 = vfmadd231ps_avx512vl(auVar117,auVar102,auVar255);
      in_ZMM31 = ZEXT3264(auVar104);
      auVar117 = vfmadd231ps_avx512vl(auVar117,auVar104,auVar253);
      auVar118 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar117,auVar118);
      auVar126 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar17 = vcmpps_avx512vl(auVar118,auVar126,1);
      auVar127 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar115 = vxorps_avx512vl(auVar115,auVar127);
      auVar130 = vrcp14ps_avx512vl(auVar117);
      auVar131 = vxorps_avx512vl(auVar117,auVar127);
      auVar132 = vfnmadd213ps_avx512vl(auVar130,auVar117,auVar163);
      auVar132 = vfmadd132ps_avx512vl(auVar132,auVar130,auVar130);
      auVar132 = vmulps_avx512vl(auVar132,auVar115);
      uVar19 = vcmpps_avx512vl(auVar117,auVar131,1);
      bVar82 = (byte)uVar17 | (byte)uVar19;
      auVar133 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar115 = vblendmps_avx512vl(auVar132,auVar133);
      auVar134._0_4_ =
           (uint)(bVar82 & 1) * auVar115._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar130._0_4_;
      bVar8 = (bool)(bVar82 >> 1 & 1);
      auVar134._4_4_ = (uint)bVar8 * auVar115._4_4_ | (uint)!bVar8 * auVar130._4_4_;
      bVar8 = (bool)(bVar82 >> 2 & 1);
      auVar134._8_4_ = (uint)bVar8 * auVar115._8_4_ | (uint)!bVar8 * auVar130._8_4_;
      bVar8 = (bool)(bVar82 >> 3 & 1);
      auVar134._12_4_ = (uint)bVar8 * auVar115._12_4_ | (uint)!bVar8 * auVar130._12_4_;
      bVar8 = (bool)(bVar82 >> 4 & 1);
      auVar134._16_4_ = (uint)bVar8 * auVar115._16_4_ | (uint)!bVar8 * auVar130._16_4_;
      bVar8 = (bool)(bVar82 >> 5 & 1);
      auVar134._20_4_ = (uint)bVar8 * auVar115._20_4_ | (uint)!bVar8 * auVar130._20_4_;
      bVar8 = (bool)(bVar82 >> 6 & 1);
      auVar134._24_4_ = (uint)bVar8 * auVar115._24_4_ | (uint)!bVar8 * auVar130._24_4_;
      auVar134._28_4_ =
           (uint)(bVar82 >> 7) * auVar115._28_4_ | (uint)!(bool)(bVar82 >> 7) * auVar130._28_4_;
      auVar115 = vmaxps_avx(auVar125,auVar134);
      uVar19 = vcmpps_avx512vl(auVar117,auVar131,6);
      bVar82 = (byte)uVar17 | (byte)uVar19;
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar135._0_4_ =
           (uint)(bVar82 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar132._0_4_;
      bVar8 = (bool)(bVar82 >> 1 & 1);
      auVar135._4_4_ = (uint)bVar8 * auVar125._4_4_ | (uint)!bVar8 * auVar132._4_4_;
      bVar8 = (bool)(bVar82 >> 2 & 1);
      auVar135._8_4_ = (uint)bVar8 * auVar125._8_4_ | (uint)!bVar8 * auVar132._8_4_;
      bVar8 = (bool)(bVar82 >> 3 & 1);
      auVar135._12_4_ = (uint)bVar8 * auVar125._12_4_ | (uint)!bVar8 * auVar132._12_4_;
      bVar8 = (bool)(bVar82 >> 4 & 1);
      auVar135._16_4_ = (uint)bVar8 * auVar125._16_4_ | (uint)!bVar8 * auVar132._16_4_;
      bVar8 = (bool)(bVar82 >> 5 & 1);
      auVar135._20_4_ = (uint)bVar8 * auVar125._20_4_ | (uint)!bVar8 * auVar132._20_4_;
      bVar8 = (bool)(bVar82 >> 6 & 1);
      auVar135._24_4_ = (uint)bVar8 * auVar125._24_4_ | (uint)!bVar8 * auVar132._24_4_;
      auVar135._28_4_ =
           (uint)(bVar82 >> 7) * auVar125._28_4_ | (uint)!(bool)(bVar82 >> 7) * auVar132._28_4_;
      auVar117 = vminps_avx(auVar122,auVar135);
      auVar109 = vsubps_avx(ZEXT832(0) << 0x20,auVar109);
      auVar110 = vsubps_avx(ZEXT832(0) << 0x20,auVar110);
      auVar122 = ZEXT832(0) << 0x20;
      auVar111 = vsubps_avx(auVar122,auVar111);
      auVar50._4_4_ = auVar111._4_4_ * auVar114._4_4_;
      auVar50._0_4_ = auVar111._0_4_ * auVar114._0_4_;
      auVar50._8_4_ = auVar111._8_4_ * auVar114._8_4_;
      auVar50._12_4_ = auVar111._12_4_ * auVar114._12_4_;
      auVar50._16_4_ = auVar111._16_4_ * auVar114._16_4_;
      auVar50._20_4_ = auVar111._20_4_ * auVar114._20_4_;
      auVar50._24_4_ = auVar111._24_4_ * auVar114._24_4_;
      auVar50._28_4_ = auVar111._28_4_;
      auVar110 = vfnmsub231ps_avx512vl(auVar50,auVar100,auVar110);
      auVar109 = vfnmadd231ps_avx512vl(auVar110,auVar99,auVar109);
      auVar110 = vmulps_avx512vl(local_8c0,auVar114);
      auVar110 = vfnmsub231ps_avx512vl(auVar110,auVar102,auVar100);
      auVar110 = vfnmadd231ps_avx512vl(auVar110,auVar104,auVar99);
      vandps_avx512vl(auVar110,auVar118);
      uVar17 = vcmpps_avx512vl(auVar110,auVar126,1);
      auVar109 = vxorps_avx512vl(auVar109,auVar127);
      auVar111 = vrcp14ps_avx512vl(auVar110);
      auVar99 = vxorps_avx512vl(auVar110,auVar127);
      auVar114 = vfnmadd213ps_avx512vl(auVar111,auVar110,auVar163);
      auVar91 = vfmadd132ps_fma(auVar114,auVar111,auVar111);
      fVar154 = auVar91._0_4_ * auVar109._0_4_;
      fVar240 = auVar91._4_4_ * auVar109._4_4_;
      auVar51._4_4_ = fVar240;
      auVar51._0_4_ = fVar154;
      fVar241 = auVar91._8_4_ * auVar109._8_4_;
      auVar51._8_4_ = fVar241;
      fVar243 = auVar91._12_4_ * auVar109._12_4_;
      auVar51._12_4_ = fVar243;
      fVar251 = auVar109._16_4_ * 0.0;
      auVar51._16_4_ = fVar251;
      fVar245 = auVar109._20_4_ * 0.0;
      auVar51._20_4_ = fVar245;
      fVar246 = auVar109._24_4_ * 0.0;
      auVar51._24_4_ = fVar246;
      auVar51._28_4_ = auVar109._28_4_;
      uVar19 = vcmpps_avx512vl(auVar110,auVar99,1);
      bVar82 = (byte)uVar17 | (byte)uVar19;
      auVar114 = vblendmps_avx512vl(auVar51,auVar133);
      auVar136._0_4_ =
           (uint)(bVar82 & 1) * auVar114._0_4_ | (uint)!(bool)(bVar82 & 1) * auVar111._0_4_;
      bVar8 = (bool)(bVar82 >> 1 & 1);
      auVar136._4_4_ = (uint)bVar8 * auVar114._4_4_ | (uint)!bVar8 * auVar111._4_4_;
      bVar8 = (bool)(bVar82 >> 2 & 1);
      auVar136._8_4_ = (uint)bVar8 * auVar114._8_4_ | (uint)!bVar8 * auVar111._8_4_;
      bVar8 = (bool)(bVar82 >> 3 & 1);
      auVar136._12_4_ = (uint)bVar8 * auVar114._12_4_ | (uint)!bVar8 * auVar111._12_4_;
      bVar8 = (bool)(bVar82 >> 4 & 1);
      auVar136._16_4_ = (uint)bVar8 * auVar114._16_4_ | (uint)!bVar8 * auVar111._16_4_;
      bVar8 = (bool)(bVar82 >> 5 & 1);
      auVar136._20_4_ = (uint)bVar8 * auVar114._20_4_ | (uint)!bVar8 * auVar111._20_4_;
      bVar8 = (bool)(bVar82 >> 6 & 1);
      auVar136._24_4_ = (uint)bVar8 * auVar114._24_4_ | (uint)!bVar8 * auVar111._24_4_;
      auVar136._28_4_ =
           (uint)(bVar82 >> 7) * auVar114._28_4_ | (uint)!(bool)(bVar82 >> 7) * auVar111._28_4_;
      _local_720 = vmaxps_avx(auVar115,auVar136);
      uVar19 = vcmpps_avx512vl(auVar110,auVar99,6);
      bVar82 = (byte)uVar17 | (byte)uVar19;
      auVar137._0_4_ =
           (uint)(bVar82 & 1) * auVar125._0_4_ | (uint)!(bool)(bVar82 & 1) * (int)fVar154;
      bVar8 = (bool)(bVar82 >> 1 & 1);
      auVar137._4_4_ = (uint)bVar8 * auVar125._4_4_ | (uint)!bVar8 * (int)fVar240;
      bVar8 = (bool)(bVar82 >> 2 & 1);
      auVar137._8_4_ = (uint)bVar8 * auVar125._8_4_ | (uint)!bVar8 * (int)fVar241;
      bVar8 = (bool)(bVar82 >> 3 & 1);
      auVar137._12_4_ = (uint)bVar8 * auVar125._12_4_ | (uint)!bVar8 * (int)fVar243;
      bVar8 = (bool)(bVar82 >> 4 & 1);
      auVar137._16_4_ = (uint)bVar8 * auVar125._16_4_ | (uint)!bVar8 * (int)fVar251;
      bVar8 = (bool)(bVar82 >> 5 & 1);
      auVar137._20_4_ = (uint)bVar8 * auVar125._20_4_ | (uint)!bVar8 * (int)fVar245;
      bVar8 = (bool)(bVar82 >> 6 & 1);
      auVar137._24_4_ = (uint)bVar8 * auVar125._24_4_ | (uint)!bVar8 * (int)fVar246;
      auVar137._28_4_ =
           (uint)(bVar82 >> 7) * auVar125._28_4_ | (uint)!(bool)(bVar82 >> 7) * auVar109._28_4_;
      local_460 = vminps_avx(auVar117,auVar137);
      uVar17 = vcmpps_avx512vl(_local_720,local_460,2);
      bVar75 = bVar75 & 0x7f & (byte)uVar17;
      if (bVar75 == 0) {
        auVar226 = ZEXT3264(_DAT_02020f20);
      }
      else {
        auVar109 = vmaxps_avx(auVar122,local_8a0);
        auVar110 = vminps_avx512vl(local_660,auVar163);
        auVar57 = ZEXT412(0);
        auVar111 = ZEXT1232(auVar57) << 0x20;
        auVar110 = vmaxps_avx(auVar110,ZEXT1232(auVar57) << 0x20);
        auVar99 = vminps_avx512vl(local_680,auVar163);
        auVar52._4_4_ = (auVar110._4_4_ + 1.0) * 0.125;
        auVar52._0_4_ = (auVar110._0_4_ + 0.0) * 0.125;
        auVar52._8_4_ = (auVar110._8_4_ + 2.0) * 0.125;
        auVar52._12_4_ = (auVar110._12_4_ + 3.0) * 0.125;
        auVar52._16_4_ = (auVar110._16_4_ + 4.0) * 0.125;
        auVar52._20_4_ = (auVar110._20_4_ + 5.0) * 0.125;
        auVar52._24_4_ = (auVar110._24_4_ + 6.0) * 0.125;
        auVar52._28_4_ = auVar110._28_4_ + 7.0;
        local_660 = vfmadd213ps_avx512vl(auVar52,local_880,auVar236);
        auVar110 = vmaxps_avx(auVar99,ZEXT1232(auVar57) << 0x20);
        auVar53._4_4_ = (auVar110._4_4_ + 1.0) * 0.125;
        auVar53._0_4_ = (auVar110._0_4_ + 0.0) * 0.125;
        auVar53._8_4_ = (auVar110._8_4_ + 2.0) * 0.125;
        auVar53._12_4_ = (auVar110._12_4_ + 3.0) * 0.125;
        auVar53._16_4_ = (auVar110._16_4_ + 4.0) * 0.125;
        auVar53._20_4_ = (auVar110._20_4_ + 5.0) * 0.125;
        auVar53._24_4_ = (auVar110._24_4_ + 6.0) * 0.125;
        auVar53._28_4_ = auVar110._28_4_ + 7.0;
        local_680 = vfmadd213ps_avx512vl(auVar53,local_880,auVar236);
        auVar54._4_4_ = auVar109._4_4_ * auVar109._4_4_;
        auVar54._0_4_ = auVar109._0_4_ * auVar109._0_4_;
        auVar54._8_4_ = auVar109._8_4_ * auVar109._8_4_;
        auVar54._12_4_ = auVar109._12_4_ * auVar109._12_4_;
        auVar54._16_4_ = auVar109._16_4_ * auVar109._16_4_;
        auVar54._20_4_ = auVar109._20_4_ * auVar109._20_4_;
        auVar54._24_4_ = auVar109._24_4_ * auVar109._24_4_;
        auVar54._28_4_ = local_680._28_4_;
        auVar109 = vsubps_avx(auVar120,auVar54);
        auVar110 = vmulps_avx512vl(auVar124,auVar109);
        auVar110 = vsubps_avx512vl(auVar123,auVar110);
        uVar17 = vcmpps_avx512vl(auVar110,ZEXT1232(auVar57) << 0x20,5);
        bVar82 = (byte)uVar17;
        if (bVar82 == 0) {
          auVar105 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar106 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar99 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar100 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar110 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar138._8_4_ = 0x7f800000;
          auVar138._0_8_ = 0x7f8000007f800000;
          auVar138._12_4_ = 0x7f800000;
          auVar138._16_4_ = 0x7f800000;
          auVar138._20_4_ = 0x7f800000;
          auVar138._24_4_ = 0x7f800000;
          auVar138._28_4_ = 0x7f800000;
          auVar139._8_4_ = 0xff800000;
          auVar139._0_8_ = 0xff800000ff800000;
          auVar139._12_4_ = 0xff800000;
          auVar139._16_4_ = 0xff800000;
          auVar139._20_4_ = 0xff800000;
          auVar139._24_4_ = 0xff800000;
          auVar139._28_4_ = 0xff800000;
        }
        else {
          auVar92 = vxorps_avx512vl(auVar100._0_16_,auVar100._0_16_);
          uVar87 = vcmpps_avx512vl(auVar110,auVar122,5);
          auVar110 = vsqrtps_avx(auVar110);
          auVar192._0_4_ = auVar101._0_4_ + auVar101._0_4_;
          auVar192._4_4_ = auVar101._4_4_ + auVar101._4_4_;
          auVar192._8_4_ = auVar101._8_4_ + auVar101._8_4_;
          auVar192._12_4_ = auVar101._12_4_ + auVar101._12_4_;
          auVar192._16_4_ = auVar101._16_4_ + auVar101._16_4_;
          auVar192._20_4_ = auVar101._20_4_ + auVar101._20_4_;
          auVar192._24_4_ = auVar101._24_4_ + auVar101._24_4_;
          auVar192._28_4_ = auVar101._28_4_ + auVar101._28_4_;
          auVar111 = vrcp14ps_avx512vl(auVar192);
          auVar99 = vfnmadd213ps_avx512vl(auVar192,auVar111,auVar163);
          auVar91 = vfmadd132ps_fma(auVar99,auVar111,auVar111);
          auVar30._8_4_ = 0x80000000;
          auVar30._0_8_ = 0x8000000080000000;
          auVar30._12_4_ = 0x80000000;
          auVar30._16_4_ = 0x80000000;
          auVar30._20_4_ = 0x80000000;
          auVar30._24_4_ = 0x80000000;
          auVar30._28_4_ = 0x80000000;
          auVar111 = vxorps_avx512vl(auVar119,auVar30);
          auVar111 = vsubps_avx(auVar111,auVar110);
          auVar55._4_4_ = auVar111._4_4_ * auVar91._4_4_;
          auVar55._0_4_ = auVar111._0_4_ * auVar91._0_4_;
          auVar55._8_4_ = auVar111._8_4_ * auVar91._8_4_;
          auVar55._12_4_ = auVar111._12_4_ * auVar91._12_4_;
          auVar55._16_4_ = auVar111._16_4_ * 0.0;
          auVar55._20_4_ = auVar111._20_4_ * 0.0;
          auVar55._24_4_ = auVar111._24_4_ * 0.0;
          auVar55._28_4_ = 0x3e000000;
          auVar110 = vsubps_avx512vl(auVar110,auVar119);
          auVar257._0_4_ = auVar110._0_4_ * auVar91._0_4_;
          auVar257._4_4_ = auVar110._4_4_ * auVar91._4_4_;
          auVar257._8_4_ = auVar110._8_4_ * auVar91._8_4_;
          auVar257._12_4_ = auVar110._12_4_ * auVar91._12_4_;
          auVar257._16_4_ = auVar110._16_4_ * 0.0;
          auVar257._20_4_ = auVar110._20_4_ * 0.0;
          auVar257._24_4_ = auVar110._24_4_ * 0.0;
          auVar257._28_4_ = 0;
          auVar110 = vfmadd213ps_avx512vl(auVar121,auVar55,auVar105);
          auVar56._4_4_ = auVar106._4_4_ * auVar110._4_4_;
          auVar56._0_4_ = auVar106._0_4_ * auVar110._0_4_;
          auVar56._8_4_ = auVar106._8_4_ * auVar110._8_4_;
          auVar56._12_4_ = auVar106._12_4_ * auVar110._12_4_;
          auVar56._16_4_ = auVar106._16_4_ * auVar110._16_4_;
          auVar56._20_4_ = auVar106._20_4_ * auVar110._20_4_;
          auVar56._24_4_ = auVar106._24_4_ * auVar110._24_4_;
          auVar56._28_4_ = auVar111._28_4_;
          auVar110 = vmulps_avx512vl(auVar104,auVar55);
          auVar111 = vmulps_avx512vl(auVar102,auVar55);
          auVar114 = vmulps_avx512vl(local_8c0,auVar55);
          auVar99 = vfmadd213ps_avx512vl(auVar107,auVar56,auVar108);
          auVar99 = vsubps_avx512vl(auVar110,auVar99);
          auVar110 = vfmadd213ps_avx512vl(auVar103,auVar56,auVar112);
          auVar100 = vsubps_avx512vl(auVar111,auVar110);
          auVar91 = vfmadd213ps_fma(auVar56,auVar116,auVar113);
          auVar110 = vsubps_avx(auVar114,ZEXT1632(auVar91));
          auVar105 = vfmadd213ps_avx512vl(auVar121,auVar257,auVar105);
          auVar106 = vmulps_avx512vl(auVar106,auVar105);
          auVar105 = vmulps_avx512vl(auVar104,auVar257);
          auVar114 = vmulps_avx512vl(auVar102,auVar257);
          auVar115 = vmulps_avx512vl(local_8c0,auVar257);
          auVar91 = vfmadd213ps_fma(auVar107,auVar106,auVar108);
          auVar111 = vsubps_avx(auVar105,ZEXT1632(auVar91));
          auVar91 = vfmadd213ps_fma(auVar103,auVar106,auVar112);
          auVar105 = vsubps_avx512vl(auVar114,ZEXT1632(auVar91));
          auVar91 = vfmadd213ps_fma(auVar116,auVar106,auVar113);
          auVar106 = vsubps_avx512vl(auVar115,ZEXT1632(auVar91));
          auVar210._8_4_ = 0x7f800000;
          auVar210._0_8_ = 0x7f8000007f800000;
          auVar210._12_4_ = 0x7f800000;
          auVar210._16_4_ = 0x7f800000;
          auVar210._20_4_ = 0x7f800000;
          auVar210._24_4_ = 0x7f800000;
          auVar210._28_4_ = 0x7f800000;
          auVar107 = vblendmps_avx512vl(auVar210,auVar55);
          bVar8 = (bool)((byte)uVar87 & 1);
          auVar138._0_4_ = (uint)bVar8 * auVar107._0_4_ | (uint)!bVar8 * auVar108._0_4_;
          bVar8 = (bool)((byte)(uVar87 >> 1) & 1);
          auVar138._4_4_ = (uint)bVar8 * auVar107._4_4_ | (uint)!bVar8 * auVar108._4_4_;
          bVar8 = (bool)((byte)(uVar87 >> 2) & 1);
          auVar138._8_4_ = (uint)bVar8 * auVar107._8_4_ | (uint)!bVar8 * auVar108._8_4_;
          bVar8 = (bool)((byte)(uVar87 >> 3) & 1);
          auVar138._12_4_ = (uint)bVar8 * auVar107._12_4_ | (uint)!bVar8 * auVar108._12_4_;
          bVar8 = (bool)((byte)(uVar87 >> 4) & 1);
          auVar138._16_4_ = (uint)bVar8 * auVar107._16_4_ | (uint)!bVar8 * auVar108._16_4_;
          bVar8 = (bool)((byte)(uVar87 >> 5) & 1);
          auVar138._20_4_ = (uint)bVar8 * auVar107._20_4_ | (uint)!bVar8 * auVar108._20_4_;
          bVar8 = (bool)((byte)(uVar87 >> 6) & 1);
          auVar138._24_4_ = (uint)bVar8 * auVar107._24_4_ | (uint)!bVar8 * auVar108._24_4_;
          bVar8 = SUB81(uVar87 >> 7,0);
          auVar138._28_4_ = (uint)bVar8 * auVar107._28_4_ | (uint)!bVar8 * auVar108._28_4_;
          auVar211._8_4_ = 0xff800000;
          auVar211._0_8_ = 0xff800000ff800000;
          auVar211._12_4_ = 0xff800000;
          auVar211._16_4_ = 0xff800000;
          auVar211._20_4_ = 0xff800000;
          auVar211._24_4_ = 0xff800000;
          auVar211._28_4_ = 0xff800000;
          auVar107 = vblendmps_avx512vl(auVar211,auVar257);
          bVar8 = (bool)((byte)uVar87 & 1);
          auVar139._0_4_ = (uint)bVar8 * auVar107._0_4_ | (uint)!bVar8 * -0x800000;
          bVar8 = (bool)((byte)(uVar87 >> 1) & 1);
          auVar139._4_4_ = (uint)bVar8 * auVar107._4_4_ | (uint)!bVar8 * -0x800000;
          bVar8 = (bool)((byte)(uVar87 >> 2) & 1);
          auVar139._8_4_ = (uint)bVar8 * auVar107._8_4_ | (uint)!bVar8 * -0x800000;
          bVar8 = (bool)((byte)(uVar87 >> 3) & 1);
          auVar139._12_4_ = (uint)bVar8 * auVar107._12_4_ | (uint)!bVar8 * -0x800000;
          bVar8 = (bool)((byte)(uVar87 >> 4) & 1);
          auVar139._16_4_ = (uint)bVar8 * auVar107._16_4_ | (uint)!bVar8 * -0x800000;
          bVar8 = (bool)((byte)(uVar87 >> 5) & 1);
          auVar139._20_4_ = (uint)bVar8 * auVar107._20_4_ | (uint)!bVar8 * -0x800000;
          bVar8 = (bool)((byte)(uVar87 >> 6) & 1);
          auVar139._24_4_ = (uint)bVar8 * auVar107._24_4_ | (uint)!bVar8 * -0x800000;
          bVar8 = SUB81(uVar87 >> 7,0);
          auVar139._28_4_ = (uint)bVar8 * auVar107._28_4_ | (uint)!bVar8 * -0x800000;
          auVar248._8_4_ = 0x7fffffff;
          auVar248._0_8_ = 0x7fffffff7fffffff;
          auVar248._12_4_ = 0x7fffffff;
          auVar248._16_4_ = 0x7fffffff;
          auVar248._20_4_ = 0x7fffffff;
          auVar248._24_4_ = 0x7fffffff;
          auVar248._28_4_ = 0x7fffffff;
          auVar107 = vandps_avx(auVar248,local_6e0);
          auVar107 = vmaxps_avx(local_5c0,auVar107);
          auVar31._8_4_ = 0x36000000;
          auVar31._0_8_ = 0x3600000036000000;
          auVar31._12_4_ = 0x36000000;
          auVar31._16_4_ = 0x36000000;
          auVar31._20_4_ = 0x36000000;
          auVar31._24_4_ = 0x36000000;
          auVar31._28_4_ = 0x36000000;
          auVar103 = vmulps_avx512vl(auVar107,auVar31);
          auVar107 = vandps_avx(auVar101,auVar248);
          uVar83 = vcmpps_avx512vl(auVar107,auVar103,1);
          uVar87 = uVar87 & uVar83;
          bVar78 = (byte)uVar87;
          if (bVar78 != 0) {
            uVar83 = vcmpps_avx512vl(auVar109,ZEXT1632(auVar92),2);
            auVar249._8_4_ = 0xff800000;
            auVar249._0_8_ = 0xff800000ff800000;
            auVar249._12_4_ = 0xff800000;
            auVar249._16_4_ = 0xff800000;
            auVar249._20_4_ = 0xff800000;
            auVar249._24_4_ = 0xff800000;
            auVar249._28_4_ = 0xff800000;
            auVar254._8_4_ = 0x7f800000;
            auVar254._0_8_ = 0x7f8000007f800000;
            auVar254._12_4_ = 0x7f800000;
            auVar254._16_4_ = 0x7f800000;
            auVar254._20_4_ = 0x7f800000;
            auVar254._24_4_ = 0x7f800000;
            auVar254._28_4_ = 0x7f800000;
            auVar107 = vblendmps_avx512vl(auVar254,auVar249);
            bVar81 = (byte)uVar83;
            uVar80 = (uint)(bVar81 & 1) * auVar107._0_4_ |
                     (uint)!(bool)(bVar81 & 1) * auVar103._0_4_;
            bVar8 = (bool)((byte)(uVar83 >> 1) & 1);
            uVar147 = (uint)bVar8 * auVar107._4_4_ | (uint)!bVar8 * auVar103._4_4_;
            bVar8 = (bool)((byte)(uVar83 >> 2) & 1);
            uVar148 = (uint)bVar8 * auVar107._8_4_ | (uint)!bVar8 * auVar103._8_4_;
            bVar8 = (bool)((byte)(uVar83 >> 3) & 1);
            uVar149 = (uint)bVar8 * auVar107._12_4_ | (uint)!bVar8 * auVar103._12_4_;
            bVar8 = (bool)((byte)(uVar83 >> 4) & 1);
            uVar150 = (uint)bVar8 * auVar107._16_4_ | (uint)!bVar8 * auVar103._16_4_;
            bVar8 = (bool)((byte)(uVar83 >> 5) & 1);
            uVar151 = (uint)bVar8 * auVar107._20_4_ | (uint)!bVar8 * auVar103._20_4_;
            bVar8 = (bool)((byte)(uVar83 >> 6) & 1);
            uVar152 = (uint)bVar8 * auVar107._24_4_ | (uint)!bVar8 * auVar103._24_4_;
            bVar8 = SUB81(uVar83 >> 7,0);
            uVar153 = (uint)bVar8 * auVar107._28_4_ | (uint)!bVar8 * auVar103._28_4_;
            auVar138._0_4_ = (bVar78 & 1) * uVar80 | !(bool)(bVar78 & 1) * auVar138._0_4_;
            bVar8 = (bool)((byte)(uVar87 >> 1) & 1);
            auVar138._4_4_ = bVar8 * uVar147 | !bVar8 * auVar138._4_4_;
            bVar8 = (bool)((byte)(uVar87 >> 2) & 1);
            auVar138._8_4_ = bVar8 * uVar148 | !bVar8 * auVar138._8_4_;
            bVar8 = (bool)((byte)(uVar87 >> 3) & 1);
            auVar138._12_4_ = bVar8 * uVar149 | !bVar8 * auVar138._12_4_;
            bVar8 = (bool)((byte)(uVar87 >> 4) & 1);
            auVar138._16_4_ = bVar8 * uVar150 | !bVar8 * auVar138._16_4_;
            bVar8 = (bool)((byte)(uVar87 >> 5) & 1);
            auVar138._20_4_ = bVar8 * uVar151 | !bVar8 * auVar138._20_4_;
            bVar8 = (bool)((byte)(uVar87 >> 6) & 1);
            auVar138._24_4_ = bVar8 * uVar152 | !bVar8 * auVar138._24_4_;
            bVar8 = SUB81(uVar87 >> 7,0);
            auVar138._28_4_ = bVar8 * uVar153 | !bVar8 * auVar138._28_4_;
            auVar107 = vblendmps_avx512vl(auVar249,auVar254);
            bVar8 = (bool)((byte)(uVar83 >> 1) & 1);
            bVar9 = (bool)((byte)(uVar83 >> 2) & 1);
            bVar10 = (bool)((byte)(uVar83 >> 3) & 1);
            bVar12 = (bool)((byte)(uVar83 >> 4) & 1);
            bVar11 = (bool)((byte)(uVar83 >> 5) & 1);
            bVar13 = (bool)((byte)(uVar83 >> 6) & 1);
            bVar14 = SUB81(uVar83 >> 7,0);
            auVar139._0_4_ =
                 (uint)(bVar78 & 1) *
                 ((uint)(bVar81 & 1) * auVar107._0_4_ | !(bool)(bVar81 & 1) * uVar80) |
                 !(bool)(bVar78 & 1) * auVar139._0_4_;
            bVar86 = (bool)((byte)(uVar87 >> 1) & 1);
            auVar139._4_4_ =
                 (uint)bVar86 * ((uint)bVar8 * auVar107._4_4_ | !bVar8 * uVar147) |
                 !bVar86 * auVar139._4_4_;
            bVar8 = (bool)((byte)(uVar87 >> 2) & 1);
            auVar139._8_4_ =
                 (uint)bVar8 * ((uint)bVar9 * auVar107._8_4_ | !bVar9 * uVar148) |
                 !bVar8 * auVar139._8_4_;
            bVar8 = (bool)((byte)(uVar87 >> 3) & 1);
            auVar139._12_4_ =
                 (uint)bVar8 * ((uint)bVar10 * auVar107._12_4_ | !bVar10 * uVar149) |
                 !bVar8 * auVar139._12_4_;
            bVar8 = (bool)((byte)(uVar87 >> 4) & 1);
            auVar139._16_4_ =
                 (uint)bVar8 * ((uint)bVar12 * auVar107._16_4_ | !bVar12 * uVar150) |
                 !bVar8 * auVar139._16_4_;
            bVar8 = (bool)((byte)(uVar87 >> 5) & 1);
            auVar139._20_4_ =
                 (uint)bVar8 * ((uint)bVar11 * auVar107._20_4_ | !bVar11 * uVar151) |
                 !bVar8 * auVar139._20_4_;
            bVar8 = (bool)((byte)(uVar87 >> 6) & 1);
            auVar139._24_4_ =
                 (uint)bVar8 * ((uint)bVar13 * auVar107._24_4_ | !bVar13 * uVar152) |
                 !bVar8 * auVar139._24_4_;
            bVar8 = SUB81(uVar87 >> 7,0);
            auVar139._28_4_ =
                 (uint)bVar8 * ((uint)bVar14 * auVar107._28_4_ | !bVar14 * uVar153) |
                 !bVar8 * auVar139._28_4_;
            bVar82 = (~bVar78 | bVar81) & bVar82;
          }
        }
        auVar252._8_4_ = 0x7fffffff;
        auVar252._0_8_ = 0x7fffffff7fffffff;
        auVar252._12_4_ = 0x7fffffff;
        auVar106 = vmulps_avx512vl(local_8c0,auVar106);
        auVar105 = vfmadd231ps_avx512vl(auVar106,auVar102,auVar105);
        auVar105 = vfmadd231ps_avx512vl(auVar105,auVar104,auVar111);
        _local_1c0 = _local_720;
        local_1a0 = vminps_avx(local_460,auVar138);
        auVar239._8_4_ = 0x7fffffff;
        auVar239._0_8_ = 0x7fffffff7fffffff;
        auVar239._12_4_ = 0x7fffffff;
        auVar239._16_4_ = 0x7fffffff;
        auVar239._20_4_ = 0x7fffffff;
        auVar239._24_4_ = 0x7fffffff;
        auVar239._28_4_ = 0x7fffffff;
        auVar105 = vandps_avx(auVar105,auVar239);
        auVar233 = ZEXT3264(auVar105);
        _local_6c0 = vmaxps_avx(_local_720,auVar139);
        _local_480 = _local_6c0;
        auVar212._8_4_ = 0x3e99999a;
        auVar212._0_8_ = 0x3e99999a3e99999a;
        auVar212._12_4_ = 0x3e99999a;
        auVar212._16_4_ = 0x3e99999a;
        auVar212._20_4_ = 0x3e99999a;
        auVar212._24_4_ = 0x3e99999a;
        auVar212._28_4_ = 0x3e99999a;
        uVar17 = vcmpps_avx512vl(auVar105,auVar212,1);
        uVar19 = vcmpps_avx512vl(_local_720,local_1a0,2);
        bVar78 = (byte)uVar19 & bVar75;
        uVar18 = vcmpps_avx512vl(_local_6c0,local_460,2);
        if ((bVar75 & ((byte)uVar18 | (byte)uVar19)) == 0) {
          auVar226 = ZEXT3264(_DAT_02020f20);
        }
        else {
          auVar105 = vmulps_avx512vl(local_8c0,auVar110);
          auVar105 = vfmadd213ps_avx512vl(auVar100,auVar102,auVar105);
          auVar105 = vfmadd213ps_avx512vl(auVar99,auVar104,auVar105);
          auVar105 = vandps_avx(auVar105,auVar239);
          uVar19 = vcmpps_avx512vl(auVar105,auVar212,1);
          bVar81 = (byte)uVar19 | ~bVar82;
          auVar168._8_4_ = 2;
          auVar168._0_8_ = 0x200000002;
          auVar168._12_4_ = 2;
          auVar168._16_4_ = 2;
          auVar168._20_4_ = 2;
          auVar168._24_4_ = 2;
          auVar168._28_4_ = 2;
          auVar32._8_4_ = 3;
          auVar32._0_8_ = 0x300000003;
          auVar32._12_4_ = 3;
          auVar32._16_4_ = 3;
          auVar32._20_4_ = 3;
          auVar32._24_4_ = 3;
          auVar32._28_4_ = 3;
          auVar105 = vpblendmd_avx512vl(auVar168,auVar32);
          local_440._0_4_ = (uint)(bVar81 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar81 & 1) * 2;
          bVar8 = (bool)(bVar81 >> 1 & 1);
          local_440._4_4_ = (uint)bVar8 * auVar105._4_4_ | (uint)!bVar8 * 2;
          bVar8 = (bool)(bVar81 >> 2 & 1);
          local_440._8_4_ = (uint)bVar8 * auVar105._8_4_ | (uint)!bVar8 * 2;
          bVar8 = (bool)(bVar81 >> 3 & 1);
          local_440._12_4_ = (uint)bVar8 * auVar105._12_4_ | (uint)!bVar8 * 2;
          bVar8 = (bool)(bVar81 >> 4 & 1);
          local_440._16_4_ = (uint)bVar8 * auVar105._16_4_ | (uint)!bVar8 * 2;
          bVar8 = (bool)(bVar81 >> 5 & 1);
          local_440._20_4_ = (uint)bVar8 * auVar105._20_4_ | (uint)!bVar8 * 2;
          bVar8 = (bool)(bVar81 >> 6 & 1);
          local_440._24_4_ = (uint)bVar8 * auVar105._24_4_ | (uint)!bVar8 * 2;
          local_440._28_4_ = (uint)(bVar81 >> 7) * auVar105._28_4_ | (uint)!(bool)(bVar81 >> 7) * 2;
          local_5e0 = vpbroadcastd_avx512vl();
          uVar19 = vpcmpd_avx512vl(local_5e0,local_440,5);
          bVar81 = (byte)uVar19 & bVar78;
          if (bVar81 != 0) {
            auVar92 = vminps_avx(local_740._0_16_,local_780._0_16_);
            auVar91 = vmaxps_avx(local_740._0_16_,local_780._0_16_);
            auVar88 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar93 = vminps_avx(auVar92,auVar88);
            auVar92 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar88 = vmaxps_avx(auVar91,auVar92);
            auVar91 = vandps_avx(auVar252,auVar93);
            auVar92 = vandps_avx(auVar252,auVar88);
            auVar91 = vmaxps_avx(auVar91,auVar92);
            auVar92 = vmovshdup_avx(auVar91);
            auVar92 = vmaxss_avx(auVar92,auVar91);
            auVar91 = vshufpd_avx(auVar91,auVar91,1);
            auVar91 = vmaxss_avx(auVar91,auVar92);
            fVar154 = auVar91._0_4_ * 1.9073486e-06;
            local_810 = vshufps_avx(auVar88,auVar88,0xff);
            local_6a0 = (float)local_720._0_4_ + (float)local_700._0_4_;
            fStack_69c = (float)local_720._4_4_ + (float)local_700._4_4_;
            fStack_698 = fStack_718 + fStack_6f8;
            fStack_694 = fStack_714 + fStack_6f4;
            fStack_690 = fStack_710 + fStack_6f0;
            fStack_68c = fStack_70c + fStack_6ec;
            fStack_688 = fStack_708 + fStack_6e8;
            fStack_684 = fStack_704 + fStack_6e4;
            do {
              auVar169._8_4_ = 0x7f800000;
              auVar169._0_8_ = 0x7f8000007f800000;
              auVar169._12_4_ = 0x7f800000;
              auVar169._16_4_ = 0x7f800000;
              auVar169._20_4_ = 0x7f800000;
              auVar169._24_4_ = 0x7f800000;
              auVar169._28_4_ = 0x7f800000;
              auVar105 = vblendmps_avx512vl(auVar169,_local_720);
              auVar140._0_4_ =
                   (uint)(bVar81 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar81 & 1) * 0x7f800000;
              bVar8 = (bool)(bVar81 >> 1 & 1);
              auVar140._4_4_ = (uint)bVar8 * auVar105._4_4_ | (uint)!bVar8 * 0x7f800000;
              bVar8 = (bool)(bVar81 >> 2 & 1);
              auVar140._8_4_ = (uint)bVar8 * auVar105._8_4_ | (uint)!bVar8 * 0x7f800000;
              bVar8 = (bool)(bVar81 >> 3 & 1);
              auVar140._12_4_ = (uint)bVar8 * auVar105._12_4_ | (uint)!bVar8 * 0x7f800000;
              bVar8 = (bool)(bVar81 >> 4 & 1);
              auVar140._16_4_ = (uint)bVar8 * auVar105._16_4_ | (uint)!bVar8 * 0x7f800000;
              bVar8 = (bool)(bVar81 >> 5 & 1);
              auVar140._20_4_ = (uint)bVar8 * auVar105._20_4_ | (uint)!bVar8 * 0x7f800000;
              auVar140._24_4_ =
                   (uint)(bVar81 >> 6) * auVar105._24_4_ | (uint)!(bool)(bVar81 >> 6) * 0x7f800000;
              auVar140._28_4_ = 0x7f800000;
              auVar105 = vshufps_avx(auVar140,auVar140,0xb1);
              auVar105 = vminps_avx(auVar140,auVar105);
              auVar106 = vshufpd_avx(auVar105,auVar105,5);
              auVar105 = vminps_avx(auVar105,auVar106);
              auVar106 = vpermpd_avx2(auVar105,0x4e);
              auVar105 = vminps_avx(auVar105,auVar106);
              uVar19 = vcmpps_avx512vl(auVar140,auVar105,0);
              bVar76 = (byte)uVar19 & bVar81;
              bVar77 = bVar81;
              if (bVar76 != 0) {
                bVar77 = bVar76;
              }
              iVar20 = 0;
              for (uVar80 = (uint)bVar77; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x80000000) {
                iVar20 = iVar20 + 1;
              }
              fVar240 = *(float *)(local_660 + (uint)(iVar20 << 2));
              fVar241 = *(float *)(local_1c0 + (uint)(iVar20 << 2));
              fVar243 = auVar15._0_4_;
              if ((float)local_860._0_4_ < 0.0) {
                fVar243 = sqrtf((float)local_860._0_4_);
              }
              lVar85 = 4;
              do {
                auVar155._4_4_ = fVar241;
                auVar155._0_4_ = fVar241;
                auVar155._8_4_ = fVar241;
                auVar155._12_4_ = fVar241;
                auVar92 = vfmadd132ps_fma(auVar155,ZEXT816(0) << 0x40,local_850);
                fVar251 = 1.0 - fVar240;
                auVar198._0_4_ = local_780._0_4_ * fVar240;
                auVar198._4_4_ = local_780._4_4_ * fVar240;
                auVar198._8_4_ = local_780._8_4_ * fVar240;
                auVar198._12_4_ = local_780._12_4_ * fVar240;
                local_7b0 = ZEXT416((uint)fVar251);
                auVar221._4_4_ = fVar251;
                auVar221._0_4_ = fVar251;
                auVar221._8_4_ = fVar251;
                auVar221._12_4_ = fVar251;
                auVar91 = vfmadd231ps_fma(auVar198,auVar221,local_740._0_16_);
                auVar227._0_4_ = local_760._0_4_ * fVar240;
                auVar227._4_4_ = local_760._4_4_ * fVar240;
                auVar227._8_4_ = local_760._8_4_ * fVar240;
                auVar227._12_4_ = local_760._12_4_ * fVar240;
                auVar88 = vfmadd231ps_fma(auVar227,auVar221,local_780._0_16_);
                auVar234._0_4_ = fVar240 * (float)local_7a0._0_4_;
                auVar234._4_4_ = fVar240 * (float)local_7a0._4_4_;
                auVar234._8_4_ = fVar240 * fStack_798;
                auVar234._12_4_ = fVar240 * fStack_794;
                auVar93 = vfmadd231ps_fma(auVar234,auVar221,local_760._0_16_);
                auVar237._0_4_ = fVar240 * auVar88._0_4_;
                auVar237._4_4_ = fVar240 * auVar88._4_4_;
                auVar237._8_4_ = fVar240 * auVar88._8_4_;
                auVar237._12_4_ = fVar240 * auVar88._12_4_;
                auVar91 = vfmadd231ps_fma(auVar237,auVar221,auVar91);
                auVar199._0_4_ = fVar240 * auVar93._0_4_;
                auVar199._4_4_ = fVar240 * auVar93._4_4_;
                auVar199._8_4_ = fVar240 * auVar93._8_4_;
                auVar199._12_4_ = fVar240 * auVar93._12_4_;
                auVar88 = vfmadd231ps_fma(auVar199,auVar221,auVar88);
                auVar228._0_4_ = fVar240 * auVar88._0_4_;
                auVar228._4_4_ = fVar240 * auVar88._4_4_;
                auVar228._8_4_ = fVar240 * auVar88._8_4_;
                auVar228._12_4_ = fVar240 * auVar88._12_4_;
                auVar93 = vfmadd231ps_fma(auVar228,auVar91,auVar221);
                auVar91 = vsubps_avx(auVar88,auVar91);
                auVar21._8_4_ = 0x40400000;
                auVar21._0_8_ = 0x4040000040400000;
                auVar21._12_4_ = 0x40400000;
                auVar88 = vmulps_avx512vl(auVar91,auVar21);
                local_6e0._0_16_ = auVar93;
                auVar91 = vsubps_avx(auVar92,auVar93);
                local_880._0_16_ = auVar91;
                auVar91 = vdpps_avx(auVar91,auVar91,0x7f);
                local_8a0._0_16_ = auVar91;
                local_9e0 = ZEXT416((uint)fVar240);
                if (auVar91._0_4_ < 0.0) {
                  auVar233._0_4_ = sqrtf(auVar91._0_4_);
                  auVar233._4_60_ = extraout_var;
                  auVar91 = auVar233._0_16_;
                }
                else {
                  auVar91 = vsqrtss_avx(auVar91,auVar91);
                }
                local_7c0 = vdpps_avx(auVar88,auVar88,0x7f);
                fVar251 = local_7c0._0_4_;
                auVar200._4_12_ = ZEXT812(0) << 0x20;
                auVar200._0_4_ = fVar251;
                auVar92 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar200);
                fVar245 = auVar92._0_4_;
                local_7d0 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar200);
                auVar22._8_4_ = 0x80000000;
                auVar22._0_8_ = 0x8000000080000000;
                auVar22._12_4_ = 0x80000000;
                auVar93 = vxorps_avx512vl(local_7c0,auVar22);
                auVar92 = vfnmadd213ss_fma(local_7d0,local_7c0,ZEXT416(0x40000000));
                uVar80 = auVar91._0_4_;
                if (fVar251 < auVar93._0_4_) {
                  auVar258._0_4_ = sqrtf(fVar251);
                  auVar258._4_60_ = extraout_var_00;
                  auVar91 = ZEXT416(uVar80);
                  auVar93 = auVar258._0_16_;
                }
                else {
                  auVar93 = vsqrtss_avx512f(local_7c0,local_7c0);
                }
                fVar251 = fVar245 * 1.5 + fVar251 * -0.5 * fVar245 * fVar245 * fVar245;
                auVar156._0_4_ = auVar88._0_4_ * fVar251;
                auVar156._4_4_ = auVar88._4_4_ * fVar251;
                auVar156._8_4_ = auVar88._8_4_ * fVar251;
                auVar156._12_4_ = auVar88._12_4_ * fVar251;
                auVar1 = vdpps_avx(local_880._0_16_,auVar156,0x7f);
                fVar218 = auVar91._0_4_;
                fVar245 = auVar1._0_4_;
                auVar157._0_4_ = fVar245 * fVar245;
                auVar157._4_4_ = auVar1._4_4_ * auVar1._4_4_;
                auVar157._8_4_ = auVar1._8_4_ * auVar1._8_4_;
                auVar157._12_4_ = auVar1._12_4_ * auVar1._12_4_;
                auVar94 = vsubps_avx512vl(local_8a0._0_16_,auVar157);
                fVar246 = auVar94._0_4_;
                auVar177._4_12_ = ZEXT812(0) << 0x20;
                auVar177._0_4_ = fVar246;
                auVar89 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar177);
                auVar95 = vmulss_avx512f(auVar89,ZEXT416(0x3fc00000));
                auVar96 = vmulss_avx512f(auVar94,ZEXT416(0xbf000000));
                if (fVar246 < 0.0) {
                  local_7f0 = fVar251;
                  fStack_7ec = fVar251;
                  fStack_7e8 = fVar251;
                  fStack_7e4 = fVar251;
                  local_7e0 = auVar89;
                  fVar246 = sqrtf(fVar246);
                  auVar96 = ZEXT416(auVar96._0_4_);
                  auVar95 = ZEXT416(auVar95._0_4_);
                  auVar93 = ZEXT416(auVar93._0_4_);
                  auVar91 = ZEXT416(uVar80);
                  auVar89 = local_7e0;
                  fVar251 = local_7f0;
                  fVar247 = fStack_7ec;
                  fVar242 = fStack_7e8;
                  fVar244 = fStack_7e4;
                }
                else {
                  auVar94 = vsqrtss_avx(auVar94,auVar94);
                  fVar246 = auVar94._0_4_;
                  fVar247 = fVar251;
                  fVar242 = fVar251;
                  fVar244 = fVar251;
                }
                auVar252._8_4_ = 0x7fffffff;
                auVar252._0_8_ = 0x7fffffff7fffffff;
                auVar252._12_4_ = 0x7fffffff;
                auVar258 = ZEXT3264(local_8c0);
                auVar94 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_9e0,local_7b0);
                fVar176 = auVar94._0_4_ * 6.0;
                fVar16 = fVar240 * 6.0;
                auVar201._0_4_ = fVar16 * (float)local_7a0._0_4_;
                auVar201._4_4_ = fVar16 * (float)local_7a0._4_4_;
                auVar201._8_4_ = fVar16 * fStack_798;
                auVar201._12_4_ = fVar16 * fStack_794;
                auVar178._4_4_ = fVar176;
                auVar178._0_4_ = fVar176;
                auVar178._8_4_ = fVar176;
                auVar178._12_4_ = fVar176;
                auVar94 = vfmadd132ps_fma(auVar178,auVar201,local_760._0_16_);
                auVar98 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_7b0,local_9e0);
                fVar176 = auVar98._0_4_ * 6.0;
                auVar202._4_4_ = fVar176;
                auVar202._0_4_ = fVar176;
                auVar202._8_4_ = fVar176;
                auVar202._12_4_ = fVar176;
                auVar94 = vfmadd132ps_fma(auVar202,auVar94,local_780._0_16_);
                fVar176 = local_7b0._0_4_ * 6.0;
                auVar179._4_4_ = fVar176;
                auVar179._0_4_ = fVar176;
                auVar179._8_4_ = fVar176;
                auVar179._12_4_ = fVar176;
                auVar94 = vfmadd132ps_fma(auVar179,auVar94,local_740._0_16_);
                auVar203._0_4_ = auVar94._0_4_ * (float)local_7c0._0_4_;
                auVar203._4_4_ = auVar94._4_4_ * (float)local_7c0._0_4_;
                auVar203._8_4_ = auVar94._8_4_ * (float)local_7c0._0_4_;
                auVar203._12_4_ = auVar94._12_4_ * (float)local_7c0._0_4_;
                auVar94 = vdpps_avx(auVar88,auVar94,0x7f);
                fVar176 = auVar94._0_4_;
                auVar180._0_4_ = auVar88._0_4_ * fVar176;
                auVar180._4_4_ = auVar88._4_4_ * fVar176;
                auVar180._8_4_ = auVar88._8_4_ * fVar176;
                auVar180._12_4_ = auVar88._12_4_ * fVar176;
                auVar94 = vsubps_avx(auVar203,auVar180);
                fVar176 = auVar92._0_4_ * (float)local_7d0._0_4_;
                auVar23._8_4_ = 0x80000000;
                auVar23._0_8_ = 0x8000000080000000;
                auVar23._12_4_ = 0x80000000;
                auVar142._16_16_ = local_8c0._16_16_;
                auVar97 = vxorps_avx512vl(auVar88,auVar23);
                auVar229._0_4_ = fVar251 * auVar94._0_4_ * fVar176;
                auVar229._4_4_ = fVar247 * auVar94._4_4_ * fVar176;
                auVar229._8_4_ = fVar242 * auVar94._8_4_ * fVar176;
                auVar229._12_4_ = fVar244 * auVar94._12_4_ * fVar176;
                auVar92 = vdpps_avx(auVar97,auVar156,0x7f);
                auVar94 = vmaxss_avx(ZEXT416((uint)fVar154),
                                     ZEXT416((uint)(fVar241 * fVar243 * 1.9073486e-06)));
                auVar98 = vdivss_avx512f(ZEXT416((uint)fVar154),auVar93);
                auVar93 = vdpps_avx(local_880._0_16_,auVar229,0x7f);
                auVar91 = vfmadd213ss_fma(auVar91,ZEXT416((uint)fVar154),auVar94);
                auVar98 = vfmadd213ss_fma(ZEXT416((uint)(fVar218 + 1.0)),auVar98,auVar91);
                auVar91 = vdpps_avx(local_850,auVar156,0x7f);
                fVar251 = auVar92._0_4_ + auVar93._0_4_;
                auVar92 = vdpps_avx(local_880._0_16_,auVar97,0x7f);
                auVar96 = vmulss_avx512f(auVar96,auVar89);
                auVar89 = vmulss_avx512f(auVar89,auVar89);
                auVar93 = vdpps_avx(local_880._0_16_,local_850,0x7f);
                auVar96 = vaddss_avx512f(auVar95,ZEXT416((uint)(auVar96._0_4_ * auVar89._0_4_)));
                auVar89 = vfnmadd231ss_fma(auVar92,auVar1,ZEXT416((uint)fVar251));
                auVar95 = vfnmadd231ss_fma(auVar93,auVar1,auVar91);
                auVar92 = vpermilps_avx(local_6e0._0_16_,0xff);
                fVar246 = fVar246 - auVar92._0_4_;
                auVar92 = vshufps_avx(auVar88,auVar88,0xff);
                auVar93 = vfmsub213ss_fma(auVar89,auVar96,auVar92);
                fVar218 = auVar95._0_4_ * auVar96._0_4_;
                auVar89 = vfmsub231ss_fma(ZEXT416((uint)(auVar91._0_4_ * auVar93._0_4_)),
                                          ZEXT416((uint)fVar251),ZEXT416((uint)fVar218));
                fVar247 = auVar89._0_4_;
                fVar251 = fVar246 * (fVar251 / fVar247) - fVar245 * (auVar93._0_4_ / fVar247);
                auVar233 = ZEXT464((uint)fVar251);
                fVar240 = fVar240 - (fVar245 * (fVar218 / fVar247) -
                                    fVar246 * (auVar91._0_4_ / fVar247));
                fVar241 = fVar241 - fVar251;
                auVar91 = vandps_avx(auVar1,auVar252);
                if (auVar98._0_4_ <= auVar91._0_4_) {
LAB_01de8cbd:
                  bVar8 = false;
                }
                else {
                  auVar93 = vfmadd231ss_fma(ZEXT416((uint)(auVar98._0_4_ + auVar94._0_4_)),local_810
                                            ,ZEXT416(0x36000000));
                  auVar91 = vandps_avx(auVar252,ZEXT416((uint)fVar246));
                  if (auVar93._0_4_ <= auVar91._0_4_) goto LAB_01de8cbd;
                  fVar241 = fVar241 + (float)local_800._0_4_;
                  bVar8 = true;
                  if (fVar219 <= fVar241) {
                    fVar251 = *(float *)(ray + k * 4 + 0x100);
                    auVar233 = ZEXT464((uint)fVar251);
                    if (((fVar241 <= fVar251) && (0.0 <= fVar240)) && (fVar240 <= 1.0)) {
                      auVar142._0_16_ = ZEXT816(0) << 0x20;
                      auVar141._4_28_ = auVar142._4_28_;
                      auVar141._0_4_ = local_8a0._0_4_;
                      auVar91 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar141._0_16_);
                      fVar245 = auVar91._0_4_;
                      auVar91 = vmulss_avx512f(local_8a0._0_16_,ZEXT416(0xbf000000));
                      pGVar5 = (context->scene->geometries).items[uVar84].ptr;
                      if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                        fVar245 = fVar245 * 1.5 + auVar91._0_4_ * fVar245 * fVar245 * fVar245;
                        auVar181._0_4_ = local_880._0_4_ * fVar245;
                        auVar181._4_4_ = local_880._4_4_ * fVar245;
                        auVar181._8_4_ = local_880._8_4_ * fVar245;
                        auVar181._12_4_ = local_880._12_4_ * fVar245;
                        auVar93 = vfmadd213ps_fma(auVar92,auVar181,auVar88);
                        auVar91 = vshufps_avx(auVar181,auVar181,0xc9);
                        auVar92 = vshufps_avx(auVar88,auVar88,0xc9);
                        auVar182._0_4_ = auVar181._0_4_ * auVar92._0_4_;
                        auVar182._4_4_ = auVar181._4_4_ * auVar92._4_4_;
                        auVar182._8_4_ = auVar181._8_4_ * auVar92._8_4_;
                        auVar182._12_4_ = auVar181._12_4_ * auVar92._12_4_;
                        auVar88 = vfmsub231ps_fma(auVar182,auVar88,auVar91);
                        auVar91 = vshufps_avx(auVar88,auVar88,0xc9);
                        auVar92 = vshufps_avx(auVar93,auVar93,0xc9);
                        auVar88 = vshufps_avx(auVar88,auVar88,0xd2);
                        auVar158._0_4_ = auVar93._0_4_ * auVar88._0_4_;
                        auVar158._4_4_ = auVar93._4_4_ * auVar88._4_4_;
                        auVar158._8_4_ = auVar93._8_4_ * auVar88._8_4_;
                        auVar158._12_4_ = auVar93._12_4_ * auVar88._12_4_;
                        auVar91 = vfmsub231ps_fma(auVar158,auVar91,auVar92);
                        uVar220 = auVar91._0_4_;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          *(float *)(ray + k * 4 + 0x100) = fVar241;
                          uVar4 = vextractps_avx(auVar91,1);
                          *(undefined4 *)(ray + k * 4 + 0x180) = uVar4;
                          uVar4 = vextractps_avx(auVar91,2);
                          *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar4;
                          *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar220;
                          *(float *)(ray + k * 4 + 0x1e0) = fVar240;
                          *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                          *(uint *)(ray + k * 4 + 0x220) = uVar3;
                          *(uint *)(ray + k * 4 + 0x240) = uVar84;
                          *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                        }
                        else {
                          pRVar7 = context->user;
                          auVar213._8_4_ = 1;
                          auVar213._0_8_ = 0x100000001;
                          auVar213._12_4_ = 1;
                          auVar213._16_4_ = 1;
                          auVar213._20_4_ = 1;
                          auVar213._24_4_ = 1;
                          auVar213._28_4_ = 1;
                          auVar105 = vpermps_avx2(auVar213,ZEXT1632(auVar91));
                          auVar223._8_4_ = 2;
                          auVar223._0_8_ = 0x200000002;
                          auVar223._12_4_ = 2;
                          auVar223._16_4_ = 2;
                          auVar223._20_4_ = 2;
                          auVar223._24_4_ = 2;
                          auVar223._28_4_ = 2;
                          local_580 = vpermps_avx2(auVar223,ZEXT1632(auVar91));
                          local_5a0[0] = (RTCHitN)auVar105[0];
                          local_5a0[1] = (RTCHitN)auVar105[1];
                          local_5a0[2] = (RTCHitN)auVar105[2];
                          local_5a0[3] = (RTCHitN)auVar105[3];
                          local_5a0[4] = (RTCHitN)auVar105[4];
                          local_5a0[5] = (RTCHitN)auVar105[5];
                          local_5a0[6] = (RTCHitN)auVar105[6];
                          local_5a0[7] = (RTCHitN)auVar105[7];
                          local_5a0[8] = (RTCHitN)auVar105[8];
                          local_5a0[9] = (RTCHitN)auVar105[9];
                          local_5a0[10] = (RTCHitN)auVar105[10];
                          local_5a0[0xb] = (RTCHitN)auVar105[0xb];
                          local_5a0[0xc] = (RTCHitN)auVar105[0xc];
                          local_5a0[0xd] = (RTCHitN)auVar105[0xd];
                          local_5a0[0xe] = (RTCHitN)auVar105[0xe];
                          local_5a0[0xf] = (RTCHitN)auVar105[0xf];
                          local_5a0[0x10] = (RTCHitN)auVar105[0x10];
                          local_5a0[0x11] = (RTCHitN)auVar105[0x11];
                          local_5a0[0x12] = (RTCHitN)auVar105[0x12];
                          local_5a0[0x13] = (RTCHitN)auVar105[0x13];
                          local_5a0[0x14] = (RTCHitN)auVar105[0x14];
                          local_5a0[0x15] = (RTCHitN)auVar105[0x15];
                          local_5a0[0x16] = (RTCHitN)auVar105[0x16];
                          local_5a0[0x17] = (RTCHitN)auVar105[0x17];
                          local_5a0[0x18] = (RTCHitN)auVar105[0x18];
                          local_5a0[0x19] = (RTCHitN)auVar105[0x19];
                          local_5a0[0x1a] = (RTCHitN)auVar105[0x1a];
                          local_5a0[0x1b] = (RTCHitN)auVar105[0x1b];
                          local_5a0[0x1c] = (RTCHitN)auVar105[0x1c];
                          local_5a0[0x1d] = (RTCHitN)auVar105[0x1d];
                          local_5a0[0x1e] = (RTCHitN)auVar105[0x1e];
                          local_5a0[0x1f] = (RTCHitN)auVar105[0x1f];
                          local_560 = uVar220;
                          uStack_55c = uVar220;
                          uStack_558 = uVar220;
                          uStack_554 = uVar220;
                          uStack_550 = uVar220;
                          uStack_54c = uVar220;
                          uStack_548 = uVar220;
                          uStack_544 = uVar220;
                          local_540 = fVar240;
                          fStack_53c = fVar240;
                          fStack_538 = fVar240;
                          fStack_534 = fVar240;
                          fStack_530 = fVar240;
                          fStack_52c = fVar240;
                          fStack_528 = fVar240;
                          fStack_524 = fVar240;
                          local_520 = ZEXT432(0) << 0x20;
                          local_500 = local_620._0_8_;
                          uStack_4f8 = local_620._8_8_;
                          uStack_4f0 = local_620._16_8_;
                          uStack_4e8 = local_620._24_8_;
                          local_4e0 = local_600;
                          auVar105 = vpcmpeqd_avx2(local_600,local_600);
                          local_8e8[1] = auVar105;
                          *local_8e8 = auVar105;
                          local_4c0 = pRVar7->instID[0];
                          uStack_4bc = local_4c0;
                          uStack_4b8 = local_4c0;
                          uStack_4b4 = local_4c0;
                          uStack_4b0 = local_4c0;
                          uStack_4ac = local_4c0;
                          uStack_4a8 = local_4c0;
                          uStack_4a4 = local_4c0;
                          local_4a0 = pRVar7->instPrimID[0];
                          uStack_49c = local_4a0;
                          uStack_498 = local_4a0;
                          uStack_494 = local_4a0;
                          uStack_490 = local_4a0;
                          uStack_48c = local_4a0;
                          uStack_488 = local_4a0;
                          uStack_484 = local_4a0;
                          *(float *)(ray + k * 4 + 0x100) = fVar241;
                          local_840 = local_640._0_8_;
                          uStack_838 = local_640._8_8_;
                          uStack_830 = local_640._16_8_;
                          uStack_828 = local_640._24_8_;
                          local_930.valid = (int *)&local_840;
                          local_930.geometryUserPtr = pGVar5->userPtr;
                          local_930.context = context->user;
                          local_930.hit = local_5a0;
                          local_930.N = 8;
                          local_930.ray = (RTCRayN *)ray;
                          if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar5->intersectionFilterN)(&local_930);
                            auVar258 = ZEXT3264(local_8c0);
                            auVar252._8_4_ = 0x7fffffff;
                            auVar252._0_8_ = 0x7fffffff7fffffff;
                            auVar252._12_4_ = 0x7fffffff;
                          }
                          auVar65._8_8_ = uStack_838;
                          auVar65._0_8_ = local_840;
                          auVar65._16_8_ = uStack_830;
                          auVar65._24_8_ = uStack_828;
                          if (auVar65 == (undefined1  [32])0x0) {
LAB_01de8f89:
                            *(float *)(ray + k * 4 + 0x100) = fVar251;
                          }
                          else {
                            p_Var6 = context->args->filter;
                            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var6)(&local_930);
                              auVar258 = ZEXT3264(local_8c0);
                              auVar252._8_4_ = 0x7fffffff;
                              auVar252._0_8_ = 0x7fffffff7fffffff;
                              auVar252._12_4_ = 0x7fffffff;
                            }
                            auVar66._8_8_ = uStack_838;
                            auVar66._0_8_ = local_840;
                            auVar66._16_8_ = uStack_830;
                            auVar66._24_8_ = uStack_828;
                            if (auVar66 == (undefined1  [32])0x0) goto LAB_01de8f89;
                            uVar87 = vptestmd_avx512vl(auVar66,auVar66);
                            iVar58 = *(int *)(local_930.hit + 4);
                            iVar59 = *(int *)(local_930.hit + 8);
                            iVar60 = *(int *)(local_930.hit + 0xc);
                            iVar61 = *(int *)(local_930.hit + 0x10);
                            iVar62 = *(int *)(local_930.hit + 0x14);
                            iVar63 = *(int *)(local_930.hit + 0x18);
                            iVar64 = *(int *)(local_930.hit + 0x1c);
                            bVar77 = (byte)uVar87;
                            bVar86 = (bool)((byte)(uVar87 >> 1) & 1);
                            bVar9 = (bool)((byte)(uVar87 >> 2) & 1);
                            bVar10 = (bool)((byte)(uVar87 >> 3) & 1);
                            bVar12 = (bool)((byte)(uVar87 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar87 >> 5) & 1);
                            bVar13 = (bool)((byte)(uVar87 >> 6) & 1);
                            bVar14 = SUB81(uVar87 >> 7,0);
                            *(uint *)(local_930.ray + 0x180) =
                                 (uint)(bVar77 & 1) * *(int *)local_930.hit |
                                 (uint)!(bool)(bVar77 & 1) * *(int *)(local_930.ray + 0x180);
                            *(uint *)(local_930.ray + 0x184) =
                                 (uint)bVar86 * iVar58 |
                                 (uint)!bVar86 * *(int *)(local_930.ray + 0x184);
                            *(uint *)(local_930.ray + 0x188) =
                                 (uint)bVar9 * iVar59 |
                                 (uint)!bVar9 * *(int *)(local_930.ray + 0x188);
                            *(uint *)(local_930.ray + 0x18c) =
                                 (uint)bVar10 * iVar60 |
                                 (uint)!bVar10 * *(int *)(local_930.ray + 0x18c);
                            *(uint *)(local_930.ray + 400) =
                                 (uint)bVar12 * iVar61 |
                                 (uint)!bVar12 * *(int *)(local_930.ray + 400);
                            *(uint *)(local_930.ray + 0x194) =
                                 (uint)bVar11 * iVar62 |
                                 (uint)!bVar11 * *(int *)(local_930.ray + 0x194);
                            *(uint *)(local_930.ray + 0x198) =
                                 (uint)bVar13 * iVar63 |
                                 (uint)!bVar13 * *(int *)(local_930.ray + 0x198);
                            *(uint *)(local_930.ray + 0x19c) =
                                 (uint)bVar14 * iVar64 |
                                 (uint)!bVar14 * *(int *)(local_930.ray + 0x19c);
                            iVar58 = *(int *)(local_930.hit + 0x24);
                            iVar59 = *(int *)(local_930.hit + 0x28);
                            iVar60 = *(int *)(local_930.hit + 0x2c);
                            iVar61 = *(int *)(local_930.hit + 0x30);
                            iVar62 = *(int *)(local_930.hit + 0x34);
                            iVar63 = *(int *)(local_930.hit + 0x38);
                            iVar64 = *(int *)(local_930.hit + 0x3c);
                            bVar86 = (bool)((byte)(uVar87 >> 1) & 1);
                            bVar9 = (bool)((byte)(uVar87 >> 2) & 1);
                            bVar10 = (bool)((byte)(uVar87 >> 3) & 1);
                            bVar12 = (bool)((byte)(uVar87 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar87 >> 5) & 1);
                            bVar13 = (bool)((byte)(uVar87 >> 6) & 1);
                            bVar14 = SUB81(uVar87 >> 7,0);
                            *(uint *)(local_930.ray + 0x1a0) =
                                 (uint)(bVar77 & 1) * *(int *)(local_930.hit + 0x20) |
                                 (uint)!(bool)(bVar77 & 1) * *(int *)(local_930.ray + 0x1a0);
                            *(uint *)(local_930.ray + 0x1a4) =
                                 (uint)bVar86 * iVar58 |
                                 (uint)!bVar86 * *(int *)(local_930.ray + 0x1a4);
                            *(uint *)(local_930.ray + 0x1a8) =
                                 (uint)bVar9 * iVar59 |
                                 (uint)!bVar9 * *(int *)(local_930.ray + 0x1a8);
                            *(uint *)(local_930.ray + 0x1ac) =
                                 (uint)bVar10 * iVar60 |
                                 (uint)!bVar10 * *(int *)(local_930.ray + 0x1ac);
                            *(uint *)(local_930.ray + 0x1b0) =
                                 (uint)bVar12 * iVar61 |
                                 (uint)!bVar12 * *(int *)(local_930.ray + 0x1b0);
                            *(uint *)(local_930.ray + 0x1b4) =
                                 (uint)bVar11 * iVar62 |
                                 (uint)!bVar11 * *(int *)(local_930.ray + 0x1b4);
                            *(uint *)(local_930.ray + 0x1b8) =
                                 (uint)bVar13 * iVar63 |
                                 (uint)!bVar13 * *(int *)(local_930.ray + 0x1b8);
                            *(uint *)(local_930.ray + 0x1bc) =
                                 (uint)bVar14 * iVar64 |
                                 (uint)!bVar14 * *(int *)(local_930.ray + 0x1bc);
                            iVar58 = *(int *)(local_930.hit + 0x44);
                            iVar59 = *(int *)(local_930.hit + 0x48);
                            iVar60 = *(int *)(local_930.hit + 0x4c);
                            iVar61 = *(int *)(local_930.hit + 0x50);
                            iVar62 = *(int *)(local_930.hit + 0x54);
                            iVar63 = *(int *)(local_930.hit + 0x58);
                            iVar64 = *(int *)(local_930.hit + 0x5c);
                            bVar86 = (bool)((byte)(uVar87 >> 1) & 1);
                            bVar9 = (bool)((byte)(uVar87 >> 2) & 1);
                            bVar10 = (bool)((byte)(uVar87 >> 3) & 1);
                            bVar12 = (bool)((byte)(uVar87 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar87 >> 5) & 1);
                            bVar13 = (bool)((byte)(uVar87 >> 6) & 1);
                            bVar14 = SUB81(uVar87 >> 7,0);
                            *(uint *)(local_930.ray + 0x1c0) =
                                 (uint)(bVar77 & 1) * *(int *)(local_930.hit + 0x40) |
                                 (uint)!(bool)(bVar77 & 1) * *(int *)(local_930.ray + 0x1c0);
                            *(uint *)(local_930.ray + 0x1c4) =
                                 (uint)bVar86 * iVar58 |
                                 (uint)!bVar86 * *(int *)(local_930.ray + 0x1c4);
                            *(uint *)(local_930.ray + 0x1c8) =
                                 (uint)bVar9 * iVar59 |
                                 (uint)!bVar9 * *(int *)(local_930.ray + 0x1c8);
                            *(uint *)(local_930.ray + 0x1cc) =
                                 (uint)bVar10 * iVar60 |
                                 (uint)!bVar10 * *(int *)(local_930.ray + 0x1cc);
                            *(uint *)(local_930.ray + 0x1d0) =
                                 (uint)bVar12 * iVar61 |
                                 (uint)!bVar12 * *(int *)(local_930.ray + 0x1d0);
                            *(uint *)(local_930.ray + 0x1d4) =
                                 (uint)bVar11 * iVar62 |
                                 (uint)!bVar11 * *(int *)(local_930.ray + 0x1d4);
                            *(uint *)(local_930.ray + 0x1d8) =
                                 (uint)bVar13 * iVar63 |
                                 (uint)!bVar13 * *(int *)(local_930.ray + 0x1d8);
                            *(uint *)(local_930.ray + 0x1dc) =
                                 (uint)bVar14 * iVar64 |
                                 (uint)!bVar14 * *(int *)(local_930.ray + 0x1dc);
                            iVar58 = *(int *)(local_930.hit + 100);
                            iVar59 = *(int *)(local_930.hit + 0x68);
                            iVar60 = *(int *)(local_930.hit + 0x6c);
                            iVar61 = *(int *)(local_930.hit + 0x70);
                            iVar62 = *(int *)(local_930.hit + 0x74);
                            iVar63 = *(int *)(local_930.hit + 0x78);
                            iVar64 = *(int *)(local_930.hit + 0x7c);
                            bVar86 = (bool)((byte)(uVar87 >> 1) & 1);
                            bVar9 = (bool)((byte)(uVar87 >> 2) & 1);
                            bVar10 = (bool)((byte)(uVar87 >> 3) & 1);
                            bVar12 = (bool)((byte)(uVar87 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar87 >> 5) & 1);
                            bVar13 = (bool)((byte)(uVar87 >> 6) & 1);
                            bVar14 = SUB81(uVar87 >> 7,0);
                            *(uint *)(local_930.ray + 0x1e0) =
                                 (uint)(bVar77 & 1) * *(int *)(local_930.hit + 0x60) |
                                 (uint)!(bool)(bVar77 & 1) * *(int *)(local_930.ray + 0x1e0);
                            *(uint *)(local_930.ray + 0x1e4) =
                                 (uint)bVar86 * iVar58 |
                                 (uint)!bVar86 * *(int *)(local_930.ray + 0x1e4);
                            *(uint *)(local_930.ray + 0x1e8) =
                                 (uint)bVar9 * iVar59 |
                                 (uint)!bVar9 * *(int *)(local_930.ray + 0x1e8);
                            *(uint *)(local_930.ray + 0x1ec) =
                                 (uint)bVar10 * iVar60 |
                                 (uint)!bVar10 * *(int *)(local_930.ray + 0x1ec);
                            *(uint *)(local_930.ray + 0x1f0) =
                                 (uint)bVar12 * iVar61 |
                                 (uint)!bVar12 * *(int *)(local_930.ray + 0x1f0);
                            *(uint *)(local_930.ray + 500) =
                                 (uint)bVar11 * iVar62 |
                                 (uint)!bVar11 * *(int *)(local_930.ray + 500);
                            *(uint *)(local_930.ray + 0x1f8) =
                                 (uint)bVar13 * iVar63 |
                                 (uint)!bVar13 * *(int *)(local_930.ray + 0x1f8);
                            *(uint *)(local_930.ray + 0x1fc) =
                                 (uint)bVar14 * iVar64 |
                                 (uint)!bVar14 * *(int *)(local_930.ray + 0x1fc);
                            iVar58 = *(int *)(local_930.hit + 0x84);
                            iVar59 = *(int *)(local_930.hit + 0x88);
                            iVar60 = *(int *)(local_930.hit + 0x8c);
                            iVar61 = *(int *)(local_930.hit + 0x90);
                            iVar62 = *(int *)(local_930.hit + 0x94);
                            iVar63 = *(int *)(local_930.hit + 0x98);
                            iVar64 = *(int *)(local_930.hit + 0x9c);
                            bVar86 = (bool)((byte)(uVar87 >> 1) & 1);
                            bVar9 = (bool)((byte)(uVar87 >> 2) & 1);
                            bVar10 = (bool)((byte)(uVar87 >> 3) & 1);
                            bVar12 = (bool)((byte)(uVar87 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar87 >> 5) & 1);
                            bVar13 = (bool)((byte)(uVar87 >> 6) & 1);
                            bVar14 = SUB81(uVar87 >> 7,0);
                            *(uint *)(local_930.ray + 0x200) =
                                 (uint)(bVar77 & 1) * *(int *)(local_930.hit + 0x80) |
                                 (uint)!(bool)(bVar77 & 1) * *(int *)(local_930.ray + 0x200);
                            *(uint *)(local_930.ray + 0x204) =
                                 (uint)bVar86 * iVar58 |
                                 (uint)!bVar86 * *(int *)(local_930.ray + 0x204);
                            *(uint *)(local_930.ray + 0x208) =
                                 (uint)bVar9 * iVar59 |
                                 (uint)!bVar9 * *(int *)(local_930.ray + 0x208);
                            *(uint *)(local_930.ray + 0x20c) =
                                 (uint)bVar10 * iVar60 |
                                 (uint)!bVar10 * *(int *)(local_930.ray + 0x20c);
                            *(uint *)(local_930.ray + 0x210) =
                                 (uint)bVar12 * iVar61 |
                                 (uint)!bVar12 * *(int *)(local_930.ray + 0x210);
                            *(uint *)(local_930.ray + 0x214) =
                                 (uint)bVar11 * iVar62 |
                                 (uint)!bVar11 * *(int *)(local_930.ray + 0x214);
                            *(uint *)(local_930.ray + 0x218) =
                                 (uint)bVar13 * iVar63 |
                                 (uint)!bVar13 * *(int *)(local_930.ray + 0x218);
                            *(uint *)(local_930.ray + 0x21c) =
                                 (uint)bVar14 * iVar64 |
                                 (uint)!bVar14 * *(int *)(local_930.ray + 0x21c);
                            auVar105 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                           (local_930.hit + 0xa0));
                            *(undefined1 (*) [32])(local_930.ray + 0x220) = auVar105;
                            auVar105 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                           (local_930.hit + 0xc0));
                            *(undefined1 (*) [32])(local_930.ray + 0x240) = auVar105;
                            auVar105 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                           (local_930.hit + 0xe0));
                            *(undefined1 (*) [32])(local_930.ray + 0x260) = auVar105;
                            auVar105 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                           (local_930.hit + 0x100));
                            *(undefined1 (*) [32])(local_930.ray + 0x280) = auVar105;
                          }
                          auVar233 = ZEXT464((uint)fVar251);
                        }
                      }
                    }
                  }
                }
                bVar86 = lVar85 != 0;
                lVar85 = lVar85 + -1;
              } while ((!bVar8) && (bVar86));
              auVar69._4_4_ = fStack_69c;
              auVar69._0_4_ = local_6a0;
              auVar69._8_4_ = fStack_698;
              auVar69._12_4_ = fStack_694;
              auVar69._16_4_ = fStack_690;
              auVar69._20_4_ = fStack_68c;
              auVar69._24_4_ = fStack_688;
              auVar69._28_4_ = fStack_684;
              uVar220 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar33._4_4_ = uVar220;
              auVar33._0_4_ = uVar220;
              auVar33._8_4_ = uVar220;
              auVar33._12_4_ = uVar220;
              auVar33._16_4_ = uVar220;
              auVar33._20_4_ = uVar220;
              auVar33._24_4_ = uVar220;
              auVar33._28_4_ = uVar220;
              uVar19 = vcmpps_avx512vl(auVar69,auVar33,2);
              bVar81 = ~('\x01' << ((byte)iVar20 & 0x1f)) & bVar81 & (byte)uVar19;
            } while (bVar81 != 0);
          }
          auVar170._0_4_ = (float)local_6c0._0_4_ + (float)local_700._0_4_;
          auVar170._4_4_ = (float)local_6c0._4_4_ + (float)local_700._4_4_;
          auVar170._8_4_ = fStack_6b8 + fStack_6f8;
          auVar170._12_4_ = fStack_6b4 + fStack_6f4;
          auVar170._16_4_ = fStack_6b0 + fStack_6f0;
          auVar170._20_4_ = fStack_6ac + fStack_6ec;
          auVar170._24_4_ = fStack_6a8 + fStack_6e8;
          auVar170._28_4_ = fStack_6a4 + fStack_6e4;
          uVar220 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar34._4_4_ = uVar220;
          auVar34._0_4_ = uVar220;
          auVar34._8_4_ = uVar220;
          auVar34._12_4_ = uVar220;
          auVar34._16_4_ = uVar220;
          auVar34._20_4_ = uVar220;
          auVar34._24_4_ = uVar220;
          auVar34._28_4_ = uVar220;
          uVar19 = vcmpps_avx512vl(auVar170,auVar34,2);
          bVar82 = (byte)uVar17 | ~bVar82;
          bVar75 = (byte)uVar18 & bVar75 & (byte)uVar19;
          auVar171._8_4_ = 2;
          auVar171._0_8_ = 0x200000002;
          auVar171._12_4_ = 2;
          auVar171._16_4_ = 2;
          auVar171._20_4_ = 2;
          auVar171._24_4_ = 2;
          auVar171._28_4_ = 2;
          auVar35._8_4_ = 3;
          auVar35._0_8_ = 0x300000003;
          auVar35._12_4_ = 3;
          auVar35._16_4_ = 3;
          auVar35._20_4_ = 3;
          auVar35._24_4_ = 3;
          auVar35._28_4_ = 3;
          auVar105 = vpblendmd_avx512vl(auVar171,auVar35);
          local_6c0._0_4_ = (uint)(bVar82 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar82 & 1) * 2;
          bVar8 = (bool)(bVar82 >> 1 & 1);
          local_6c0._4_4_ = (uint)bVar8 * auVar105._4_4_ | (uint)!bVar8 * 2;
          bVar8 = (bool)(bVar82 >> 2 & 1);
          fStack_6b8 = (float)((uint)bVar8 * auVar105._8_4_ | (uint)!bVar8 * 2);
          bVar8 = (bool)(bVar82 >> 3 & 1);
          fStack_6b4 = (float)((uint)bVar8 * auVar105._12_4_ | (uint)!bVar8 * 2);
          bVar8 = (bool)(bVar82 >> 4 & 1);
          fStack_6b0 = (float)((uint)bVar8 * auVar105._16_4_ | (uint)!bVar8 * 2);
          bVar8 = (bool)(bVar82 >> 5 & 1);
          fStack_6ac = (float)((uint)bVar8 * auVar105._20_4_ | (uint)!bVar8 * 2);
          bVar8 = (bool)(bVar82 >> 6 & 1);
          fStack_6a8 = (float)((uint)bVar8 * auVar105._24_4_ | (uint)!bVar8 * 2);
          fStack_6a4 = (float)((uint)(bVar82 >> 7) * auVar105._28_4_ |
                              (uint)!(bool)(bVar82 >> 7) * 2);
          uVar17 = vpcmpd_avx512vl(_local_6c0,local_5e0,2);
          bVar82 = (byte)uVar17 & bVar75;
          if (bVar82 != 0) {
            auVar92 = vminps_avx(local_740._0_16_,local_780._0_16_);
            auVar91 = vmaxps_avx(local_740._0_16_,local_780._0_16_);
            auVar88 = vminps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar93 = vminps_avx(auVar92,auVar88);
            auVar92 = vmaxps_avx(local_760._0_16_,local_7a0._0_16_);
            auVar88 = vmaxps_avx(auVar91,auVar92);
            auVar91 = vandps_avx(auVar252,auVar93);
            auVar92 = vandps_avx(auVar252,auVar88);
            auVar91 = vmaxps_avx(auVar91,auVar92);
            auVar92 = vmovshdup_avx(auVar91);
            auVar92 = vmaxss_avx(auVar92,auVar91);
            auVar91 = vshufpd_avx(auVar91,auVar91,1);
            auVar91 = vmaxss_avx(auVar91,auVar92);
            fVar154 = auVar91._0_4_ * 1.9073486e-06;
            local_810 = vshufps_avx(auVar88,auVar88,0xff);
            _local_720 = _local_480;
            local_6a0 = (float)local_480._0_4_ + (float)local_700._0_4_;
            fStack_69c = (float)local_480._4_4_ + (float)local_700._4_4_;
            fStack_698 = fStack_478 + fStack_6f8;
            fStack_694 = fStack_474 + fStack_6f4;
            fStack_690 = fStack_470 + fStack_6f0;
            fStack_68c = fStack_46c + fStack_6ec;
            fStack_688 = fStack_468 + fStack_6e8;
            fStack_684 = fStack_464 + fStack_6e4;
            do {
              auVar172._8_4_ = 0x7f800000;
              auVar172._0_8_ = 0x7f8000007f800000;
              auVar172._12_4_ = 0x7f800000;
              auVar172._16_4_ = 0x7f800000;
              auVar172._20_4_ = 0x7f800000;
              auVar172._24_4_ = 0x7f800000;
              auVar172._28_4_ = 0x7f800000;
              auVar105 = vblendmps_avx512vl(auVar172,_local_720);
              auVar143._0_4_ =
                   (uint)(bVar82 & 1) * auVar105._0_4_ | (uint)!(bool)(bVar82 & 1) * 0x7f800000;
              bVar8 = (bool)(bVar82 >> 1 & 1);
              auVar143._4_4_ = (uint)bVar8 * auVar105._4_4_ | (uint)!bVar8 * 0x7f800000;
              bVar8 = (bool)(bVar82 >> 2 & 1);
              auVar143._8_4_ = (uint)bVar8 * auVar105._8_4_ | (uint)!bVar8 * 0x7f800000;
              bVar8 = (bool)(bVar82 >> 3 & 1);
              auVar143._12_4_ = (uint)bVar8 * auVar105._12_4_ | (uint)!bVar8 * 0x7f800000;
              bVar8 = (bool)(bVar82 >> 4 & 1);
              auVar143._16_4_ = (uint)bVar8 * auVar105._16_4_ | (uint)!bVar8 * 0x7f800000;
              bVar8 = (bool)(bVar82 >> 5 & 1);
              auVar143._20_4_ = (uint)bVar8 * auVar105._20_4_ | (uint)!bVar8 * 0x7f800000;
              auVar143._24_4_ =
                   (uint)(bVar82 >> 6) * auVar105._24_4_ | (uint)!(bool)(bVar82 >> 6) * 0x7f800000;
              auVar143._28_4_ = 0x7f800000;
              auVar105 = vshufps_avx(auVar143,auVar143,0xb1);
              auVar105 = vminps_avx(auVar143,auVar105);
              auVar106 = vshufpd_avx(auVar105,auVar105,5);
              auVar105 = vminps_avx(auVar105,auVar106);
              auVar106 = vpermpd_avx2(auVar105,0x4e);
              auVar105 = vminps_avx(auVar105,auVar106);
              uVar17 = vcmpps_avx512vl(auVar143,auVar105,0);
              bVar77 = (byte)uVar17 & bVar82;
              bVar81 = bVar82;
              if (bVar77 != 0) {
                bVar81 = bVar77;
              }
              iVar20 = 0;
              for (uVar80 = (uint)bVar81; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x80000000) {
                iVar20 = iVar20 + 1;
              }
              fVar240 = *(float *)(local_680 + (uint)(iVar20 << 2));
              fVar241 = *(float *)(local_460 + (uint)(iVar20 << 2));
              fVar243 = auVar90._0_4_;
              if ((float)local_860._0_4_ < 0.0) {
                fVar243 = sqrtf((float)local_860._0_4_);
              }
              lVar85 = 4;
              do {
                auVar159._4_4_ = fVar241;
                auVar159._0_4_ = fVar241;
                auVar159._8_4_ = fVar241;
                auVar159._12_4_ = fVar241;
                auVar92 = vfmadd132ps_fma(auVar159,ZEXT816(0) << 0x40,local_850);
                fVar251 = 1.0 - fVar240;
                auVar204._0_4_ = local_780._0_4_ * fVar240;
                auVar204._4_4_ = local_780._4_4_ * fVar240;
                auVar204._8_4_ = local_780._8_4_ * fVar240;
                auVar204._12_4_ = local_780._12_4_ * fVar240;
                local_7b0 = ZEXT416((uint)fVar251);
                auVar222._4_4_ = fVar251;
                auVar222._0_4_ = fVar251;
                auVar222._8_4_ = fVar251;
                auVar222._12_4_ = fVar251;
                auVar91 = vfmadd231ps_fma(auVar204,auVar222,local_740._0_16_);
                auVar230._0_4_ = local_760._0_4_ * fVar240;
                auVar230._4_4_ = local_760._4_4_ * fVar240;
                auVar230._8_4_ = local_760._8_4_ * fVar240;
                auVar230._12_4_ = local_760._12_4_ * fVar240;
                auVar88 = vfmadd231ps_fma(auVar230,auVar222,local_780._0_16_);
                auVar235._0_4_ = fVar240 * (float)local_7a0._0_4_;
                auVar235._4_4_ = fVar240 * (float)local_7a0._4_4_;
                auVar235._8_4_ = fVar240 * fStack_798;
                auVar235._12_4_ = fVar240 * fStack_794;
                auVar93 = vfmadd231ps_fma(auVar235,auVar222,local_760._0_16_);
                auVar238._0_4_ = fVar240 * auVar88._0_4_;
                auVar238._4_4_ = fVar240 * auVar88._4_4_;
                auVar238._8_4_ = fVar240 * auVar88._8_4_;
                auVar238._12_4_ = fVar240 * auVar88._12_4_;
                auVar91 = vfmadd231ps_fma(auVar238,auVar222,auVar91);
                auVar205._0_4_ = fVar240 * auVar93._0_4_;
                auVar205._4_4_ = fVar240 * auVar93._4_4_;
                auVar205._8_4_ = fVar240 * auVar93._8_4_;
                auVar205._12_4_ = fVar240 * auVar93._12_4_;
                auVar88 = vfmadd231ps_fma(auVar205,auVar222,auVar88);
                auVar231._0_4_ = fVar240 * auVar88._0_4_;
                auVar231._4_4_ = fVar240 * auVar88._4_4_;
                auVar231._8_4_ = fVar240 * auVar88._8_4_;
                auVar231._12_4_ = fVar240 * auVar88._12_4_;
                auVar93 = vfmadd231ps_fma(auVar231,auVar91,auVar222);
                auVar91 = vsubps_avx(auVar88,auVar91);
                auVar24._8_4_ = 0x40400000;
                auVar24._0_8_ = 0x4040000040400000;
                auVar24._12_4_ = 0x40400000;
                auVar88 = vmulps_avx512vl(auVar91,auVar24);
                local_6e0._0_16_ = auVar93;
                auVar91 = vsubps_avx(auVar92,auVar93);
                local_880._0_16_ = auVar91;
                auVar91 = vdpps_avx(auVar91,auVar91,0x7f);
                local_8a0._0_16_ = auVar91;
                local_9e0 = ZEXT416((uint)fVar240);
                if (auVar91._0_4_ < 0.0) {
                  auVar174._0_4_ = sqrtf(auVar91._0_4_);
                  auVar174._4_60_ = extraout_var_01;
                  auVar91 = auVar174._0_16_;
                }
                else {
                  auVar91 = vsqrtss_avx(auVar91,auVar91);
                }
                local_7c0 = vdpps_avx(auVar88,auVar88,0x7f);
                fVar251 = local_7c0._0_4_;
                auVar206._4_12_ = ZEXT812(0) << 0x20;
                auVar206._0_4_ = fVar251;
                auVar92 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar206);
                fVar245 = auVar92._0_4_;
                local_7d0 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar206);
                auVar25._8_4_ = 0x80000000;
                auVar25._0_8_ = 0x8000000080000000;
                auVar25._12_4_ = 0x80000000;
                auVar93 = vxorps_avx512vl(local_7c0,auVar25);
                auVar92 = vfnmadd213ss_fma(local_7d0,local_7c0,ZEXT416(0x40000000));
                uVar80 = auVar91._0_4_;
                if (fVar251 < auVar93._0_4_) {
                  auVar175._0_4_ = sqrtf(fVar251);
                  auVar175._4_60_ = extraout_var_02;
                  auVar91 = ZEXT416(uVar80);
                  auVar93 = auVar175._0_16_;
                }
                else {
                  auVar93 = vsqrtss_avx512f(local_7c0,local_7c0);
                }
                fVar251 = fVar245 * 1.5 + fVar251 * -0.5 * fVar245 * fVar245 * fVar245;
                auVar160._0_4_ = auVar88._0_4_ * fVar251;
                auVar160._4_4_ = auVar88._4_4_ * fVar251;
                auVar160._8_4_ = auVar88._8_4_ * fVar251;
                auVar160._12_4_ = auVar88._12_4_ * fVar251;
                auVar1 = vdpps_avx(local_880._0_16_,auVar160,0x7f);
                fVar218 = auVar91._0_4_;
                fVar245 = auVar1._0_4_;
                auVar161._0_4_ = fVar245 * fVar245;
                auVar161._4_4_ = auVar1._4_4_ * auVar1._4_4_;
                auVar161._8_4_ = auVar1._8_4_ * auVar1._8_4_;
                auVar161._12_4_ = auVar1._12_4_ * auVar1._12_4_;
                auVar94 = vsubps_avx512vl(local_8a0._0_16_,auVar161);
                fVar246 = auVar94._0_4_;
                auVar183._4_12_ = ZEXT812(0) << 0x20;
                auVar183._0_4_ = fVar246;
                auVar89 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar183);
                auVar95 = vmulss_avx512f(auVar89,ZEXT416(0x3fc00000));
                auVar96 = vmulss_avx512f(auVar94,ZEXT416(0xbf000000));
                if (fVar246 < 0.0) {
                  local_7f0 = fVar251;
                  fStack_7ec = fVar251;
                  fStack_7e8 = fVar251;
                  fStack_7e4 = fVar251;
                  local_7e0 = auVar89;
                  fVar246 = sqrtf(fVar246);
                  auVar96 = ZEXT416(auVar96._0_4_);
                  auVar95 = ZEXT416(auVar95._0_4_);
                  auVar93 = ZEXT416(auVar93._0_4_);
                  auVar91 = ZEXT416(uVar80);
                  auVar89 = local_7e0;
                  fVar251 = local_7f0;
                  fVar247 = fStack_7ec;
                  fVar242 = fStack_7e8;
                  fVar244 = fStack_7e4;
                }
                else {
                  auVar94 = vsqrtss_avx(auVar94,auVar94);
                  fVar246 = auVar94._0_4_;
                  fVar247 = fVar251;
                  fVar242 = fVar251;
                  fVar244 = fVar251;
                }
                auVar250._8_4_ = 0x7fffffff;
                auVar250._0_8_ = 0x7fffffff7fffffff;
                auVar250._12_4_ = 0x7fffffff;
                auVar258 = ZEXT3264(local_8c0);
                auVar94 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_9e0,local_7b0);
                fVar176 = auVar94._0_4_ * 6.0;
                fVar16 = fVar240 * 6.0;
                auVar207._0_4_ = fVar16 * (float)local_7a0._0_4_;
                auVar207._4_4_ = fVar16 * (float)local_7a0._4_4_;
                auVar207._8_4_ = fVar16 * fStack_798;
                auVar207._12_4_ = fVar16 * fStack_794;
                auVar184._4_4_ = fVar176;
                auVar184._0_4_ = fVar176;
                auVar184._8_4_ = fVar176;
                auVar184._12_4_ = fVar176;
                auVar94 = vfmadd132ps_fma(auVar184,auVar207,local_760._0_16_);
                auVar98 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_7b0,local_9e0);
                fVar176 = auVar98._0_4_ * 6.0;
                auVar208._4_4_ = fVar176;
                auVar208._0_4_ = fVar176;
                auVar208._8_4_ = fVar176;
                auVar208._12_4_ = fVar176;
                auVar94 = vfmadd132ps_fma(auVar208,auVar94,local_780._0_16_);
                fVar176 = local_7b0._0_4_ * 6.0;
                auVar185._4_4_ = fVar176;
                auVar185._0_4_ = fVar176;
                auVar185._8_4_ = fVar176;
                auVar185._12_4_ = fVar176;
                auVar94 = vfmadd132ps_fma(auVar185,auVar94,local_740._0_16_);
                auVar209._0_4_ = auVar94._0_4_ * (float)local_7c0._0_4_;
                auVar209._4_4_ = auVar94._4_4_ * (float)local_7c0._0_4_;
                auVar209._8_4_ = auVar94._8_4_ * (float)local_7c0._0_4_;
                auVar209._12_4_ = auVar94._12_4_ * (float)local_7c0._0_4_;
                auVar94 = vdpps_avx(auVar88,auVar94,0x7f);
                fVar176 = auVar94._0_4_;
                auVar186._0_4_ = auVar88._0_4_ * fVar176;
                auVar186._4_4_ = auVar88._4_4_ * fVar176;
                auVar186._8_4_ = auVar88._8_4_ * fVar176;
                auVar186._12_4_ = auVar88._12_4_ * fVar176;
                auVar94 = vsubps_avx(auVar209,auVar186);
                fVar176 = auVar92._0_4_ * (float)local_7d0._0_4_;
                auVar26._8_4_ = 0x80000000;
                auVar26._0_8_ = 0x8000000080000000;
                auVar26._12_4_ = 0x80000000;
                auVar145._16_16_ = local_8c0._16_16_;
                auVar97 = vxorps_avx512vl(auVar88,auVar26);
                auVar232._0_4_ = fVar251 * auVar94._0_4_ * fVar176;
                auVar232._4_4_ = fVar247 * auVar94._4_4_ * fVar176;
                auVar232._8_4_ = fVar242 * auVar94._8_4_ * fVar176;
                auVar232._12_4_ = fVar244 * auVar94._12_4_ * fVar176;
                auVar92 = vdpps_avx(auVar97,auVar160,0x7f);
                auVar94 = vmaxss_avx(ZEXT416((uint)fVar154),
                                     ZEXT416((uint)(fVar241 * fVar243 * 1.9073486e-06)));
                auVar98 = vdivss_avx512f(ZEXT416((uint)fVar154),auVar93);
                auVar93 = vdpps_avx(local_880._0_16_,auVar232,0x7f);
                auVar91 = vfmadd213ss_fma(auVar91,ZEXT416((uint)fVar154),auVar94);
                auVar98 = vfmadd213ss_fma(ZEXT416((uint)(fVar218 + 1.0)),auVar98,auVar91);
                auVar91 = vdpps_avx(local_850,auVar160,0x7f);
                fVar251 = auVar92._0_4_ + auVar93._0_4_;
                auVar92 = vdpps_avx(local_880._0_16_,auVar97,0x7f);
                auVar96 = vmulss_avx512f(auVar96,auVar89);
                auVar89 = vmulss_avx512f(auVar89,auVar89);
                auVar93 = vdpps_avx(local_880._0_16_,local_850,0x7f);
                auVar96 = vaddss_avx512f(auVar95,ZEXT416((uint)(auVar96._0_4_ * auVar89._0_4_)));
                auVar89 = vfnmadd231ss_fma(auVar92,auVar1,ZEXT416((uint)fVar251));
                auVar95 = vfnmadd231ss_fma(auVar93,auVar1,auVar91);
                auVar92 = vpermilps_avx(local_6e0._0_16_,0xff);
                fVar246 = fVar246 - auVar92._0_4_;
                auVar92 = vshufps_avx(auVar88,auVar88,0xff);
                auVar93 = vfmsub213ss_fma(auVar89,auVar96,auVar92);
                fVar218 = auVar95._0_4_ * auVar96._0_4_;
                auVar89 = vfmsub231ss_fma(ZEXT416((uint)(auVar91._0_4_ * auVar93._0_4_)),
                                          ZEXT416((uint)fVar251),ZEXT416((uint)fVar218));
                fVar247 = auVar89._0_4_;
                fVar251 = fVar246 * (fVar251 / fVar247) - fVar245 * (auVar93._0_4_ / fVar247);
                auVar233 = ZEXT464((uint)fVar251);
                fVar240 = fVar240 - (fVar245 * (fVar218 / fVar247) -
                                    fVar246 * (auVar91._0_4_ / fVar247));
                fVar241 = fVar241 - fVar251;
                auVar91 = vandps_avx(auVar1,auVar250);
                if (auVar98._0_4_ <= auVar91._0_4_) {
LAB_01de97ee:
                  bVar8 = false;
                }
                else {
                  auVar93 = vfmadd231ss_fma(ZEXT416((uint)(auVar98._0_4_ + auVar94._0_4_)),local_810
                                            ,ZEXT416(0x36000000));
                  auVar91 = vandps_avx(auVar250,ZEXT416((uint)fVar246));
                  if (auVar93._0_4_ <= auVar91._0_4_) goto LAB_01de97ee;
                  fVar241 = fVar241 + (float)local_800._0_4_;
                  bVar8 = true;
                  if (fVar219 <= fVar241) {
                    fVar251 = *(float *)(ray + k * 4 + 0x100);
                    auVar233 = ZEXT464((uint)fVar251);
                    if (((fVar241 <= fVar251) && (0.0 <= fVar240)) && (fVar240 <= 1.0)) {
                      auVar145._0_16_ = ZEXT816(0) << 0x20;
                      auVar144._4_28_ = auVar145._4_28_;
                      auVar144._0_4_ = local_8a0._0_4_;
                      auVar91 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar144._0_16_);
                      fVar245 = auVar91._0_4_;
                      auVar91 = vmulss_avx512f(local_8a0._0_16_,ZEXT416(0xbf000000));
                      pGVar5 = (context->scene->geometries).items[uVar84].ptr;
                      if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                        fVar245 = fVar245 * 1.5 + auVar91._0_4_ * fVar245 * fVar245 * fVar245;
                        auVar187._0_4_ = local_880._0_4_ * fVar245;
                        auVar187._4_4_ = local_880._4_4_ * fVar245;
                        auVar187._8_4_ = local_880._8_4_ * fVar245;
                        auVar187._12_4_ = local_880._12_4_ * fVar245;
                        auVar93 = vfmadd213ps_fma(auVar92,auVar187,auVar88);
                        auVar91 = vshufps_avx(auVar187,auVar187,0xc9);
                        auVar92 = vshufps_avx(auVar88,auVar88,0xc9);
                        auVar188._0_4_ = auVar187._0_4_ * auVar92._0_4_;
                        auVar188._4_4_ = auVar187._4_4_ * auVar92._4_4_;
                        auVar188._8_4_ = auVar187._8_4_ * auVar92._8_4_;
                        auVar188._12_4_ = auVar187._12_4_ * auVar92._12_4_;
                        auVar88 = vfmsub231ps_fma(auVar188,auVar88,auVar91);
                        auVar91 = vshufps_avx(auVar88,auVar88,0xc9);
                        auVar92 = vshufps_avx(auVar93,auVar93,0xc9);
                        auVar88 = vshufps_avx(auVar88,auVar88,0xd2);
                        auVar162._0_4_ = auVar93._0_4_ * auVar88._0_4_;
                        auVar162._4_4_ = auVar93._4_4_ * auVar88._4_4_;
                        auVar162._8_4_ = auVar93._8_4_ * auVar88._8_4_;
                        auVar162._12_4_ = auVar93._12_4_ * auVar88._12_4_;
                        auVar91 = vfmsub231ps_fma(auVar162,auVar91,auVar92);
                        uVar220 = auVar91._0_4_;
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar5->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          *(float *)(ray + k * 4 + 0x100) = fVar241;
                          uVar4 = vextractps_avx(auVar91,1);
                          *(undefined4 *)(ray + k * 4 + 0x180) = uVar4;
                          uVar4 = vextractps_avx(auVar91,2);
                          *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar4;
                          *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar220;
                          *(float *)(ray + k * 4 + 0x1e0) = fVar240;
                          *(undefined4 *)(ray + k * 4 + 0x200) = 0;
                          *(uint *)(ray + k * 4 + 0x220) = uVar3;
                          *(uint *)(ray + k * 4 + 0x240) = uVar84;
                          *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                        }
                        else {
                          pRVar7 = context->user;
                          auVar214._8_4_ = 1;
                          auVar214._0_8_ = 0x100000001;
                          auVar214._12_4_ = 1;
                          auVar214._16_4_ = 1;
                          auVar214._20_4_ = 1;
                          auVar214._24_4_ = 1;
                          auVar214._28_4_ = 1;
                          auVar105 = vpermps_avx2(auVar214,ZEXT1632(auVar91));
                          auVar224._8_4_ = 2;
                          auVar224._0_8_ = 0x200000002;
                          auVar224._12_4_ = 2;
                          auVar224._16_4_ = 2;
                          auVar224._20_4_ = 2;
                          auVar224._24_4_ = 2;
                          auVar224._28_4_ = 2;
                          local_580 = vpermps_avx2(auVar224,ZEXT1632(auVar91));
                          local_5a0[0] = (RTCHitN)auVar105[0];
                          local_5a0[1] = (RTCHitN)auVar105[1];
                          local_5a0[2] = (RTCHitN)auVar105[2];
                          local_5a0[3] = (RTCHitN)auVar105[3];
                          local_5a0[4] = (RTCHitN)auVar105[4];
                          local_5a0[5] = (RTCHitN)auVar105[5];
                          local_5a0[6] = (RTCHitN)auVar105[6];
                          local_5a0[7] = (RTCHitN)auVar105[7];
                          local_5a0[8] = (RTCHitN)auVar105[8];
                          local_5a0[9] = (RTCHitN)auVar105[9];
                          local_5a0[10] = (RTCHitN)auVar105[10];
                          local_5a0[0xb] = (RTCHitN)auVar105[0xb];
                          local_5a0[0xc] = (RTCHitN)auVar105[0xc];
                          local_5a0[0xd] = (RTCHitN)auVar105[0xd];
                          local_5a0[0xe] = (RTCHitN)auVar105[0xe];
                          local_5a0[0xf] = (RTCHitN)auVar105[0xf];
                          local_5a0[0x10] = (RTCHitN)auVar105[0x10];
                          local_5a0[0x11] = (RTCHitN)auVar105[0x11];
                          local_5a0[0x12] = (RTCHitN)auVar105[0x12];
                          local_5a0[0x13] = (RTCHitN)auVar105[0x13];
                          local_5a0[0x14] = (RTCHitN)auVar105[0x14];
                          local_5a0[0x15] = (RTCHitN)auVar105[0x15];
                          local_5a0[0x16] = (RTCHitN)auVar105[0x16];
                          local_5a0[0x17] = (RTCHitN)auVar105[0x17];
                          local_5a0[0x18] = (RTCHitN)auVar105[0x18];
                          local_5a0[0x19] = (RTCHitN)auVar105[0x19];
                          local_5a0[0x1a] = (RTCHitN)auVar105[0x1a];
                          local_5a0[0x1b] = (RTCHitN)auVar105[0x1b];
                          local_5a0[0x1c] = (RTCHitN)auVar105[0x1c];
                          local_5a0[0x1d] = (RTCHitN)auVar105[0x1d];
                          local_5a0[0x1e] = (RTCHitN)auVar105[0x1e];
                          local_5a0[0x1f] = (RTCHitN)auVar105[0x1f];
                          local_560 = uVar220;
                          uStack_55c = uVar220;
                          uStack_558 = uVar220;
                          uStack_554 = uVar220;
                          uStack_550 = uVar220;
                          uStack_54c = uVar220;
                          uStack_548 = uVar220;
                          uStack_544 = uVar220;
                          local_540 = fVar240;
                          fStack_53c = fVar240;
                          fStack_538 = fVar240;
                          fStack_534 = fVar240;
                          fStack_530 = fVar240;
                          fStack_52c = fVar240;
                          fStack_528 = fVar240;
                          fStack_524 = fVar240;
                          local_520 = ZEXT432(0) << 0x20;
                          local_500 = local_620._0_8_;
                          uStack_4f8 = local_620._8_8_;
                          uStack_4f0 = local_620._16_8_;
                          uStack_4e8 = local_620._24_8_;
                          local_4e0 = local_600;
                          auVar105 = vpcmpeqd_avx2(local_600,local_600);
                          local_8e8[1] = auVar105;
                          *local_8e8 = auVar105;
                          local_4c0 = pRVar7->instID[0];
                          uStack_4bc = local_4c0;
                          uStack_4b8 = local_4c0;
                          uStack_4b4 = local_4c0;
                          uStack_4b0 = local_4c0;
                          uStack_4ac = local_4c0;
                          uStack_4a8 = local_4c0;
                          uStack_4a4 = local_4c0;
                          local_4a0 = pRVar7->instPrimID[0];
                          uStack_49c = local_4a0;
                          uStack_498 = local_4a0;
                          uStack_494 = local_4a0;
                          uStack_490 = local_4a0;
                          uStack_48c = local_4a0;
                          uStack_488 = local_4a0;
                          uStack_484 = local_4a0;
                          *(float *)(ray + k * 4 + 0x100) = fVar241;
                          local_840 = local_640._0_8_;
                          uStack_838 = local_640._8_8_;
                          uStack_830 = local_640._16_8_;
                          uStack_828 = local_640._24_8_;
                          local_930.valid = (int *)&local_840;
                          local_930.geometryUserPtr = pGVar5->userPtr;
                          local_930.context = context->user;
                          local_930.hit = local_5a0;
                          local_930.N = 8;
                          local_930.ray = (RTCRayN *)ray;
                          if (pGVar5->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            (*pGVar5->intersectionFilterN)(&local_930);
                            auVar258 = ZEXT3264(local_8c0);
                          }
                          auVar67._8_8_ = uStack_838;
                          auVar67._0_8_ = local_840;
                          auVar67._16_8_ = uStack_830;
                          auVar67._24_8_ = uStack_828;
                          if (auVar67 == (undefined1  [32])0x0) {
LAB_01de9aa8:
                            *(float *)(ray + k * 4 + 0x100) = fVar251;
                          }
                          else {
                            p_Var6 = context->args->filter;
                            if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                              (*p_Var6)(&local_930);
                              auVar258 = ZEXT3264(local_8c0);
                            }
                            auVar68._8_8_ = uStack_838;
                            auVar68._0_8_ = local_840;
                            auVar68._16_8_ = uStack_830;
                            auVar68._24_8_ = uStack_828;
                            if (auVar68 == (undefined1  [32])0x0) goto LAB_01de9aa8;
                            uVar87 = vptestmd_avx512vl(auVar68,auVar68);
                            iVar58 = *(int *)(local_930.hit + 4);
                            iVar59 = *(int *)(local_930.hit + 8);
                            iVar60 = *(int *)(local_930.hit + 0xc);
                            iVar61 = *(int *)(local_930.hit + 0x10);
                            iVar62 = *(int *)(local_930.hit + 0x14);
                            iVar63 = *(int *)(local_930.hit + 0x18);
                            iVar64 = *(int *)(local_930.hit + 0x1c);
                            bVar81 = (byte)uVar87;
                            bVar86 = (bool)((byte)(uVar87 >> 1) & 1);
                            bVar9 = (bool)((byte)(uVar87 >> 2) & 1);
                            bVar10 = (bool)((byte)(uVar87 >> 3) & 1);
                            bVar12 = (bool)((byte)(uVar87 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar87 >> 5) & 1);
                            bVar13 = (bool)((byte)(uVar87 >> 6) & 1);
                            bVar14 = SUB81(uVar87 >> 7,0);
                            *(uint *)(local_930.ray + 0x180) =
                                 (uint)(bVar81 & 1) * *(int *)local_930.hit |
                                 (uint)!(bool)(bVar81 & 1) * *(int *)(local_930.ray + 0x180);
                            *(uint *)(local_930.ray + 0x184) =
                                 (uint)bVar86 * iVar58 |
                                 (uint)!bVar86 * *(int *)(local_930.ray + 0x184);
                            *(uint *)(local_930.ray + 0x188) =
                                 (uint)bVar9 * iVar59 |
                                 (uint)!bVar9 * *(int *)(local_930.ray + 0x188);
                            *(uint *)(local_930.ray + 0x18c) =
                                 (uint)bVar10 * iVar60 |
                                 (uint)!bVar10 * *(int *)(local_930.ray + 0x18c);
                            *(uint *)(local_930.ray + 400) =
                                 (uint)bVar12 * iVar61 |
                                 (uint)!bVar12 * *(int *)(local_930.ray + 400);
                            *(uint *)(local_930.ray + 0x194) =
                                 (uint)bVar11 * iVar62 |
                                 (uint)!bVar11 * *(int *)(local_930.ray + 0x194);
                            *(uint *)(local_930.ray + 0x198) =
                                 (uint)bVar13 * iVar63 |
                                 (uint)!bVar13 * *(int *)(local_930.ray + 0x198);
                            *(uint *)(local_930.ray + 0x19c) =
                                 (uint)bVar14 * iVar64 |
                                 (uint)!bVar14 * *(int *)(local_930.ray + 0x19c);
                            iVar58 = *(int *)(local_930.hit + 0x24);
                            iVar59 = *(int *)(local_930.hit + 0x28);
                            iVar60 = *(int *)(local_930.hit + 0x2c);
                            iVar61 = *(int *)(local_930.hit + 0x30);
                            iVar62 = *(int *)(local_930.hit + 0x34);
                            iVar63 = *(int *)(local_930.hit + 0x38);
                            iVar64 = *(int *)(local_930.hit + 0x3c);
                            bVar86 = (bool)((byte)(uVar87 >> 1) & 1);
                            bVar9 = (bool)((byte)(uVar87 >> 2) & 1);
                            bVar10 = (bool)((byte)(uVar87 >> 3) & 1);
                            bVar12 = (bool)((byte)(uVar87 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar87 >> 5) & 1);
                            bVar13 = (bool)((byte)(uVar87 >> 6) & 1);
                            bVar14 = SUB81(uVar87 >> 7,0);
                            *(uint *)(local_930.ray + 0x1a0) =
                                 (uint)(bVar81 & 1) * *(int *)(local_930.hit + 0x20) |
                                 (uint)!(bool)(bVar81 & 1) * *(int *)(local_930.ray + 0x1a0);
                            *(uint *)(local_930.ray + 0x1a4) =
                                 (uint)bVar86 * iVar58 |
                                 (uint)!bVar86 * *(int *)(local_930.ray + 0x1a4);
                            *(uint *)(local_930.ray + 0x1a8) =
                                 (uint)bVar9 * iVar59 |
                                 (uint)!bVar9 * *(int *)(local_930.ray + 0x1a8);
                            *(uint *)(local_930.ray + 0x1ac) =
                                 (uint)bVar10 * iVar60 |
                                 (uint)!bVar10 * *(int *)(local_930.ray + 0x1ac);
                            *(uint *)(local_930.ray + 0x1b0) =
                                 (uint)bVar12 * iVar61 |
                                 (uint)!bVar12 * *(int *)(local_930.ray + 0x1b0);
                            *(uint *)(local_930.ray + 0x1b4) =
                                 (uint)bVar11 * iVar62 |
                                 (uint)!bVar11 * *(int *)(local_930.ray + 0x1b4);
                            *(uint *)(local_930.ray + 0x1b8) =
                                 (uint)bVar13 * iVar63 |
                                 (uint)!bVar13 * *(int *)(local_930.ray + 0x1b8);
                            *(uint *)(local_930.ray + 0x1bc) =
                                 (uint)bVar14 * iVar64 |
                                 (uint)!bVar14 * *(int *)(local_930.ray + 0x1bc);
                            iVar58 = *(int *)(local_930.hit + 0x44);
                            iVar59 = *(int *)(local_930.hit + 0x48);
                            iVar60 = *(int *)(local_930.hit + 0x4c);
                            iVar61 = *(int *)(local_930.hit + 0x50);
                            iVar62 = *(int *)(local_930.hit + 0x54);
                            iVar63 = *(int *)(local_930.hit + 0x58);
                            iVar64 = *(int *)(local_930.hit + 0x5c);
                            bVar86 = (bool)((byte)(uVar87 >> 1) & 1);
                            bVar9 = (bool)((byte)(uVar87 >> 2) & 1);
                            bVar10 = (bool)((byte)(uVar87 >> 3) & 1);
                            bVar12 = (bool)((byte)(uVar87 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar87 >> 5) & 1);
                            bVar13 = (bool)((byte)(uVar87 >> 6) & 1);
                            bVar14 = SUB81(uVar87 >> 7,0);
                            *(uint *)(local_930.ray + 0x1c0) =
                                 (uint)(bVar81 & 1) * *(int *)(local_930.hit + 0x40) |
                                 (uint)!(bool)(bVar81 & 1) * *(int *)(local_930.ray + 0x1c0);
                            *(uint *)(local_930.ray + 0x1c4) =
                                 (uint)bVar86 * iVar58 |
                                 (uint)!bVar86 * *(int *)(local_930.ray + 0x1c4);
                            *(uint *)(local_930.ray + 0x1c8) =
                                 (uint)bVar9 * iVar59 |
                                 (uint)!bVar9 * *(int *)(local_930.ray + 0x1c8);
                            *(uint *)(local_930.ray + 0x1cc) =
                                 (uint)bVar10 * iVar60 |
                                 (uint)!bVar10 * *(int *)(local_930.ray + 0x1cc);
                            *(uint *)(local_930.ray + 0x1d0) =
                                 (uint)bVar12 * iVar61 |
                                 (uint)!bVar12 * *(int *)(local_930.ray + 0x1d0);
                            *(uint *)(local_930.ray + 0x1d4) =
                                 (uint)bVar11 * iVar62 |
                                 (uint)!bVar11 * *(int *)(local_930.ray + 0x1d4);
                            *(uint *)(local_930.ray + 0x1d8) =
                                 (uint)bVar13 * iVar63 |
                                 (uint)!bVar13 * *(int *)(local_930.ray + 0x1d8);
                            *(uint *)(local_930.ray + 0x1dc) =
                                 (uint)bVar14 * iVar64 |
                                 (uint)!bVar14 * *(int *)(local_930.ray + 0x1dc);
                            iVar58 = *(int *)(local_930.hit + 100);
                            iVar59 = *(int *)(local_930.hit + 0x68);
                            iVar60 = *(int *)(local_930.hit + 0x6c);
                            iVar61 = *(int *)(local_930.hit + 0x70);
                            iVar62 = *(int *)(local_930.hit + 0x74);
                            iVar63 = *(int *)(local_930.hit + 0x78);
                            iVar64 = *(int *)(local_930.hit + 0x7c);
                            bVar86 = (bool)((byte)(uVar87 >> 1) & 1);
                            bVar9 = (bool)((byte)(uVar87 >> 2) & 1);
                            bVar10 = (bool)((byte)(uVar87 >> 3) & 1);
                            bVar12 = (bool)((byte)(uVar87 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar87 >> 5) & 1);
                            bVar13 = (bool)((byte)(uVar87 >> 6) & 1);
                            bVar14 = SUB81(uVar87 >> 7,0);
                            *(uint *)(local_930.ray + 0x1e0) =
                                 (uint)(bVar81 & 1) * *(int *)(local_930.hit + 0x60) |
                                 (uint)!(bool)(bVar81 & 1) * *(int *)(local_930.ray + 0x1e0);
                            *(uint *)(local_930.ray + 0x1e4) =
                                 (uint)bVar86 * iVar58 |
                                 (uint)!bVar86 * *(int *)(local_930.ray + 0x1e4);
                            *(uint *)(local_930.ray + 0x1e8) =
                                 (uint)bVar9 * iVar59 |
                                 (uint)!bVar9 * *(int *)(local_930.ray + 0x1e8);
                            *(uint *)(local_930.ray + 0x1ec) =
                                 (uint)bVar10 * iVar60 |
                                 (uint)!bVar10 * *(int *)(local_930.ray + 0x1ec);
                            *(uint *)(local_930.ray + 0x1f0) =
                                 (uint)bVar12 * iVar61 |
                                 (uint)!bVar12 * *(int *)(local_930.ray + 0x1f0);
                            *(uint *)(local_930.ray + 500) =
                                 (uint)bVar11 * iVar62 |
                                 (uint)!bVar11 * *(int *)(local_930.ray + 500);
                            *(uint *)(local_930.ray + 0x1f8) =
                                 (uint)bVar13 * iVar63 |
                                 (uint)!bVar13 * *(int *)(local_930.ray + 0x1f8);
                            *(uint *)(local_930.ray + 0x1fc) =
                                 (uint)bVar14 * iVar64 |
                                 (uint)!bVar14 * *(int *)(local_930.ray + 0x1fc);
                            iVar58 = *(int *)(local_930.hit + 0x84);
                            iVar59 = *(int *)(local_930.hit + 0x88);
                            iVar60 = *(int *)(local_930.hit + 0x8c);
                            iVar61 = *(int *)(local_930.hit + 0x90);
                            iVar62 = *(int *)(local_930.hit + 0x94);
                            iVar63 = *(int *)(local_930.hit + 0x98);
                            iVar64 = *(int *)(local_930.hit + 0x9c);
                            bVar86 = (bool)((byte)(uVar87 >> 1) & 1);
                            bVar9 = (bool)((byte)(uVar87 >> 2) & 1);
                            bVar10 = (bool)((byte)(uVar87 >> 3) & 1);
                            bVar12 = (bool)((byte)(uVar87 >> 4) & 1);
                            bVar11 = (bool)((byte)(uVar87 >> 5) & 1);
                            bVar13 = (bool)((byte)(uVar87 >> 6) & 1);
                            bVar14 = SUB81(uVar87 >> 7,0);
                            *(uint *)(local_930.ray + 0x200) =
                                 (uint)(bVar81 & 1) * *(int *)(local_930.hit + 0x80) |
                                 (uint)!(bool)(bVar81 & 1) * *(int *)(local_930.ray + 0x200);
                            *(uint *)(local_930.ray + 0x204) =
                                 (uint)bVar86 * iVar58 |
                                 (uint)!bVar86 * *(int *)(local_930.ray + 0x204);
                            *(uint *)(local_930.ray + 0x208) =
                                 (uint)bVar9 * iVar59 |
                                 (uint)!bVar9 * *(int *)(local_930.ray + 0x208);
                            *(uint *)(local_930.ray + 0x20c) =
                                 (uint)bVar10 * iVar60 |
                                 (uint)!bVar10 * *(int *)(local_930.ray + 0x20c);
                            *(uint *)(local_930.ray + 0x210) =
                                 (uint)bVar12 * iVar61 |
                                 (uint)!bVar12 * *(int *)(local_930.ray + 0x210);
                            *(uint *)(local_930.ray + 0x214) =
                                 (uint)bVar11 * iVar62 |
                                 (uint)!bVar11 * *(int *)(local_930.ray + 0x214);
                            *(uint *)(local_930.ray + 0x218) =
                                 (uint)bVar13 * iVar63 |
                                 (uint)!bVar13 * *(int *)(local_930.ray + 0x218);
                            *(uint *)(local_930.ray + 0x21c) =
                                 (uint)bVar14 * iVar64 |
                                 (uint)!bVar14 * *(int *)(local_930.ray + 0x21c);
                            auVar105 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                           (local_930.hit + 0xa0));
                            *(undefined1 (*) [32])(local_930.ray + 0x220) = auVar105;
                            auVar105 = vmovdqu32_avx512vl(*(undefined1 (*) [32])
                                                           (local_930.hit + 0xc0));
                            *(undefined1 (*) [32])(local_930.ray + 0x240) = auVar105;
                            auVar105 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                           (local_930.hit + 0xe0));
                            *(undefined1 (*) [32])(local_930.ray + 0x260) = auVar105;
                            auVar105 = vmovdqa32_avx512vl(*(undefined1 (*) [32])
                                                           (local_930.hit + 0x100));
                            *(undefined1 (*) [32])(local_930.ray + 0x280) = auVar105;
                          }
                          auVar233 = ZEXT464((uint)fVar251);
                        }
                      }
                    }
                  }
                }
                bVar86 = lVar85 != 0;
                lVar85 = lVar85 + -1;
              } while ((!bVar8) && (bVar86));
              auVar70._4_4_ = fStack_69c;
              auVar70._0_4_ = local_6a0;
              auVar70._8_4_ = fStack_698;
              auVar70._12_4_ = fStack_694;
              auVar70._16_4_ = fStack_690;
              auVar70._20_4_ = fStack_68c;
              auVar70._24_4_ = fStack_688;
              auVar70._28_4_ = fStack_684;
              uVar220 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar36._4_4_ = uVar220;
              auVar36._0_4_ = uVar220;
              auVar36._8_4_ = uVar220;
              auVar36._12_4_ = uVar220;
              auVar36._16_4_ = uVar220;
              auVar36._20_4_ = uVar220;
              auVar36._24_4_ = uVar220;
              auVar36._28_4_ = uVar220;
              uVar17 = vcmpps_avx512vl(auVar70,auVar36,2);
              bVar82 = ~('\x01' << ((byte)iVar20 & 0x1f)) & bVar82 & (byte)uVar17;
            } while (bVar82 != 0);
          }
          uVar19 = vpcmpd_avx512vl(local_5e0,_local_6c0,1);
          uVar18 = vpcmpd_avx512vl(local_5e0,local_440,1);
          auVar193._0_4_ = (float)local_700._0_4_ + (float)local_1c0._0_4_;
          auVar193._4_4_ = (float)local_700._4_4_ + (float)local_1c0._4_4_;
          auVar193._8_4_ = fStack_6f8 + fStack_1b8;
          auVar193._12_4_ = fStack_6f4 + fStack_1b4;
          auVar193._16_4_ = fStack_6f0 + fStack_1b0;
          auVar193._20_4_ = fStack_6ec + fStack_1ac;
          auVar193._24_4_ = fStack_6e8 + fStack_1a8;
          auVar193._28_4_ = fStack_6e4 + fStack_1a4;
          uVar220 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar215._4_4_ = uVar220;
          auVar215._0_4_ = uVar220;
          auVar215._8_4_ = uVar220;
          auVar215._12_4_ = uVar220;
          auVar215._16_4_ = uVar220;
          auVar215._20_4_ = uVar220;
          auVar215._24_4_ = uVar220;
          auVar215._28_4_ = uVar220;
          uVar17 = vcmpps_avx512vl(auVar193,auVar215,2);
          bVar78 = bVar78 & (byte)uVar18 & (byte)uVar17;
          auVar225._0_4_ = (float)local_700._0_4_ + (float)local_480._0_4_;
          auVar225._4_4_ = (float)local_700._4_4_ + (float)local_480._4_4_;
          auVar225._8_4_ = fStack_6f8 + fStack_478;
          auVar225._12_4_ = fStack_6f4 + fStack_474;
          auVar225._16_4_ = fStack_6f0 + fStack_470;
          auVar225._20_4_ = fStack_6ec + fStack_46c;
          auVar225._24_4_ = fStack_6e8 + fStack_468;
          auVar225._28_4_ = fStack_6e4 + fStack_464;
          uVar17 = vcmpps_avx512vl(auVar225,auVar215,2);
          bVar75 = bVar75 & (byte)uVar19 & (byte)uVar17 | bVar78;
          prim = local_8e0;
          if (bVar75 == 0) {
            auVar226 = ZEXT3264(_DAT_02020f20);
          }
          else {
            uVar87 = local_8d0 & 0xffffffff;
            abStack_180[uVar87 * 0x60] = bVar75;
            bVar8 = (bool)(bVar78 >> 1 & 1);
            bVar86 = (bool)(bVar78 >> 2 & 1);
            bVar9 = (bool)(bVar78 >> 3 & 1);
            bVar10 = (bool)(bVar78 >> 4 & 1);
            bVar12 = (bool)(bVar78 >> 5 & 1);
            auStack_160[uVar87 * 0x18] =
                 (uint)(bVar78 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar78 & 1) * local_480._0_4_;
            auStack_160[uVar87 * 0x18 + 1] =
                 (uint)bVar8 * local_1c0._4_4_ | (uint)!bVar8 * local_480._4_4_;
            auStack_160[uVar87 * 0x18 + 2] =
                 (uint)bVar86 * (int)fStack_1b8 | (uint)!bVar86 * (int)fStack_478;
            auStack_160[uVar87 * 0x18 + 3] =
                 (uint)bVar9 * (int)fStack_1b4 | (uint)!bVar9 * (int)fStack_474;
            auStack_160[uVar87 * 0x18 + 4] =
                 (uint)bVar10 * (int)fStack_1b0 | (uint)!bVar10 * (int)fStack_470;
            auStack_160[uVar87 * 0x18 + 5] =
                 (uint)bVar12 * (int)fStack_1ac | (uint)!bVar12 * (int)fStack_46c;
            auStack_160[uVar87 * 0x18 + 6] =
                 (uint)(bVar78 >> 6) * (int)fStack_1a8 |
                 (uint)!(bool)(bVar78 >> 6) * (int)fStack_468;
            (&fStack_144)[uVar87 * 0x18] = fStack_464;
            uVar17 = vmovlps_avx(local_900);
            (&uStack_140)[uVar87 * 0xc] = uVar17;
            afStack_138[uVar87 * 0x18] = (float)((int)local_8d8 + 1);
            local_8d0 = (ulong)((int)local_8d0 + 1);
            auVar226 = ZEXT3264(_DAT_02020f20);
          }
        }
      }
    }
    auVar216 = ZEXT1664(local_900);
    local_8d0 = local_8d0 & 0xffffffff;
    do {
      if ((int)local_8d0 == 0) {
        uVar220 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar38._4_4_ = uVar220;
        auVar38._0_4_ = uVar220;
        auVar38._8_4_ = uVar220;
        auVar38._12_4_ = uVar220;
        auVar38._16_4_ = uVar220;
        auVar38._20_4_ = uVar220;
        auVar38._24_4_ = uVar220;
        auVar38._28_4_ = uVar220;
        uVar17 = vcmpps_avx512vl(local_420,auVar38,2);
        uVar84 = (uint)local_8c8 & (uint)uVar17;
        local_8c8 = (ulong)uVar84;
        if (uVar84 == 0) {
          return;
        }
        goto LAB_01de769a;
      }
      uVar87 = (ulong)((int)local_8d0 - 1);
      auVar105 = *(undefined1 (*) [32])(auStack_160 + uVar87 * 0x18);
      auVar194._0_4_ = auVar105._0_4_ + (float)local_700._0_4_;
      auVar194._4_4_ = auVar105._4_4_ + (float)local_700._4_4_;
      auVar194._8_4_ = auVar105._8_4_ + fStack_6f8;
      auVar194._12_4_ = auVar105._12_4_ + fStack_6f4;
      auVar194._16_4_ = auVar105._16_4_ + fStack_6f0;
      auVar194._20_4_ = auVar105._20_4_ + fStack_6ec;
      auVar194._24_4_ = auVar105._24_4_ + fStack_6e8;
      auVar194._28_4_ = auVar105._28_4_ + fStack_6e4;
      uVar220 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar37._4_4_ = uVar220;
      auVar37._0_4_ = uVar220;
      auVar37._8_4_ = uVar220;
      auVar37._12_4_ = uVar220;
      auVar37._16_4_ = uVar220;
      auVar37._20_4_ = uVar220;
      auVar37._24_4_ = uVar220;
      auVar37._28_4_ = uVar220;
      uVar17 = vcmpps_avx512vl(auVar194,auVar37,2);
      uVar80 = (uint)uVar17 & (uint)abStack_180[uVar87 * 0x60];
      bVar75 = (byte)uVar80;
      if (uVar80 != 0) {
        auVar195._8_4_ = 0x7f800000;
        auVar195._0_8_ = 0x7f8000007f800000;
        auVar195._12_4_ = 0x7f800000;
        auVar195._16_4_ = 0x7f800000;
        auVar195._20_4_ = 0x7f800000;
        auVar195._24_4_ = 0x7f800000;
        auVar195._28_4_ = 0x7f800000;
        auVar106 = vblendmps_avx512vl(auVar195,auVar105);
        auVar146._0_4_ =
             (uint)(bVar75 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar75 & 1) * (int)auVar105._0_4_;
        bVar8 = (bool)((byte)(uVar80 >> 1) & 1);
        auVar146._4_4_ = (uint)bVar8 * auVar106._4_4_ | (uint)!bVar8 * (int)auVar105._4_4_;
        bVar8 = (bool)((byte)(uVar80 >> 2) & 1);
        auVar146._8_4_ = (uint)bVar8 * auVar106._8_4_ | (uint)!bVar8 * (int)auVar105._8_4_;
        bVar8 = (bool)((byte)(uVar80 >> 3) & 1);
        auVar146._12_4_ = (uint)bVar8 * auVar106._12_4_ | (uint)!bVar8 * (int)auVar105._12_4_;
        bVar8 = (bool)((byte)(uVar80 >> 4) & 1);
        auVar146._16_4_ = (uint)bVar8 * auVar106._16_4_ | (uint)!bVar8 * (int)auVar105._16_4_;
        bVar8 = (bool)((byte)(uVar80 >> 5) & 1);
        auVar146._20_4_ = (uint)bVar8 * auVar106._20_4_ | (uint)!bVar8 * (int)auVar105._20_4_;
        bVar8 = (bool)((byte)(uVar80 >> 6) & 1);
        auVar146._24_4_ = (uint)bVar8 * auVar106._24_4_ | (uint)!bVar8 * (int)auVar105._24_4_;
        auVar146._28_4_ =
             (uVar80 >> 7) * auVar106._28_4_ | (uint)!SUB41(uVar80 >> 7,0) * (int)auVar105._28_4_;
        auVar105 = vshufps_avx(auVar146,auVar146,0xb1);
        auVar105 = vminps_avx(auVar146,auVar105);
        auVar106 = vshufpd_avx(auVar105,auVar105,5);
        auVar105 = vminps_avx(auVar105,auVar106);
        auVar106 = vpermpd_avx2(auVar105,0x4e);
        auVar105 = vminps_avx(auVar105,auVar106);
        uVar17 = vcmpps_avx512vl(auVar146,auVar105,0);
        bVar82 = (byte)uVar17 & bVar75;
        if (bVar82 != 0) {
          uVar80 = (uint)bVar82;
        }
        fVar154 = afStack_138[uVar87 * 0x18 + -1];
        uVar147 = 0;
        for (; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x80000000) {
          uVar147 = uVar147 + 1;
        }
        local_8d8 = (ulong)(uint)afStack_138[uVar87 * 0x18];
        bVar82 = ~('\x01' << ((byte)uVar147 & 0x1f)) & bVar75;
        abStack_180[uVar87 * 0x60] = bVar82;
        uVar83 = uVar87;
        if (bVar82 != 0) {
          uVar83 = local_8d0;
        }
        fVar240 = *(float *)(&uStack_140 + uVar87 * 0xc);
        auVar196._4_4_ = fVar240;
        auVar196._0_4_ = fVar240;
        auVar196._8_4_ = fVar240;
        auVar196._12_4_ = fVar240;
        auVar196._16_4_ = fVar240;
        auVar196._20_4_ = fVar240;
        auVar196._24_4_ = fVar240;
        auVar196._28_4_ = fVar240;
        fVar154 = fVar154 - fVar240;
        auVar173._4_4_ = fVar154;
        auVar173._0_4_ = fVar154;
        auVar173._8_4_ = fVar154;
        auVar173._12_4_ = fVar154;
        auVar173._16_4_ = fVar154;
        auVar173._20_4_ = fVar154;
        auVar173._24_4_ = fVar154;
        auVar173._28_4_ = fVar154;
        auVar91 = vfmadd132ps_fma(auVar173,auVar196,auVar226._0_32_);
        auVar105 = ZEXT1632(auVar91);
        local_5a0[0] = (RTCHitN)auVar105[0];
        local_5a0[1] = (RTCHitN)auVar105[1];
        local_5a0[2] = (RTCHitN)auVar105[2];
        local_5a0[3] = (RTCHitN)auVar105[3];
        local_5a0[4] = (RTCHitN)auVar105[4];
        local_5a0[5] = (RTCHitN)auVar105[5];
        local_5a0[6] = (RTCHitN)auVar105[6];
        local_5a0[7] = (RTCHitN)auVar105[7];
        local_5a0[8] = (RTCHitN)auVar105[8];
        local_5a0[9] = (RTCHitN)auVar105[9];
        local_5a0[10] = (RTCHitN)auVar105[10];
        local_5a0[0xb] = (RTCHitN)auVar105[0xb];
        local_5a0[0xc] = (RTCHitN)auVar105[0xc];
        local_5a0[0xd] = (RTCHitN)auVar105[0xd];
        local_5a0[0xe] = (RTCHitN)auVar105[0xe];
        local_5a0[0xf] = (RTCHitN)auVar105[0xf];
        local_5a0[0x10] = (RTCHitN)auVar105[0x10];
        local_5a0[0x11] = (RTCHitN)auVar105[0x11];
        local_5a0[0x12] = (RTCHitN)auVar105[0x12];
        local_5a0[0x13] = (RTCHitN)auVar105[0x13];
        local_5a0[0x14] = (RTCHitN)auVar105[0x14];
        local_5a0[0x15] = (RTCHitN)auVar105[0x15];
        local_5a0[0x16] = (RTCHitN)auVar105[0x16];
        local_5a0[0x17] = (RTCHitN)auVar105[0x17];
        local_5a0[0x18] = (RTCHitN)auVar105[0x18];
        local_5a0[0x19] = (RTCHitN)auVar105[0x19];
        local_5a0[0x1a] = (RTCHitN)auVar105[0x1a];
        local_5a0[0x1b] = (RTCHitN)auVar105[0x1b];
        local_5a0[0x1c] = (RTCHitN)auVar105[0x1c];
        local_5a0[0x1d] = (RTCHitN)auVar105[0x1d];
        local_5a0[0x1e] = (RTCHitN)auVar105[0x1e];
        local_5a0[0x1f] = (RTCHitN)auVar105[0x1f];
        auVar216 = ZEXT864(*(ulong *)(local_5a0 + (ulong)uVar147 * 4));
        uVar87 = uVar83;
      }
      local_8d0 = uVar87;
    } while (bVar75 == 0);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }